

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O1

void embree::avx512::InstanceArrayIntersectorKMB<4>::intersect
               (vbool<4>_conflict *valid_i,Precalculations *pre,RayHitK<4> *ray,
               RayQueryContext *context,Primitive_conflict4 *prim)

{
  long *plVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  Geometry *pGVar7;
  RTCRayQueryContext *pRVar8;
  long lVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined8 uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  ulong uVar57;
  _func_int *p_Var58;
  byte bVar59;
  ulong uVar60;
  uint uVar61;
  long lVar62;
  long lVar63;
  byte bVar64;
  long lVar65;
  ulong uVar66;
  ulong uVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar164;
  undefined1 auVar157 [16];
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar179;
  float fVar180;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float fVar181;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined4 uVar182;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar214 [12];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 in_ZMM6 [64];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 in_ZMM7 [64];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 in_ZMM8 [64];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 in_ZMM9 [64];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 in_ZMM10 [64];
  float fVar293;
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  float fVar303;
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  float fVar301;
  float fVar302;
  undefined1 in_ZMM11 [64];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 in_ZMM12 [64];
  undefined1 auVar310 [16];
  float fVar313;
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 in_ZMM13 [64];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 in_ZMM14 [64];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 in_ZMM15 [64];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 auVar325 [16];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 auVar326 [16];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM24 [64];
  undefined1 in_ZMM25 [64];
  undefined1 in_ZMM26 [64];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 in_ZMM27 [64];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 in_ZMM28 [64];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 in_ZMM29 [64];
  undefined1 auVar338 [16];
  undefined1 in_ZMM30 [64];
  undefined1 auVar339 [16];
  undefined1 in_ZMM31 [64];
  RayQueryContext newcontext;
  vint<4> mask;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [16];
  RTCIntersectArguments *local_a8;
  undefined1 local_98 [16];
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 local_38 [16];
  undefined1 auVar127 [16];
  
  auVar73 = in_ZMM10._0_16_;
  auVar94 = in_ZMM19._0_16_;
  auVar75 = in_ZMM21._0_16_;
  auVar74 = in_ZMM20._0_16_;
  auVar102 = in_ZMM18._0_16_;
  auVar93 = in_ZMM6._0_16_;
  auVar92 = in_ZMM16._0_16_;
  auVar91 = in_ZMM15._0_16_;
  auVar90 = in_ZMM14._0_16_;
  auVar89 = in_ZMM12._0_16_;
  uVar5 = prim->primID_;
  pGVar7 = (context->scene->geometries).items[prim->instID_].ptr;
  p_Var58 = *(_func_int **)&pGVar7->field_0x58;
  if (p_Var58 == (_func_int *)0x0) {
    uVar57 = (ulong)*(uint *)(*(long *)&pGVar7[1].time_range.upper +
                             (long)pGVar7[1].intersectionFilterN * (ulong)uVar5);
    if (uVar57 == 0xffffffff) {
      p_Var58 = (_func_int *)0x0;
    }
    else {
      p_Var58 = pGVar7[1].super_RefCount._vptr_RefCount[uVar57];
    }
  }
  if (p_Var58 != (_func_int *)0x0) {
    uVar61 = pGVar7->mask;
    auVar95._4_4_ = uVar61;
    auVar95._0_4_ = uVar61;
    auVar95._8_4_ = uVar61;
    auVar95._12_4_ = uVar61;
    uVar17 = vptestmd_avx512vl(auVar95,*(undefined1 (*) [16])(ray + 0x90));
    bVar59 = (byte)uVar17 & 0xf & valid_i->v;
    uVar57 = (ulong)bVar59;
    if ((bVar59 != 0) && (pRVar8 = context->user, pRVar8->instID[0] == 0xffffffff)) {
      pRVar8->instID[0] = prim->instID_;
      pRVar8->instPrimID[0] = uVar5;
      uVar60 = (ulong)prim->primID_;
      if ((pGVar7->field_8).field_0x1 == '\x01') {
        fVar169 = (pGVar7->time_range).lower;
        auVar89._4_4_ = fVar169;
        auVar89._0_4_ = fVar169;
        auVar89._8_4_ = fVar169;
        auVar89._12_4_ = fVar169;
        fVar179 = pGVar7->fnumTimeSegments;
        auVar89 = vsubps_avx(*(undefined1 (*) [16])(ray + 0x70),auVar89);
        fVar169 = (pGVar7->time_range).upper - fVar169;
        auVar90._4_4_ = fVar169;
        auVar90._0_4_ = fVar169;
        auVar90._8_4_ = fVar169;
        auVar90._12_4_ = fVar169;
        auVar89 = vdivps_avx(auVar89,auVar90);
        auVar91._0_4_ = fVar179 * auVar89._0_4_;
        auVar91._4_4_ = fVar179 * auVar89._4_4_;
        auVar91._8_4_ = fVar179 * auVar89._8_4_;
        auVar91._12_4_ = fVar179 * auVar89._12_4_;
        auVar89 = vroundps_avx(auVar91,1);
        fVar179 = fVar179 + -1.0;
        auVar92._4_4_ = fVar179;
        auVar92._0_4_ = fVar179;
        auVar92._8_4_ = fVar179;
        auVar92._12_4_ = fVar179;
        auVar89 = vminps_avx(auVar89,auVar92);
        auVar92 = ZEXT816(0) << 0x20;
        auVar89 = vmaxps_avx(auVar89,auVar92);
        auVar90 = vsubps_avx(auVar91,auVar89);
        local_b8 = vcvtps2dq_avx(auVar89);
        uVar5 = 0;
        for (uVar61 = (uint)bVar59; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x80000000) {
          uVar5 = uVar5 + 1;
        }
        auVar89 = vpbroadcastd_avx512vl();
        uVar17 = vpcmpeqd_avx512vl(local_b8,auVar89);
        fVar179 = auVar90._4_4_;
        fVar180 = auVar90._8_4_;
        fVar181 = auVar90._12_4_;
        fVar169 = auVar90._0_4_;
        if ((byte)(bVar59 ^ 0xf | (byte)uVar17 & 0xf) == 0xf) {
          lVar9 = *(long *)&pGVar7[1].fnumTimeSegments;
          lVar62 = (long)*(int *)(local_b8 + (ulong)uVar5 * 4) * 0x38;
          plVar1 = (long *)(lVar9 + lVar62);
          iVar6 = *(int *)(lVar9 + 0x20 + lVar62);
          if (iVar6 == 0x9134) {
            lVar63 = *plVar1;
            lVar65 = plVar1[2] * uVar60;
            auVar89 = vinsertps_avx(ZEXT416(*(uint *)(lVar63 + lVar65)),
                                    ZEXT416(*(uint *)(lVar63 + 0x10 + lVar65)),0x1c);
            local_b8 = vinsertps_avx(auVar89,ZEXT416(*(uint *)(lVar63 + 0x20 + lVar65)),0x28);
            auVar89 = vinsertps_avx(ZEXT416(*(uint *)(lVar63 + 4 + lVar65)),
                                    ZEXT416(*(uint *)(lVar63 + 0x14 + lVar65)),0x1c);
            auVar89 = vinsertps_avx(auVar89,ZEXT416(*(uint *)(lVar63 + 0x24 + lVar65)),0x28);
            auVar91 = vinsertps_avx(ZEXT416(*(uint *)(lVar63 + 8 + lVar65)),
                                    ZEXT416(*(uint *)(lVar63 + 0x18 + lVar65)),0x1c);
            auVar93 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(lVar63 + 0x28 + lVar65)),0x28);
            auVar91 = vinsertps_avx(ZEXT416(*(uint *)(lVar63 + 0xc + lVar65)),
                                    ZEXT416(*(uint *)(lVar63 + 0x1c + lVar65)),0x1c);
            auVar73 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(lVar63 + 0x2c + lVar65)),0x28);
          }
          else if (iVar6 == 0x9234) {
            lVar63 = *plVar1;
            lVar65 = plVar1[2] * uVar60;
            auVar197._8_8_ = 0;
            auVar197._0_8_ = *(ulong *)(lVar63 + 4 + lVar65);
            auVar234._8_8_ = 0;
            auVar234._0_8_ = *(ulong *)(lVar63 + 0x10 + lVar65);
            local_b8 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar63 + lVar65)),_DAT_02060e80,auVar197
                                         );
            auVar89 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar63 + 0xc + lVar65)),_DAT_02060e80,
                                         auVar234);
            auVar198._8_8_ = 0;
            auVar198._0_8_ = *(ulong *)(lVar63 + 0x1c + lVar65);
            auVar93 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar63 + 0x18 + lVar65)),_DAT_02060e80,
                                         auVar198);
            auVar199._8_8_ = 0;
            auVar199._0_8_ = *(ulong *)(lVar63 + 0x28 + lVar65);
            auVar73 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar63 + 0x24 + lVar65)),_DAT_02060e80,
                                         auVar199);
          }
          else if (iVar6 == 0xb001) {
            lVar63 = *plVar1;
            lVar65 = plVar1[2] * uVar60;
            auVar185._8_8_ = 0;
            auVar185._0_8_ = *(ulong *)(lVar63 + 0x10 + lVar65);
            auVar89 = vinsertps_avx(auVar185,ZEXT416(*(uint *)(lVar63 + 8 + lVar65)),0x20);
            auVar186._8_8_ = 0;
            auVar186._0_8_ = *(ulong *)(lVar63 + 0x34 + lVar65);
            auVar92 = vpermt2ps_avx512vl(auVar186,_DAT_02060e90,ZEXT416(*(uint *)(lVar63 + lVar65)))
            ;
            auVar244._8_8_ = 0;
            auVar244._0_8_ = *(ulong *)(lVar63 + 0x1c + lVar65);
            fVar69 = *(float *)(lVar63 + 0x24 + lVar65);
            fVar70 = *(float *)(lVar63 + 0x28 + lVar65);
            fVar71 = *(float *)(lVar63 + 0x2c + lVar65);
            auVar93 = vpermt2ps_avx512vl(auVar244,_DAT_02060e90,
                                         ZEXT416(*(uint *)(lVar63 + 0x18 + lVar65)));
            fVar72 = *(float *)(lVar63 + 0x30 + lVar65);
            auVar91 = vfmadd231ss_fma(ZEXT416((uint)(fVar70 * fVar70)),ZEXT416((uint)fVar69),
                                      ZEXT416((uint)fVar69));
            auVar91 = vfmadd231ss_fma(auVar91,ZEXT416((uint)fVar71),ZEXT416((uint)fVar71));
            auVar91 = vfmadd231ss_fma(auVar91,ZEXT416((uint)fVar72),ZEXT416((uint)fVar72));
            auVar73 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar91._0_4_));
            fVar293 = auVar73._0_4_;
            fVar293 = fVar293 * 1.5 + fVar293 * fVar293 * fVar293 * auVar91._0_4_ * -0.5;
            auVar73 = vinsertps_avx(auVar93,ZEXT416((uint)(fVar69 * fVar293)),0x30);
            local_b8 = vinsertps_avx(auVar92,ZEXT416((uint)(fVar70 * fVar293)),0x30);
            auVar93 = vinsertps_avx(auVar89,ZEXT416((uint)(fVar72 * fVar293)),0x30);
            auVar89 = vinsertps_avx(ZEXT416(*(uint *)(lVar63 + 0xc + lVar65)),
                                    ZEXT416(*(uint *)(lVar63 + 4 + lVar65)),0x10);
            auVar89 = vinsertps_avx(auVar89,ZEXT416(*(uint *)(lVar63 + 0x3c + lVar65)),0x20);
            auVar89 = vinsertps_avx(auVar89,ZEXT416((uint)(fVar71 * fVar293)),0x30);
          }
          else if (iVar6 == 0x9244) {
            lVar63 = *plVar1;
            lVar65 = plVar1[2] * uVar60;
            local_b8 = *(undefined1 (*) [16])(lVar63 + lVar65);
            auVar89 = *(undefined1 (*) [16])(lVar63 + 0x10 + lVar65);
            auVar93 = *(undefined1 (*) [16])(lVar63 + 0x20 + lVar65);
            auVar73 = *(undefined1 (*) [16])(lVar63 + 0x30 + lVar65);
          }
          local_168._4_4_ = local_b8._0_4_;
          auVar91 = vshufps_avx(local_b8,local_b8,0x55);
          auVar92 = vshufps_avx(local_b8,local_b8,0xaa);
          auVar95 = vshufps_avx(local_b8,local_b8,0xff);
          local_148._4_4_ = auVar89._0_4_;
          auVar96 = vshufps_avx(auVar89,auVar89,0x55);
          auVar97 = vshufps_avx(auVar89,auVar89,0xaa);
          auVar89 = vshufps_avx(auVar89,auVar89,0xff);
          local_158._4_4_ = auVar93._0_4_;
          auVar98 = vshufps_avx(auVar93,auVar93,0x55);
          auVar99 = vshufps_avx(auVar93,auVar93,0xaa);
          auVar101 = vshufps_avx512vl(auVar93,auVar93,0xff);
          local_178._4_4_ = auVar73._0_4_;
          auVar93 = vshufps_avx(auVar73,auVar73,0x55);
          auVar100 = vshufps_avx(auVar73,auVar73,0xaa);
          auVar73 = vshufps_avx512vl(auVar73,auVar73,0xff);
          iVar6 = *(int *)(lVar9 + 0x58 + lVar62);
          local_178._0_4_ = local_178._4_4_;
          local_178._8_4_ = local_178._4_4_;
          local_178._12_4_ = local_178._4_4_;
          local_168._0_4_ = local_168._4_4_;
          local_168._8_4_ = local_168._4_4_;
          local_168._12_4_ = local_168._4_4_;
          local_148._0_4_ = local_148._4_4_;
          local_148._8_4_ = local_148._4_4_;
          local_148._12_4_ = local_148._4_4_;
          local_158._0_4_ = local_158._4_4_;
          local_158._8_4_ = local_158._4_4_;
          local_158._12_4_ = local_158._4_4_;
          if (iVar6 == 0x9134) {
            lVar9 = plVar1[7];
            lVar62 = uVar60 * plVar1[9];
            auVar102 = vinsertps_avx(ZEXT416(*(uint *)(lVar9 + lVar62)),
                                     ZEXT416(*(uint *)(lVar9 + 0x10 + lVar62)),0x1c);
            auVar102 = vinsertps_avx512f(auVar102,ZEXT416(*(uint *)(lVar9 + 0x20 + lVar62)),0x28);
            auVar74 = vinsertps_avx(ZEXT416(*(uint *)(lVar9 + 4 + lVar62)),
                                    ZEXT416(*(uint *)(lVar9 + 0x14 + lVar62)),0x1c);
            auVar74 = vinsertps_avx512f(auVar74,ZEXT416(*(uint *)(lVar9 + 0x24 + lVar62)),0x28);
            auVar75 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar9 + 8 + lVar62)),
                                        ZEXT416(*(uint *)(lVar9 + 0x18 + lVar62)),0x1c);
            auVar75 = vinsertps_avx512f(auVar75,ZEXT416(*(uint *)(lVar9 + 0x28 + lVar62)),0x28);
            auVar94 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar9 + 0xc + lVar62)),
                                        ZEXT416(*(uint *)(lVar9 + 0x1c + lVar62)),0x1c);
            auVar94 = vinsertps_avx512f(auVar94,ZEXT416(*(uint *)(lVar9 + 0x2c + lVar62)),0x28);
          }
          else if (iVar6 == 0x9234) {
            lVar9 = plVar1[7];
            lVar62 = uVar60 * plVar1[9];
            auVar277._8_8_ = 0;
            auVar277._0_8_ = *(ulong *)(lVar9 + 4 + lVar62);
            auVar102 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar9 + lVar62)),_DAT_02060e80,auVar277)
            ;
            auVar325._8_8_ = 0;
            auVar325._0_8_ = *(ulong *)(lVar9 + 0x10 + lVar62);
            auVar74 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar9 + 0xc + lVar62)),_DAT_02060e80,
                                         auVar325);
            auVar278._8_8_ = 0;
            auVar278._0_8_ = *(ulong *)(lVar9 + 0x1c + lVar62);
            auVar75 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar9 + 0x18 + lVar62)),_DAT_02060e80,
                                         auVar278);
            auVar279._8_8_ = 0;
            auVar279._0_8_ = *(ulong *)(lVar9 + 0x28 + lVar62);
            auVar94 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar9 + 0x24 + lVar62)),_DAT_02060e80,
                                         auVar279);
          }
          else if (iVar6 == 0xb001) {
            lVar9 = plVar1[7];
            lVar62 = uVar60 * plVar1[9];
            auVar280._8_8_ = 0;
            auVar280._0_8_ = *(ulong *)(lVar9 + 0x10 + lVar62);
            auVar74 = vinsertps_avx(auVar280,ZEXT416(*(uint *)(lVar9 + 8 + lVar62)),0x20);
            auVar310._8_8_ = 0;
            auVar310._0_8_ = *(ulong *)(lVar9 + 0x34 + lVar62);
            auVar102 = vpermt2ps_avx512vl(auVar310,_DAT_02060e90,ZEXT416(*(uint *)(lVar9 + lVar62)))
            ;
            uVar5 = *(uint *)(lVar9 + 0x18 + lVar62);
            uVar61 = *(uint *)(lVar9 + 0x24 + lVar62);
            uVar2 = *(uint *)(lVar9 + 0x28 + lVar62);
            uVar3 = *(uint *)(lVar9 + 0x2c + lVar62);
            auVar326._8_8_ = 0;
            auVar326._0_8_ = *(ulong *)(lVar9 + 0x1c + lVar62);
            auVar75 = vpermt2ps_avx512vl(auVar326,_DAT_02060e90,ZEXT416(uVar5));
            uVar4 = *(uint *)(lVar9 + 0x30 + lVar62);
            auVar94 = vmulss_avx512f(ZEXT416(uVar2),ZEXT416(uVar2));
            auVar94 = vfmadd231ss_avx512f(auVar94,ZEXT416(uVar61),ZEXT416(uVar61));
            auVar94 = vfmadd231ss_avx512f(auVar94,ZEXT416(uVar3),ZEXT416(uVar3));
            auVar94 = vfmadd231ss_avx512f(auVar94,ZEXT416(uVar4),ZEXT416(uVar4));
            auVar122 = vxorps_avx512vl(ZEXT416(uVar5),ZEXT416(uVar5));
            auVar117._4_12_ = auVar122._4_12_;
            auVar117._0_4_ = auVar94._0_4_;
            auVar122 = vrsqrt14ss_avx512f(auVar122,auVar117);
            auVar118 = vmulss_avx512f(auVar122,ZEXT416(0x3fc00000));
            auVar94 = vmulss_avx512f(auVar94,ZEXT416(0xbf000000));
            auVar94 = vmulss_avx512f(auVar122,auVar94);
            auVar122 = vmulss_avx512f(auVar122,auVar122);
            auVar94 = vmulss_avx512f(auVar122,auVar94);
            auVar122 = vaddss_avx512f(auVar118,auVar94);
            auVar94 = vmulss_avx512f(ZEXT416(uVar61),auVar122);
            auVar94 = vinsertps_avx512f(auVar75,auVar94,0x30);
            auVar75 = vmulss_avx512f(ZEXT416(uVar2),auVar122);
            auVar102 = vinsertps_avx512f(auVar102,auVar75,0x30);
            auVar118 = vmulss_avx512f(ZEXT416(uVar3),auVar122);
            auVar75 = vmulss_avx512f(ZEXT416(uVar4),auVar122);
            auVar75 = vinsertps_avx512f(auVar74,auVar75,0x30);
            auVar74 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar9 + 0xc + lVar62)),
                                        ZEXT416(*(uint *)(lVar9 + 4 + lVar62)),0x10);
            auVar74 = vinsertps_avx(auVar74,ZEXT416(*(uint *)(lVar9 + 0x3c + lVar62)),0x20);
            auVar74 = vinsertps_avx512f(auVar74,auVar118,0x30);
          }
          else if (iVar6 == 0x9244) {
            lVar9 = plVar1[7];
            lVar62 = uVar60 * plVar1[9];
            auVar102 = *(undefined1 (*) [16])(lVar9 + lVar62);
            auVar74 = *(undefined1 (*) [16])(lVar9 + 0x10 + lVar62);
            auVar75 = *(undefined1 (*) [16])(lVar9 + 0x20 + lVar62);
            auVar94 = *(undefined1 (*) [16])(lVar9 + 0x30 + lVar62);
          }
          auVar118 = vshufps_avx512vl(auVar102,auVar102,0xff);
          auVar119 = vshufps_avx512vl(auVar74,auVar74,0xff);
          auVar120 = vshufps_avx512vl(auVar75,auVar75,0xff);
          auVar121 = vshufps_avx512vl(auVar94,auVar94,0xff);
          auVar122 = vmulps_avx512vl(auVar73,auVar121);
          auVar123 = vmulps_avx512vl(auVar95,auVar118);
          auVar124 = vmulps_avx512vl(auVar89,auVar119);
          auVar125 = vmulps_avx512vl(auVar101,auVar120);
          auVar281._0_4_ = auVar125._0_4_ + auVar124._0_4_ + auVar123._0_4_ + auVar122._0_4_;
          auVar281._4_4_ = auVar125._4_4_ + auVar124._4_4_ + auVar123._4_4_ + auVar122._4_4_;
          auVar281._8_4_ = auVar125._8_4_ + auVar124._8_4_ + auVar123._8_4_ + auVar122._8_4_;
          auVar281._12_4_ = auVar125._12_4_ + auVar124._12_4_ + auVar123._12_4_ + auVar122._12_4_;
          auVar123 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar122 = vxorps_avx512vl(auVar281,auVar123);
          uVar60 = vcmpps_avx512vl(auVar281,auVar122,1);
          auVar143 = ZEXT816(0) << 0x20;
          auVar124 = vmaxps_avx512vl(auVar122,auVar281);
          uVar66 = vcmpps_avx512vl(auVar124,auVar143,1);
          auVar18._8_4_ = 0x7fffffff;
          auVar18._0_8_ = 0x7fffffff7fffffff;
          auVar18._12_4_ = 0x7fffffff;
          auVar122 = vandps_avx512vl(auVar281,auVar18);
          auVar125 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar19._8_4_ = 0xbb8d3753;
          auVar19._0_8_ = 0xbb8d3753bb8d3753;
          auVar19._12_4_ = 0xbb8d3753;
          auVar126 = vmulps_avx512vl(auVar122,auVar19);
          auVar20._8_4_ = 0x3c9df1b8;
          auVar20._0_8_ = 0x3c9df1b83c9df1b8;
          auVar20._12_4_ = 0x3c9df1b8;
          auVar126 = vaddps_avx512vl(auVar126,auVar20);
          auVar126 = vmulps_avx512vl(auVar122,auVar126);
          auVar21._8_4_ = 0xbd37e81c;
          auVar21._0_8_ = 0xbd37e81cbd37e81c;
          auVar21._12_4_ = 0xbd37e81c;
          auVar126 = vaddps_avx512vl(auVar126,auVar21);
          auVar126 = vmulps_avx512vl(auVar122,auVar126);
          auVar22._8_4_ = 0x3db3edac;
          auVar22._0_8_ = 0x3db3edac3db3edac;
          auVar22._12_4_ = 0x3db3edac;
          auVar126 = vaddps_avx512vl(auVar126,auVar22);
          auVar126 = vmulps_avx512vl(auVar122,auVar126);
          auVar23._8_4_ = 0xbe5ba881;
          auVar23._0_8_ = 0xbe5ba881be5ba881;
          auVar23._12_4_ = 0xbe5ba881;
          auVar126 = vaddps_avx512vl(auVar126,auVar23);
          auVar126 = vmulps_avx512vl(auVar122,auVar126);
          auVar24._8_4_ = 0x3fc90fd1;
          auVar24._0_8_ = 0x3fc90fd13fc90fd1;
          auVar24._12_4_ = 0x3fc90fd1;
          auVar126 = vaddps_avx512vl(auVar126,auVar24);
          uVar67 = vcmpps_avx512vl(auVar122,auVar125,6);
          auVar122 = vsubps_avx512vl(auVar125,auVar122);
          auVar122 = vsqrtps_avx(auVar122);
          auVar122 = vmulps_avx512vl(auVar122,auVar126);
          auVar126 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
          auVar122 = vsubps_avx512vl(auVar126,auVar122);
          auVar122 = vmaxps_avx(auVar143,auVar122);
          auVar127 = vxorps_avx512vl(auVar122,auVar123);
          bVar10 = (bool)((byte)uVar66 & 1);
          auVar128._0_4_ = (uint)bVar10 * auVar127._0_4_ | (uint)!bVar10 * auVar122._0_4_;
          bVar10 = (bool)((byte)(uVar66 >> 1) & 1);
          auVar128._4_4_ = (uint)bVar10 * auVar127._4_4_ | (uint)!bVar10 * auVar122._4_4_;
          bVar10 = (bool)((byte)(uVar66 >> 2) & 1);
          auVar128._8_4_ = (uint)bVar10 * auVar127._8_4_ | (uint)!bVar10 * auVar122._8_4_;
          bVar10 = (bool)((byte)(uVar66 >> 3) & 1);
          auVar128._12_4_ = (uint)bVar10 * auVar127._12_4_ | (uint)!bVar10 * auVar122._12_4_;
          auVar122 = vsubps_avx512vl(auVar126,auVar128);
          auVar127 = vbroadcastss_avx512vl(ZEXT416(0x7fc00000));
          bVar10 = (bool)((byte)uVar67 & 1);
          bVar11 = (bool)((byte)(uVar67 >> 1) & 1);
          bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
          bVar13 = (bool)((byte)(uVar67 >> 3) & 1);
          auVar282._0_4_ =
               (float)((uint)bVar10 * auVar127._0_4_ | (uint)!bVar10 * auVar122._0_4_) * fVar169;
          auVar282._4_4_ =
               (float)((uint)bVar11 * auVar127._4_4_ | (uint)!bVar11 * auVar122._4_4_) * fVar179;
          auVar282._8_4_ =
               (float)((uint)bVar12 * auVar127._8_4_ | (uint)!bVar12 * auVar122._8_4_) * fVar180;
          auVar282._12_4_ =
               (float)((uint)bVar13 * auVar127._12_4_ | (uint)!bVar13 * auVar122._12_4_) * fVar181;
          auVar25._8_4_ = 0x3f22f983;
          auVar25._0_8_ = 0x3f22f9833f22f983;
          auVar25._12_4_ = 0x3f22f983;
          auVar122 = vmulps_avx512vl(auVar282,auVar25);
          auVar122 = vrndscaleps_avx512vl(auVar122,1);
          auVar126 = vmulps_avx512vl(auVar122,auVar126);
          auVar122 = vcvtps2dq_avx512vl(auVar122);
          auVar126 = vsubps_avx512vl(auVar282,auVar126);
          auVar26._8_4_ = 3;
          auVar26._0_8_ = 0x300000003;
          auVar26._12_4_ = 3;
          auVar127 = vpandd_avx512vl(auVar122,auVar26);
          auVar283._8_4_ = 1;
          auVar283._0_8_ = 0x100000001;
          auVar283._12_4_ = 1;
          uVar67 = vptestnmd_avx512vl(auVar122,auVar283);
          uVar67 = uVar67 & 0xf;
          auVar122 = vmulps_avx512vl(auVar126,auVar126);
          auVar27._8_4_ = 0xb2d70013;
          auVar27._0_8_ = 0xb2d70013b2d70013;
          auVar27._12_4_ = 0xb2d70013;
          auVar129 = vmulps_avx512vl(auVar122,auVar27);
          auVar28._8_4_ = 0x363938a8;
          auVar28._0_8_ = 0x363938a8363938a8;
          auVar28._12_4_ = 0x363938a8;
          auVar129 = vaddps_avx512vl(auVar129,auVar28);
          uVar66 = vpcmpgtd_avx512vl(auVar127,auVar283);
          uVar66 = uVar66 & 0xf;
          auVar29._8_4_ = 0xb48b634d;
          auVar29._0_8_ = 0xb48b634db48b634d;
          auVar29._12_4_ = 0xb48b634d;
          auVar130 = vmulps_avx512vl(auVar122,auVar29);
          auVar30._8_4_ = 0x37cfab9c;
          auVar30._0_8_ = 0x37cfab9c37cfab9c;
          auVar30._12_4_ = 0x37cfab9c;
          auVar130 = vaddps_avx512vl(auVar130,auVar30);
          auVar129 = vmulps_avx512vl(auVar122,auVar129);
          auVar31._8_4_ = 0xb9501096;
          auVar31._0_8_ = 0xb9501096b9501096;
          auVar31._12_4_ = 0xb9501096;
          auVar129 = vaddps_avx512vl(auVar129,auVar31);
          auVar130 = vmulps_avx512vl(auVar122,auVar130);
          auVar32._8_4_ = 0xbab60981;
          auVar32._0_8_ = 0xbab60981bab60981;
          auVar32._12_4_ = 0xbab60981;
          auVar130 = vaddps_avx512vl(auVar130,auVar32);
          auVar129 = vmulps_avx512vl(auVar122,auVar129);
          auVar33._8_4_ = 0x3c088898;
          auVar33._0_8_ = 0x3c0888983c088898;
          auVar33._12_4_ = 0x3c088898;
          auVar129 = vaddps_avx512vl(auVar129,auVar33);
          auVar130 = vmulps_avx512vl(auVar122,auVar130);
          auVar34._8_4_ = 0x3d2aaaa4;
          auVar34._0_8_ = 0x3d2aaaa43d2aaaa4;
          auVar34._12_4_ = 0x3d2aaaa4;
          auVar130 = vaddps_avx512vl(auVar130,auVar34);
          auVar129 = vmulps_avx512vl(auVar122,auVar129);
          auVar35._8_4_ = 0xbe2aaaab;
          auVar35._0_8_ = 0xbe2aaaabbe2aaaab;
          auVar35._12_4_ = 0xbe2aaaab;
          auVar129 = vaddps_avx512vl(auVar129,auVar35);
          auVar130 = vmulps_avx512vl(auVar122,auVar130);
          auVar306._0_4_ = auVar130._0_4_ + -0.5;
          auVar306._4_4_ = auVar130._4_4_ + -0.5;
          auVar306._8_4_ = auVar130._8_4_ + -0.5;
          auVar306._12_4_ = auVar130._12_4_ + -0.5;
          auVar129 = vmulps_avx512vl(auVar122,auVar129);
          auVar122 = vmulps_avx512vl(auVar122,auVar306);
          auVar129 = vaddps_avx512vl(auVar129,auVar125);
          auVar126 = vmulps_avx512vl(auVar126,auVar129);
          auVar122 = vaddps_avx512vl(auVar122,auVar125);
          auVar129 = vblendmps_avx512vl(auVar122,auVar126);
          bVar10 = (bool)((byte)uVar67 & 1);
          auVar131._0_4_ = (uint)bVar10 * auVar129._0_4_ | (uint)!bVar10 * local_178._4_4_;
          bVar10 = (bool)((byte)(uVar67 >> 1) & 1);
          auVar131._4_4_ = (uint)bVar10 * auVar129._4_4_ | (uint)!bVar10 * local_178._4_4_;
          bVar10 = (bool)((byte)(uVar67 >> 2) & 1);
          auVar131._8_4_ = (uint)bVar10 * auVar129._8_4_ | (uint)!bVar10 * local_178._4_4_;
          bVar10 = SUB81(uVar67 >> 3,0);
          auVar131._12_4_ = (uint)bVar10 * auVar129._12_4_ | (uint)!bVar10 * local_178._4_4_;
          bVar10 = (bool)((byte)uVar67 & 1);
          auVar132._0_4_ = (uint)bVar10 * auVar122._0_4_ | (uint)!bVar10 * auVar126._0_4_;
          bVar10 = (bool)((byte)(uVar67 >> 1) & 1);
          auVar132._4_4_ = (uint)bVar10 * auVar122._4_4_ | (uint)!bVar10 * auVar126._4_4_;
          bVar10 = (bool)((byte)(uVar67 >> 2) & 1);
          auVar132._8_4_ = (uint)bVar10 * auVar122._8_4_ | (uint)!bVar10 * auVar126._8_4_;
          bVar10 = SUB81(uVar67 >> 3,0);
          auVar132._12_4_ = (uint)bVar10 * auVar122._12_4_ | (uint)!bVar10 * auVar126._12_4_;
          auVar122 = vpcmpeqd_avx(auVar122,auVar122);
          auVar122 = vpaddd_avx512vl(auVar127,auVar122);
          auVar36._8_4_ = 2;
          auVar36._0_8_ = 0x200000002;
          auVar36._12_4_ = 2;
          uVar67 = vpcmpud_avx512vl(auVar122,auVar36,1);
          uVar67 = uVar67 & 0xf;
          auVar122 = vxorps_avx512vl(auVar121,auVar123);
          bVar59 = (byte)uVar60;
          auVar133._0_4_ =
               (uint)(bVar59 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar121._0_4_;
          bVar10 = (bool)((byte)(uVar60 >> 1) & 1);
          auVar133._4_4_ = (uint)bVar10 * auVar122._4_4_ | (uint)!bVar10 * auVar121._4_4_;
          bVar10 = (bool)((byte)(uVar60 >> 2) & 1);
          auVar133._8_4_ = (uint)bVar10 * auVar122._8_4_ | (uint)!bVar10 * auVar121._8_4_;
          bVar10 = (bool)((byte)(uVar60 >> 3) & 1);
          auVar133._12_4_ = (uint)bVar10 * auVar122._12_4_ | (uint)!bVar10 * auVar121._12_4_;
          auVar122 = vxorps_avx512vl(auVar118,auVar123);
          auVar134._0_4_ =
               (uint)(bVar59 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar118._0_4_;
          bVar10 = (bool)((byte)(uVar60 >> 1) & 1);
          auVar134._4_4_ = (uint)bVar10 * auVar122._4_4_ | (uint)!bVar10 * auVar118._4_4_;
          bVar10 = (bool)((byte)(uVar60 >> 2) & 1);
          auVar134._8_4_ = (uint)bVar10 * auVar122._8_4_ | (uint)!bVar10 * auVar118._8_4_;
          bVar10 = (bool)((byte)(uVar60 >> 3) & 1);
          auVar134._12_4_ = (uint)bVar10 * auVar122._12_4_ | (uint)!bVar10 * auVar118._12_4_;
          auVar122 = vxorps_avx512vl(auVar119,auVar123);
          auVar135._0_4_ =
               (uint)(bVar59 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar119._0_4_;
          bVar10 = (bool)((byte)(uVar60 >> 1) & 1);
          auVar135._4_4_ = (uint)bVar10 * auVar122._4_4_ | (uint)!bVar10 * auVar119._4_4_;
          bVar10 = (bool)((byte)(uVar60 >> 2) & 1);
          auVar135._8_4_ = (uint)bVar10 * auVar122._8_4_ | (uint)!bVar10 * auVar119._8_4_;
          bVar10 = (bool)((byte)(uVar60 >> 3) & 1);
          auVar135._12_4_ = (uint)bVar10 * auVar122._12_4_ | (uint)!bVar10 * auVar119._12_4_;
          auVar122 = vxorps_avx512vl(auVar120,auVar123);
          auVar136._0_4_ =
               (uint)(bVar59 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar120._0_4_;
          bVar10 = (bool)((byte)(uVar60 >> 1) & 1);
          auVar136._4_4_ = (uint)bVar10 * auVar122._4_4_ | (uint)!bVar10 * auVar120._4_4_;
          bVar10 = (bool)((byte)(uVar60 >> 2) & 1);
          auVar136._8_4_ = (uint)bVar10 * auVar122._8_4_ | (uint)!bVar10 * auVar120._8_4_;
          bVar10 = (bool)((byte)(uVar60 >> 3) & 1);
          auVar136._12_4_ = (uint)bVar10 * auVar122._12_4_ | (uint)!bVar10 * auVar120._12_4_;
          auVar122 = vxorps_avx512vl(auVar131,auVar123);
          bVar10 = (bool)((byte)uVar66 & 1);
          auVar137._0_4_ = (uint)bVar10 * auVar122._0_4_ | !bVar10 * auVar131._0_4_;
          bVar10 = (bool)((byte)(uVar66 >> 1) & 1);
          auVar137._4_4_ = (uint)bVar10 * auVar122._4_4_ | !bVar10 * auVar131._4_4_;
          bVar10 = (bool)((byte)(uVar66 >> 2) & 1);
          auVar137._8_4_ = (uint)bVar10 * auVar122._8_4_ | !bVar10 * auVar131._8_4_;
          bVar10 = SUB81(uVar66 >> 3,0);
          auVar137._12_4_ = (uint)bVar10 * auVar122._12_4_ | !bVar10 * auVar131._12_4_;
          auVar122 = vxorps_avx512vl(auVar132,auVar123);
          bVar10 = (bool)((byte)uVar67 & 1);
          auVar138._0_4_ = (uint)bVar10 * auVar122._0_4_ | !bVar10 * auVar132._0_4_;
          bVar10 = (bool)((byte)(uVar67 >> 1) & 1);
          auVar138._4_4_ = (uint)bVar10 * auVar122._4_4_ | !bVar10 * auVar132._4_4_;
          bVar10 = (bool)((byte)(uVar67 >> 2) & 1);
          auVar138._8_4_ = (uint)bVar10 * auVar122._8_4_ | !bVar10 * auVar132._8_4_;
          bVar10 = SUB81(uVar67 >> 3,0);
          auVar138._12_4_ = (uint)bVar10 * auVar122._12_4_ | !bVar10 * auVar132._12_4_;
          auVar122 = vfmsub213ps_avx512vl(auVar73,auVar124,auVar133);
          auVar118 = vfmsub213ps_avx512vl(auVar95,auVar124,auVar134);
          auVar119 = vmulps_avx512vl(auVar122,auVar122);
          auVar120 = vmulps_avx512vl(auVar118,auVar118);
          auVar119 = vaddps_avx512vl(auVar119,auVar120);
          auVar120 = vfmsub213ps_avx512vl(auVar89,auVar124,auVar135);
          auVar121 = vmulps_avx512vl(auVar120,auVar120);
          auVar119 = vaddps_avx512vl(auVar121,auVar119);
          auVar121 = vfmsub213ps_avx512vl(auVar101,auVar124,auVar136);
          auVar123 = vmulps_avx512vl(auVar121,auVar121);
          auVar119 = vaddps_avx512vl(auVar123,auVar119);
          auVar123 = vrsqrt14ps_avx512vl(auVar119);
          auVar200._0_4_ = auVar119._0_4_ * -0.5;
          auVar200._4_4_ = auVar119._4_4_ * -0.5;
          auVar200._8_4_ = auVar119._8_4_ * -0.5;
          auVar200._12_4_ = auVar119._12_4_ * -0.5;
          auVar119 = vmulps_avx512vl(auVar123,auVar200);
          auVar126 = vmulps_avx512vl(auVar123,auVar123);
          auVar201._0_4_ = auVar126._0_4_ * auVar119._0_4_;
          auVar201._4_4_ = auVar126._4_4_ * auVar119._4_4_;
          auVar201._8_4_ = auVar126._8_4_ * auVar119._8_4_;
          auVar201._12_4_ = auVar126._12_4_ * auVar119._12_4_;
          auVar219._8_4_ = 0x3fc00000;
          auVar219._0_8_ = 0x3fc000003fc00000;
          auVar219._12_4_ = 0x3fc00000;
          auVar119 = vfmadd231ps_avx512vl(auVar201,auVar219,auVar123);
          auVar307._0_4_ = auVar122._0_4_ * auVar119._0_4_;
          auVar307._4_4_ = auVar122._4_4_ * auVar119._4_4_;
          auVar307._8_4_ = auVar122._8_4_ * auVar119._8_4_;
          auVar307._12_4_ = auVar122._12_4_ * auVar119._12_4_;
          auVar122 = vmulps_avx512vl(auVar118,auVar119);
          auVar118 = vmulps_avx512vl(auVar120,auVar119);
          auVar119 = vmulps_avx512vl(auVar121,auVar119);
          auVar120 = vmulps_avx512vl(auVar307,auVar137);
          auVar122 = vmulps_avx512vl(auVar122,auVar137);
          auVar118 = vmulps_avx512vl(auVar118,auVar137);
          auVar119 = vmulps_avx512vl(auVar119,auVar137);
          auVar120 = vfmsub231ps_avx512vl(auVar120,auVar138,auVar73);
          auVar122 = vfmsub231ps_avx512vl(auVar122,auVar138,auVar95);
          auVar118 = vfmsub231ps_avx512vl(auVar118,auVar138,auVar89);
          auVar119 = vfmsub231ps_avx512vl(auVar119,auVar101,auVar138);
          auVar121 = vsubps_avx512vl(auVar133,auVar73);
          auVar121 = vfmadd213ps_avx512vl(auVar121,auVar90,auVar73);
          auVar73 = vsubps_avx512vl(auVar134,auVar95);
          auVar73 = vfmadd213ps_fma(auVar73,auVar90,auVar95);
          auVar95 = vsubps_avx512vl(auVar135,auVar89);
          auVar89 = vfmadd213ps_fma(auVar95,auVar90,auVar89);
          auVar95 = vsubps_avx512vl(auVar136,auVar101);
          auVar101 = vfmadd213ps_avx512vl(auVar95,auVar90,auVar101);
          auVar315._0_4_ =
               auVar101._0_4_ * auVar101._0_4_ +
               auVar89._0_4_ * auVar89._0_4_ +
               auVar121._0_4_ * auVar121._0_4_ + auVar73._0_4_ * auVar73._0_4_;
          auVar315._4_4_ =
               auVar101._4_4_ * auVar101._4_4_ +
               auVar89._4_4_ * auVar89._4_4_ +
               auVar121._4_4_ * auVar121._4_4_ + auVar73._4_4_ * auVar73._4_4_;
          auVar315._8_4_ =
               auVar101._8_4_ * auVar101._8_4_ +
               auVar89._8_4_ * auVar89._8_4_ +
               auVar121._8_4_ * auVar121._8_4_ + auVar73._8_4_ * auVar73._8_4_;
          auVar315._12_4_ =
               auVar101._12_4_ * auVar101._12_4_ +
               auVar89._12_4_ * auVar89._12_4_ +
               auVar121._12_4_ * auVar121._12_4_ + auVar73._12_4_ * auVar73._12_4_;
          auVar95 = vrsqrt14ps_avx512vl(auVar315);
          fVar69 = auVar95._0_4_;
          fVar70 = auVar95._4_4_;
          fVar71 = auVar95._8_4_;
          fVar72 = auVar95._12_4_;
          auVar284._0_4_ = fVar69 * fVar69 * fVar69 * auVar315._0_4_ * -0.5;
          auVar284._4_4_ = fVar70 * fVar70 * fVar70 * auVar315._4_4_ * -0.5;
          auVar284._8_4_ = fVar71 * fVar71 * fVar71 * auVar315._8_4_ * -0.5;
          auVar284._12_4_ = fVar72 * fVar72 * fVar72 * auVar315._12_4_ * -0.5;
          auVar95 = vfmadd231ps_fma(auVar284,auVar95,auVar219);
          auVar37._8_4_ = 0x3f7fdf3b;
          auVar37._0_8_ = 0x3f7fdf3b3f7fdf3b;
          auVar37._12_4_ = 0x3f7fdf3b;
          uVar60 = vcmpps_avx512vl(auVar124,auVar37,6);
          auVar123 = vbroadcastss_avx512vl(auVar102);
          auVar121 = vmulps_avx512vl(auVar121,auVar95);
          bVar59 = (byte)uVar60;
          auVar139._0_4_ =
               (uint)(bVar59 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar120._0_4_;
          bVar10 = (bool)((byte)(uVar60 >> 1) & 1);
          auVar139._4_4_ = (uint)bVar10 * auVar121._4_4_ | (uint)!bVar10 * auVar120._4_4_;
          bVar10 = (bool)((byte)(uVar60 >> 2) & 1);
          auVar139._8_4_ = (uint)bVar10 * auVar121._8_4_ | (uint)!bVar10 * auVar120._8_4_;
          bVar10 = (bool)((byte)(uVar60 >> 3) & 1);
          auVar139._12_4_ = (uint)bVar10 * auVar121._12_4_ | (uint)!bVar10 * auVar120._12_4_;
          auVar120 = vshufps_avx512vl(auVar102,auVar102,0x55);
          auVar102 = vshufps_avx512vl(auVar102,auVar102,0xaa);
          auVar73 = vmulps_avx512vl(auVar73,auVar95);
          auVar140._0_4_ =
               (uint)(bVar59 & 1) * auVar73._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar122._0_4_;
          bVar10 = (bool)((byte)(uVar60 >> 1) & 1);
          auVar140._4_4_ = (uint)bVar10 * auVar73._4_4_ | (uint)!bVar10 * auVar122._4_4_;
          bVar10 = (bool)((byte)(uVar60 >> 2) & 1);
          auVar140._8_4_ = (uint)bVar10 * auVar73._8_4_ | (uint)!bVar10 * auVar122._8_4_;
          bVar10 = (bool)((byte)(uVar60 >> 3) & 1);
          auVar140._12_4_ = (uint)bVar10 * auVar73._12_4_ | (uint)!bVar10 * auVar122._12_4_;
          auVar73 = vbroadcastss_avx512vl(auVar74);
          auVar89 = vmulps_avx512vl(auVar89,auVar95);
          auVar141._0_4_ =
               (uint)(bVar59 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar118._0_4_;
          bVar10 = (bool)((byte)(uVar60 >> 1) & 1);
          auVar141._4_4_ = (uint)bVar10 * auVar89._4_4_ | (uint)!bVar10 * auVar118._4_4_;
          bVar10 = (bool)((byte)(uVar60 >> 2) & 1);
          auVar141._8_4_ = (uint)bVar10 * auVar89._8_4_ | (uint)!bVar10 * auVar118._8_4_;
          bVar10 = (bool)((byte)(uVar60 >> 3) & 1);
          auVar141._12_4_ = (uint)bVar10 * auVar89._12_4_ | (uint)!bVar10 * auVar118._12_4_;
          auVar89 = vshufps_avx512vl(auVar74,auVar74,0x55);
          auVar74 = vshufps_avx512vl(auVar74,auVar74,0xaa);
          auVar95 = vmulps_avx512vl(auVar101,auVar95);
          auVar142._0_4_ =
               (uint)(bVar59 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar119._0_4_;
          bVar10 = (bool)((byte)(uVar60 >> 1) & 1);
          auVar142._4_4_ = (uint)bVar10 * auVar95._4_4_ | (uint)!bVar10 * auVar119._4_4_;
          bVar10 = (bool)((byte)(uVar60 >> 2) & 1);
          auVar142._8_4_ = (uint)bVar10 * auVar95._8_4_ | (uint)!bVar10 * auVar119._8_4_;
          bVar10 = (bool)((byte)(uVar60 >> 3) & 1);
          auVar142._12_4_ = (uint)bVar10 * auVar95._12_4_ | (uint)!bVar10 * auVar119._12_4_;
          auVar95 = vbroadcastss_avx512vl(auVar75);
          auVar101 = vshufps_avx512vl(auVar75,auVar75,0x55);
          auVar75 = vshufps_avx512vl(auVar75,auVar75,0xaa);
          auVar122 = vsubps_avx512vl(auVar125,auVar90);
          auVar220._0_4_ = fVar169 * auVar123._0_4_;
          auVar220._4_4_ = fVar179 * auVar123._4_4_;
          auVar220._8_4_ = fVar180 * auVar123._8_4_;
          auVar220._12_4_ = fVar181 * auVar123._12_4_;
          auVar118 = vfmadd213ps_avx512vl(local_168,auVar122,auVar220);
          auVar119 = vbroadcastss_avx512vl(auVar94);
          auVar189._0_4_ = fVar169 * auVar120._0_4_;
          auVar189._4_4_ = fVar179 * auVar120._4_4_;
          auVar189._8_4_ = fVar180 * auVar120._8_4_;
          auVar189._12_4_ = fVar181 * auVar120._12_4_;
          auVar120 = vfmadd213ps_avx512vl(auVar91,auVar122,auVar189);
          auVar91 = vshufps_avx512vl(auVar94,auVar94,0x55);
          auVar94 = vshufps_avx512vl(auVar94,auVar94,0xaa);
          auVar316._0_4_ = auVar102._0_4_ * fVar169;
          auVar316._4_4_ = auVar102._4_4_ * fVar179;
          auVar316._8_4_ = auVar102._8_4_ * fVar180;
          auVar316._12_4_ = auVar102._12_4_ * fVar181;
          auVar92 = vfmadd213ps_avx512vl(auVar92,auVar122,auVar316);
          auVar202._0_4_ = fVar169 * auVar73._0_4_;
          auVar202._4_4_ = fVar179 * auVar73._4_4_;
          auVar202._8_4_ = fVar180 * auVar73._8_4_;
          auVar202._12_4_ = fVar181 * auVar73._12_4_;
          auVar295._0_4_ = auVar89._0_4_ * fVar169;
          auVar295._4_4_ = auVar89._4_4_ * fVar179;
          auVar295._8_4_ = auVar89._8_4_ * fVar180;
          auVar295._12_4_ = auVar89._12_4_ * fVar181;
          auVar317._0_4_ = auVar74._0_4_ * fVar169;
          auVar317._4_4_ = auVar74._4_4_ * fVar179;
          auVar317._8_4_ = auVar74._8_4_ * fVar180;
          auVar317._12_4_ = auVar74._12_4_ * fVar181;
          auVar73 = vfmadd213ps_avx512vl(local_148,auVar122,auVar202);
          auVar102 = vfmadd213ps_avx512vl(auVar96,auVar122,auVar295);
          auVar74 = vfmadd213ps_avx512vl(auVar97,auVar122,auVar317);
          auVar203._0_4_ = auVar95._0_4_ * fVar169;
          auVar203._4_4_ = auVar95._4_4_ * fVar179;
          auVar203._8_4_ = auVar95._8_4_ * fVar180;
          auVar203._12_4_ = auVar95._12_4_ * fVar181;
          auVar285._0_4_ = auVar101._0_4_ * fVar169;
          auVar285._4_4_ = auVar101._4_4_ * fVar179;
          auVar285._8_4_ = auVar101._8_4_ * fVar180;
          auVar285._12_4_ = auVar101._12_4_ * fVar181;
          auVar89 = vmulps_avx512vl(auVar90,auVar75);
          auVar75 = vfmadd213ps_avx512vl(local_158,auVar122,auVar203);
          auVar95 = vfmadd213ps_avx512vl(auVar98,auVar122,auVar285);
          auVar96 = vfmadd213ps_avx512vl(auVar99,auVar122,auVar89);
          auVar204._0_4_ = fVar169 * auVar119._0_4_;
          auVar204._4_4_ = fVar179 * auVar119._4_4_;
          auVar204._8_4_ = fVar180 * auVar119._8_4_;
          auVar204._12_4_ = fVar181 * auVar119._12_4_;
          auVar190._0_4_ = fVar169 * auVar91._0_4_;
          auVar190._4_4_ = fVar179 * auVar91._4_4_;
          auVar190._8_4_ = fVar180 * auVar91._8_4_;
          auVar190._12_4_ = fVar181 * auVar91._12_4_;
          auVar89 = vmulps_avx512vl(auVar90,auVar94);
          auVar94 = vfmadd213ps_avx512vl(local_178,auVar122,auVar204);
          auVar93 = vfmadd213ps_avx512vl(auVar93,auVar122,auVar190);
          auVar97 = vfmadd213ps_avx512vl(auVar100,auVar122,auVar89);
          auVar91 = vmulps_avx512vl(auVar139,auVar139);
          auVar98 = vmulps_avx512vl(auVar140,auVar140);
          auVar174._0_4_ = auVar91._0_4_ + auVar98._0_4_;
          auVar174._4_4_ = auVar91._4_4_ + auVar98._4_4_;
          auVar174._8_4_ = auVar91._8_4_ + auVar98._8_4_;
          auVar174._12_4_ = auVar91._12_4_ + auVar98._12_4_;
          auVar99 = vmulps_avx512vl(auVar141,auVar141);
          auVar89 = vsubps_avx(auVar174,auVar99);
          auVar100 = vmulps_avx512vl(auVar142,auVar142);
          auVar89 = vsubps_avx(auVar89,auVar100);
          auVar90 = vmulps_avx512vl(auVar140,auVar141);
          auVar101 = vmulps_avx512vl(auVar139,auVar142);
          fVar169 = auVar90._0_4_ + auVar101._0_4_;
          fVar179 = auVar90._4_4_ + auVar101._4_4_;
          fVar180 = auVar90._8_4_ + auVar101._8_4_;
          fVar181 = auVar90._12_4_ + auVar101._12_4_;
          auVar175._0_4_ = fVar169 + fVar169;
          auVar175._4_4_ = fVar179 + fVar179;
          auVar175._8_4_ = fVar180 + fVar180;
          auVar175._12_4_ = fVar181 + fVar181;
          auVar122 = vmulps_avx512vl(auVar140,auVar142);
          auVar119 = vmulps_avx512vl(auVar139,auVar141);
          auVar121 = vsubps_avx512vl(auVar122,auVar119);
          auVar121 = vaddps_avx512vl(auVar121,auVar121);
          auVar90 = vsubps_avx(auVar90,auVar101);
          auVar296._0_4_ = auVar90._0_4_ + auVar90._0_4_;
          auVar296._4_4_ = auVar90._4_4_ + auVar90._4_4_;
          auVar296._8_4_ = auVar90._8_4_ + auVar90._8_4_;
          auVar296._12_4_ = auVar90._12_4_ + auVar90._12_4_;
          auVar90 = vsubps_avx(auVar91,auVar98);
          auVar205._0_4_ = auVar99._0_4_ + auVar90._0_4_;
          auVar205._4_4_ = auVar99._4_4_ + auVar90._4_4_;
          auVar205._8_4_ = auVar99._8_4_ + auVar90._8_4_;
          auVar205._12_4_ = auVar99._12_4_ + auVar90._12_4_;
          auVar98 = vsubps_avx512vl(auVar205,auVar100);
          auVar91 = vmulps_avx512vl(auVar141,auVar142);
          auVar101 = vmulps_avx512vl(auVar139,auVar140);
          auVar123 = vaddps_avx512vl(auVar91,auVar101);
          auVar124 = vaddps_avx512vl(auVar123,auVar123);
          auVar122 = vaddps_avx512vl(auVar122,auVar119);
          auVar122 = vaddps_avx512vl(auVar122,auVar122);
          auVar91 = vsubps_avx(auVar91,auVar101);
          auVar101 = vaddps_avx512vl(auVar91,auVar91);
          auVar90 = vsubps_avx(auVar90,auVar99);
          auVar191._0_4_ = auVar100._0_4_ + auVar90._0_4_;
          auVar191._4_4_ = auVar100._4_4_ + auVar90._4_4_;
          auVar191._8_4_ = auVar100._8_4_ + auVar90._8_4_;
          auVar191._12_4_ = auVar100._12_4_ + auVar90._12_4_;
          auVar90 = vmulps_avx512vl(auVar121,auVar143);
          auVar91 = vxorps_avx512vl(auVar123,auVar123);
          auVar99 = vfmadd213ps_avx512vl(auVar91,auVar175,auVar90);
          auVar323._0_4_ = auVar175._0_4_ + auVar90._0_4_;
          auVar323._4_4_ = auVar175._4_4_ + auVar90._4_4_;
          auVar323._8_4_ = auVar175._8_4_ + auVar90._8_4_;
          auVar323._12_4_ = auVar175._12_4_ + auVar90._12_4_;
          auVar91 = vfmadd213ps_avx512vl(auVar175,auVar143,auVar121);
          auVar90 = vfmadd231ps_fma(auVar323,auVar89,auVar143);
          auVar91 = vfmadd231ps_fma(auVar91,auVar143,auVar89);
          auVar100 = vmulps_avx512vl(auVar124,auVar143);
          auVar119 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar98,auVar100);
          auVar100 = vaddps_avx512vl(auVar98,auVar100);
          auVar98 = vfmadd213ps_avx512vl(auVar98,auVar143,auVar124);
          auVar119 = vaddps_avx512vl(auVar296,auVar119);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar296,auVar143);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar143,auVar296);
          auVar206._0_4_ = auVar191._0_4_ * 0.0;
          auVar206._4_4_ = auVar191._4_4_ * 0.0;
          auVar206._8_4_ = auVar191._8_4_ * 0.0;
          auVar206._12_4_ = auVar191._12_4_ * 0.0;
          auVar121 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar101,auVar206);
          auVar123 = vaddps_avx512vl(auVar101,auVar206);
          auVar101 = vfmadd213ps_avx512vl(auVar101,auVar143,auVar191);
          auVar121 = vaddps_avx512vl(auVar122,auVar121);
          auVar123 = vfmadd231ps_avx512vl(auVar123,auVar122,auVar143);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar143,auVar122);
          auVar122 = vaddps_avx512vl(auVar120,auVar143);
          auVar120 = vaddps_avx512vl(auVar92,auVar143);
          auVar74 = vaddps_avx512vl(auVar74,auVar143);
          auVar92 = vmulps_avx512vl(auVar121,auVar143);
          auVar297._0_4_ = auVar123._0_4_ * 0.0;
          auVar297._4_4_ = auVar123._4_4_ * 0.0;
          auVar297._8_4_ = auVar123._8_4_ * 0.0;
          auVar297._12_4_ = auVar123._12_4_ * 0.0;
          auVar124 = vmulps_avx512vl(auVar101,auVar143);
          auVar125 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar119,auVar92);
          auVar126 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar100,auVar297);
          auVar127 = vfmadd213ps_avx512vl(auVar143,auVar98,auVar124);
          auVar129 = vfmadd231ps_avx512vl(auVar92,auVar102,auVar119);
          auVar130 = vfmadd231ps_avx512vl(auVar297,auVar102,auVar100);
          auVar102 = vfmadd213ps_avx512vl(auVar102,auVar98,auVar124);
          auVar221._0_4_ = auVar96._0_4_ * auVar121._0_4_;
          auVar221._4_4_ = auVar96._4_4_ * auVar121._4_4_;
          auVar221._8_4_ = auVar96._8_4_ * auVar121._8_4_;
          auVar221._12_4_ = auVar96._12_4_ * auVar121._12_4_;
          auVar92 = vmulps_avx512vl(auVar96,auVar123);
          auVar96 = vmulps_avx512vl(auVar96,auVar101);
          auVar124 = vfmadd231ps_avx512vl(auVar221,auVar95,auVar119);
          auVar143 = vfmadd231ps_avx512vl(auVar92,auVar95,auVar100);
          auVar95 = vfmadd231ps_avx512vl(auVar96,auVar98,auVar95);
          auVar192._0_4_ = auVar97._0_4_ * auVar121._0_4_;
          auVar192._4_4_ = auVar97._4_4_ * auVar121._4_4_;
          auVar192._8_4_ = auVar97._8_4_ * auVar121._8_4_;
          auVar192._12_4_ = auVar97._12_4_ * auVar121._12_4_;
          auVar207._0_4_ = auVar97._0_4_ * auVar123._0_4_;
          auVar207._4_4_ = auVar97._4_4_ * auVar123._4_4_;
          auVar207._8_4_ = auVar97._8_4_ * auVar123._8_4_;
          auVar207._12_4_ = auVar97._12_4_ * auVar123._12_4_;
          auVar92 = vmulps_avx512vl(auVar97,auVar101);
          auVar96 = vfmadd231ps_avx512vl(auVar192,auVar93,auVar119);
          auVar97 = vfmadd231ps_avx512vl(auVar207,auVar93,auVar100);
          auVar98 = vfmadd231ps_avx512vl(auVar92,auVar93,auVar98);
          auVar99 = vaddps_avx512vl(auVar89,auVar99);
          auVar89 = vfmadd231ps_fma(auVar125,auVar118,auVar99);
          auVar92 = vfmadd231ps_fma(auVar126,auVar118,auVar90);
          auVar93 = vfmadd231ps_fma(auVar127,auVar91,auVar118);
          auVar100 = vfmadd231ps_avx512vl(auVar129,auVar73,auVar99);
          auVar101 = vfmadd231ps_avx512vl(auVar130,auVar73,auVar90);
          auVar118 = vfmadd231ps_avx512vl(auVar102,auVar91,auVar73);
          auVar73 = vfmadd231ps_fma(auVar124,auVar75,auVar99);
          auVar119 = vfmadd231ps_avx512vl(auVar143,auVar75,auVar90);
          auVar102 = vfmadd231ps_fma(auVar95,auVar91,auVar75);
          auVar75 = vfmadd231ps_avx512vl(auVar96,auVar94,auVar99);
          auVar99 = vaddps_avx512vl(auVar122,auVar75);
          auVar90 = vfmadd231ps_avx512vl(auVar97,auVar94,auVar90);
          auVar97 = vaddps_avx512vl(auVar120,auVar90);
          auVar90 = vfmadd231ps_avx512vl(auVar98,auVar94,auVar91);
          auVar98 = vaddps_avx512vl(auVar74,auVar90);
          auVar90 = vmulps_avx512vl(auVar119,auVar118);
          auVar91 = vfmsub231ps_fma(auVar90,auVar101,auVar102);
          auVar90 = vmulps_avx512vl(auVar102,auVar100);
          auVar74 = vfmsub231ps_fma(auVar90,auVar118,auVar73);
          auVar245._0_4_ = auVar101._0_4_ * auVar73._0_4_;
          auVar245._4_4_ = auVar101._4_4_ * auVar73._4_4_;
          auVar245._8_4_ = auVar101._8_4_ * auVar73._8_4_;
          auVar245._12_4_ = auVar101._12_4_ * auVar73._12_4_;
          auVar122 = vfmsub231ps_avx512vl(auVar245,auVar100,auVar119);
          fVar169 = auVar93._0_4_;
          auVar235._0_4_ = fVar169 * auVar73._0_4_;
          fVar179 = auVar93._4_4_;
          auVar235._4_4_ = fVar179 * auVar73._4_4_;
          fVar180 = auVar93._8_4_;
          auVar235._8_4_ = fVar180 * auVar73._8_4_;
          fVar181 = auVar93._12_4_;
          auVar235._12_4_ = fVar181 * auVar73._12_4_;
          auVar94 = vfmsub231ps_fma(auVar235,auVar89,auVar102);
          auVar193._0_4_ = auVar92._0_4_ * auVar102._0_4_;
          auVar193._4_4_ = auVar92._4_4_ * auVar102._4_4_;
          auVar193._8_4_ = auVar92._8_4_ * auVar102._8_4_;
          auVar193._12_4_ = auVar92._12_4_ * auVar102._12_4_;
          auVar102 = vfmsub231ps_avx512vl(auVar193,auVar119,auVar93);
          auVar90 = vmulps_avx512vl(auVar89,auVar119);
          auVar95 = vfmsub231ps_fma(auVar90,auVar92,auVar73);
          auVar222._0_4_ = auVar101._0_4_ * fVar169;
          auVar222._4_4_ = auVar101._4_4_ * fVar179;
          auVar222._8_4_ = auVar101._8_4_ * fVar180;
          auVar222._12_4_ = auVar101._12_4_ * fVar181;
          auVar73 = vfmsub231ps_fma(auVar222,auVar92,auVar118);
          auVar262._0_4_ = auVar89._0_4_ * auVar118._0_4_;
          auVar262._4_4_ = auVar89._4_4_ * auVar118._4_4_;
          auVar262._8_4_ = auVar89._8_4_ * auVar118._8_4_;
          auVar262._12_4_ = auVar89._12_4_ * auVar118._12_4_;
          auVar118 = vfmsub231ps_avx512vl(auVar262,auVar93,auVar100);
          auVar90 = vmulps_avx512vl(auVar100,auVar92);
          auVar96 = vfmsub231ps_fma(auVar90,auVar89,auVar101);
          auVar298._0_4_ = fVar169 * auVar122._0_4_;
          auVar298._4_4_ = fVar179 * auVar122._4_4_;
          auVar298._8_4_ = fVar180 * auVar122._8_4_;
          auVar298._12_4_ = fVar181 * auVar122._12_4_;
          auVar90 = vfmadd231ps_fma(auVar298,auVar74,auVar92);
          auVar75 = vfmadd231ps_fma(auVar90,auVar91,auVar89);
          auVar89 = vdivps_avx(auVar91,auVar75);
          auVar90 = vdivps_avx(auVar102,auVar75);
          auVar91 = vdivps_avx(auVar73,auVar75);
          auVar92 = vdivps_avx(auVar74,auVar75);
          auVar93 = vdivps_avx(auVar94,auVar75);
          auVar73 = vdivps_avx(auVar118,auVar75);
          auVar102 = vdivps_avx(auVar122,auVar75);
          auVar74 = vdivps_avx(auVar95,auVar75);
          auVar75 = vdivps_avx(auVar96,auVar75);
          auVar94 = vmulps_avx512vl(auVar98,auVar102);
          auVar95 = vmulps_avx512vl(auVar98,auVar74);
          auVar96 = vmulps_avx512vl(auVar98,auVar75);
          auVar94 = vfmadd231ps_fma(auVar94,auVar97,auVar92);
          auVar95 = vfmadd231ps_fma(auVar95,auVar97,auVar93);
          auVar96 = vfmadd231ps_fma(auVar96,auVar73,auVar97);
          auVar94 = vfmadd231ps_fma(auVar94,auVar99,auVar89);
          auVar95 = vfmadd231ps_fma(auVar95,auVar99,auVar90);
          auVar96 = vfmadd231ps_fma(auVar96,auVar91,auVar99);
        }
        else {
          lVar9 = *(long *)&pGVar7[1].fnumTimeSegments;
          uVar66 = uVar57;
          do {
            uVar5 = 0;
            for (uVar61 = (uint)uVar66; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x80000000) {
              uVar5 = uVar5 + 1;
            }
            lVar62 = (long)*(int *)(local_b8 + (ulong)uVar5 * 4) * 0x38;
            plVar1 = (long *)(lVar9 + lVar62);
            iVar6 = *(int *)(lVar9 + 0x20 + lVar62);
            auVar214 = SUB1612(ZEXT816(0),0);
            if (iVar6 == 0x9134) {
              lVar63 = *plVar1;
              lVar65 = plVar1[2] * uVar60;
              auVar91 = vinsertps_avx(ZEXT416(*(uint *)(lVar63 + lVar65)),
                                      ZEXT416(*(uint *)(lVar63 + 0x10 + lVar65)),0x1c);
              auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(lVar63 + 0x20 + lVar65)),0x28);
              in_ZMM5 = ZEXT1664(auVar91);
              auVar91 = vinsertps_avx(ZEXT416(*(uint *)(lVar63 + 4 + lVar65)),
                                      ZEXT416(*(uint *)(lVar63 + 0x14 + lVar65)),0x1c);
              auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(lVar63 + 0x24 + lVar65)),0x28);
              in_ZMM8 = ZEXT1664(auVar91);
              auVar91 = vinsertps_avx(ZEXT416(*(uint *)(lVar63 + 8 + lVar65)),
                                      ZEXT416(*(uint *)(lVar63 + 0x18 + lVar65)),0x1c);
              auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(lVar63 + 0x28 + lVar65)),0x28);
              in_ZMM10 = ZEXT1664(auVar91);
              auVar91 = vinsertps_avx(ZEXT416(*(uint *)(lVar63 + 0xc + lVar65)),
                                      ZEXT416(*(uint *)(lVar63 + 0x1c + lVar65)),0x1c);
              auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(lVar63 + 0x2c + lVar65)),0x28);
              in_ZMM11 = ZEXT1664(auVar91);
            }
            else if (iVar6 == 0x9234) {
              lVar63 = *plVar1;
              lVar65 = plVar1[2] * uVar60;
              auVar93._8_8_ = 0;
              auVar93._0_8_ = *(ulong *)(lVar63 + 4 + lVar65);
              auVar73._8_8_ = 0;
              auVar73._0_8_ = *(ulong *)(lVar63 + 0x10 + lVar65);
              auVar91 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar63 + lVar65)),_DAT_02060e80,auVar93
                                          );
              in_ZMM5 = ZEXT1664(auVar91);
              auVar91 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar63 + 0xc + lVar65)),_DAT_02060e80,
                                           auVar73);
              in_ZMM8 = ZEXT1664(auVar91);
              auVar102._8_8_ = 0;
              auVar102._0_8_ = *(ulong *)(lVar63 + 0x1c + lVar65);
              auVar91 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar63 + 0x18 + lVar65)),_DAT_02060e80,
                                           auVar102);
              in_ZMM10 = ZEXT1664(auVar91);
              auVar74._8_8_ = 0;
              auVar74._0_8_ = *(ulong *)(lVar63 + 0x28 + lVar65);
              auVar91 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar63 + 0x24 + lVar65)),_DAT_02060e80,
                                           auVar74);
              in_ZMM11 = ZEXT1664(auVar91);
            }
            else if (iVar6 == 0xb001) {
              lVar63 = *plVar1;
              lVar65 = plVar1[2] * uVar60;
              auVar75._8_8_ = 0;
              auVar75._0_8_ = *(ulong *)(lVar63 + 0x10 + lVar65);
              auVar93 = vinsertps_avx512f(auVar75,ZEXT416(*(uint *)(lVar63 + 8 + lVar65)),0x20);
              auVar94._8_8_ = 0;
              auVar94._0_8_ = *(ulong *)(lVar63 + 0x34 + lVar65);
              local_98 = ZEXT416(*(uint *)(lVar63 + 0xc + lVar65));
              auVar73 = vpermt2ps_avx512vl(auVar94,_DAT_02060e90,ZEXT416(*(uint *)(lVar63 + lVar65))
                                          );
              auVar97._8_8_ = 0;
              auVar97._0_8_ = *(ulong *)(lVar63 + 0x1c + lVar65);
              auVar102 = vpermt2ps_avx512vl(auVar97,_DAT_02060e90,
                                            ZEXT416(*(uint *)(lVar63 + 0x18 + lVar65)));
              fVar69 = *(float *)(lVar63 + 0x24 + lVar65);
              fVar70 = *(float *)(lVar63 + 0x28 + lVar65);
              fVar71 = *(float *)(lVar63 + 0x2c + lVar65);
              fVar72 = *(float *)(lVar63 + 0x30 + lVar65);
              auVar91 = vfmadd231ss_fma(ZEXT416((uint)(fVar70 * fVar70)),ZEXT416((uint)fVar69),
                                        ZEXT416((uint)fVar69));
              auVar91 = vfmadd231ss_fma(auVar91,ZEXT416((uint)fVar71),ZEXT416((uint)fVar71));
              auVar91 = vfmadd231ss_fma(auVar91,ZEXT416((uint)fVar72),ZEXT416((uint)fVar72));
              auVar96._4_12_ = auVar214;
              auVar96._0_4_ = auVar91._0_4_;
              auVar74 = vrsqrt14ss_avx512f(auVar92,auVar96);
              auVar75 = vmulss_avx512f(auVar74,ZEXT416(0x3fc00000));
              fVar293 = auVar74._0_4_;
              auVar91 = vaddss_avx512f(auVar75,ZEXT416((uint)(fVar293 * fVar293 *
                                                             fVar293 * auVar91._0_4_ * -0.5)));
              fVar293 = auVar91._0_4_;
              auVar91 = vinsertps_avx(auVar102,ZEXT416((uint)(fVar69 * fVar293)),0x30);
              in_ZMM11 = ZEXT1664(auVar91);
              auVar91 = vinsertps_avx(auVar73,ZEXT416((uint)(fVar70 * fVar293)),0x30);
              in_ZMM5 = ZEXT1664(auVar91);
              auVar91 = vinsertps_avx512f(auVar93,ZEXT416((uint)(fVar72 * fVar293)),0x30);
              in_ZMM10 = ZEXT1664(auVar91);
              auVar91 = vinsertps_avx(local_98,ZEXT416(*(uint *)(lVar63 + 4 + lVar65)),0x10);
              auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(lVar63 + 0x3c + lVar65)),0x20);
              auVar91 = vinsertps_avx(auVar91,ZEXT416((uint)(fVar71 * fVar293)),0x30);
              in_ZMM8 = ZEXT1664(auVar91);
            }
            else if (iVar6 == 0x9244) {
              lVar63 = *plVar1;
              lVar65 = plVar1[2] * uVar60;
              in_ZMM5 = ZEXT1664(*(undefined1 (*) [16])(lVar63 + lVar65));
              in_ZMM8 = ZEXT1664(*(undefined1 (*) [16])(lVar63 + 0x10 + lVar65));
              in_ZMM10 = ZEXT1664(*(undefined1 (*) [16])(lVar63 + 0x20 + lVar65));
              in_ZMM11 = ZEXT1664(*(undefined1 (*) [16])(lVar63 + 0x30 + lVar65));
            }
            auVar91 = vpbroadcastd_avx512vl();
            uVar17 = vpcmpeqd_avx512vl(auVar91,local_b8);
            iVar6 = *(int *)(lVar9 + 0x58 + lVar62);
            if (iVar6 == 0x9134) {
              lVar62 = plVar1[7];
              lVar63 = plVar1[9] * uVar60;
              auVar91 = vinsertps_avx(ZEXT416(*(uint *)(lVar62 + lVar63)),
                                      ZEXT416(*(uint *)(lVar62 + 0x10 + lVar63)),0x1c);
              auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(lVar62 + 0x20 + lVar63)),0x28);
              in_ZMM4 = ZEXT1664(auVar91);
              auVar91 = vinsertps_avx(ZEXT416(*(uint *)(lVar62 + 4 + lVar63)),
                                      ZEXT416(*(uint *)(lVar62 + 0x14 + lVar63)),0x1c);
              auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(lVar62 + 0x24 + lVar63)),0x28);
              in_ZMM6 = ZEXT1664(auVar91);
              auVar91 = vinsertps_avx(ZEXT416(*(uint *)(lVar62 + 8 + lVar63)),
                                      ZEXT416(*(uint *)(lVar62 + 0x18 + lVar63)),0x1c);
              auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(lVar62 + 0x28 + lVar63)),0x28);
              in_ZMM7 = ZEXT1664(auVar91);
              auVar91 = vinsertps_avx(ZEXT416(*(uint *)(lVar62 + 0xc + lVar63)),
                                      ZEXT416(*(uint *)(lVar62 + 0x1c + lVar63)),0x1c);
              auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(lVar62 + 0x2c + lVar63)),0x28);
              in_ZMM9 = ZEXT1664(auVar91);
            }
            else if (iVar6 == 0x9234) {
              lVar62 = plVar1[7];
              lVar63 = plVar1[9] * uVar60;
              auVar98._8_8_ = 0;
              auVar98._0_8_ = *(ulong *)(lVar62 + 4 + lVar63);
              auVar99._8_8_ = 0;
              auVar99._0_8_ = *(ulong *)(lVar62 + 0x10 + lVar63);
              auVar91 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar62 + lVar63)),_DAT_02060e80,auVar98
                                          );
              in_ZMM4 = ZEXT1664(auVar91);
              auVar91 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar62 + 0xc + lVar63)),_DAT_02060e80,
                                           auVar99);
              in_ZMM6 = ZEXT1664(auVar91);
              auVar100._8_8_ = 0;
              auVar100._0_8_ = *(ulong *)(lVar62 + 0x1c + lVar63);
              auVar91 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar62 + 0x18 + lVar63)),_DAT_02060e80,
                                           auVar100);
              in_ZMM7 = ZEXT1664(auVar91);
              auVar101._8_8_ = 0;
              auVar101._0_8_ = *(ulong *)(lVar62 + 0x28 + lVar63);
              auVar91 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar62 + 0x24 + lVar63)),_DAT_02060e80,
                                           auVar101);
              in_ZMM9 = ZEXT1664(auVar91);
            }
            else if (iVar6 == 0xb001) {
              lVar62 = plVar1[7];
              lVar63 = plVar1[9] * uVar60;
              auVar118._8_8_ = 0;
              auVar118._0_8_ = *(ulong *)(lVar62 + 0x10 + lVar63);
              local_98 = vinsertps_avx(auVar118,ZEXT416(*(uint *)(lVar62 + 8 + lVar63)),0x20);
              auVar119._8_8_ = 0;
              auVar119._0_8_ = *(ulong *)(lVar62 + 0x34 + lVar63);
              auVar93 = vpermt2ps_avx512vl(auVar119,_DAT_02060e90,
                                           ZEXT416(*(uint *)(lVar62 + lVar63)));
              auVar120._8_8_ = 0;
              auVar120._0_8_ = *(ulong *)(lVar62 + 0x1c + lVar63);
              auVar91 = vpermt2ps_avx512vl(auVar120,_DAT_02060e90,
                                           ZEXT416(*(uint *)(lVar62 + 0x18 + lVar63)));
              fVar69 = *(float *)(lVar62 + 0x24 + lVar63);
              fVar70 = *(float *)(lVar62 + 0x28 + lVar63);
              fVar71 = *(float *)(lVar62 + 0x2c + lVar63);
              fVar72 = *(float *)(lVar62 + 0x30 + lVar63);
              auVar73 = vmulss_avx512f(ZEXT416((uint)fVar70),ZEXT416((uint)fVar70));
              auVar73 = vfmadd231ss_avx512f(auVar73,ZEXT416((uint)fVar69),ZEXT416((uint)fVar69));
              auVar73 = vfmadd231ss_avx512f(auVar73,ZEXT416((uint)fVar71),ZEXT416((uint)fVar71));
              auVar73 = vfmadd231ss_avx512f(auVar73,ZEXT416((uint)fVar72),ZEXT416((uint)fVar72));
              auVar122._4_12_ = auVar214;
              auVar122._0_4_ = auVar73._0_4_;
              auVar102 = vrsqrt14ss_avx512f(auVar92,auVar122);
              auVar74 = vmulss_avx512f(auVar102,ZEXT416(0x3fc00000));
              auVar73 = vmulss_avx512f(auVar73,ZEXT416(0xbf000000));
              auVar73 = vmulss_avx512f(auVar102,auVar73);
              auVar73 = vmulss_avx512f(ZEXT416((uint)(auVar102._0_4_ * auVar102._0_4_)),auVar73);
              auVar73 = vaddss_avx512f(auVar74,auVar73);
              fVar293 = auVar73._0_4_;
              auVar91 = vinsertps_avx(auVar91,ZEXT416((uint)(fVar69 * fVar293)),0x30);
              in_ZMM9 = ZEXT1664(auVar91);
              auVar91 = vinsertps_avx(auVar93,ZEXT416((uint)(fVar70 * fVar293)),0x30);
              in_ZMM4 = ZEXT1664(auVar91);
              auVar91 = vinsertps_avx(local_98,ZEXT416((uint)(fVar72 * fVar293)),0x30);
              in_ZMM7 = ZEXT1664(auVar91);
              auVar91 = vinsertps_avx(ZEXT416(*(uint *)(lVar62 + 0xc + lVar63)),
                                      ZEXT416(*(uint *)(lVar62 + 4 + lVar63)),0x10);
              auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(lVar62 + 0x3c + lVar63)),0x20);
              auVar91 = vinsertps_avx(auVar91,ZEXT416((uint)(fVar71 * fVar293)),0x30);
              in_ZMM6 = ZEXT1664(auVar91);
            }
            else if (iVar6 == 0x9244) {
              lVar62 = plVar1[7];
              lVar63 = plVar1[9] * uVar60;
              in_ZMM4 = ZEXT1664(*(undefined1 (*) [16])(lVar62 + lVar63));
              in_ZMM6 = ZEXT1664(*(undefined1 (*) [16])(lVar62 + 0x10 + lVar63));
              in_ZMM7 = ZEXT1664(*(undefined1 (*) [16])(lVar62 + 0x20 + lVar63));
              in_ZMM9 = ZEXT1664(*(undefined1 (*) [16])(lVar62 + 0x30 + lVar63));
            }
            bVar64 = (byte)uVar66 & (byte)uVar17 & 0xf;
            bVar59 = ~bVar64 & (byte)uVar66;
            uVar66 = (ulong)bVar59;
            auVar93 = in_ZMM5._0_16_;
            auVar91 = vbroadcastss_avx512vl(auVar93);
            auVar121._0_4_ =
                 (uint)(bVar64 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar64 & 1) * in_ZMM18._0_4_;
            bVar10 = (bool)(bVar64 >> 1 & 1);
            auVar121._4_4_ = (uint)bVar10 * auVar91._4_4_ | (uint)!bVar10 * in_ZMM18._4_4_;
            bVar10 = (bool)(bVar64 >> 2 & 1);
            auVar121._8_4_ = (uint)bVar10 * auVar91._8_4_ | (uint)!bVar10 * in_ZMM18._8_4_;
            auVar121._12_4_ =
                 (uint)(bVar64 >> 3) * auVar91._12_4_ | (uint)!(bool)(bVar64 >> 3) * in_ZMM18._12_4_
            ;
            in_ZMM18 = ZEXT1664(auVar121);
            auVar91 = vshufps_avx512vl(auVar93,auVar93,0x55);
            auVar123._0_4_ =
                 (uint)(bVar64 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar64 & 1) * in_ZMM19._0_4_;
            bVar10 = (bool)(bVar64 >> 1 & 1);
            auVar123._4_4_ = (uint)bVar10 * auVar91._4_4_ | (uint)!bVar10 * in_ZMM19._4_4_;
            bVar10 = (bool)(bVar64 >> 2 & 1);
            auVar123._8_4_ = (uint)bVar10 * auVar91._8_4_ | (uint)!bVar10 * in_ZMM19._8_4_;
            auVar123._12_4_ =
                 (uint)(bVar64 >> 3) * auVar91._12_4_ | (uint)!(bool)(bVar64 >> 3) * in_ZMM19._12_4_
            ;
            in_ZMM19 = ZEXT1664(auVar123);
            auVar91 = vshufps_avx512vl(auVar93,auVar93,0xaa);
            bVar10 = (bool)(bVar64 >> 1 & 1);
            bVar11 = (bool)(bVar64 >> 2 & 1);
            local_118._4_4_ = (uint)bVar10 * auVar91._4_4_ | (uint)!bVar10 * local_118._4_4_;
            local_118._0_4_ =
                 (uint)(bVar64 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar64 & 1) * local_118._0_4_;
            local_118._8_4_ = (uint)bVar11 * auVar91._8_4_ | (uint)!bVar11 * local_118._8_4_;
            local_118._12_4_ =
                 (uint)(bVar64 >> 3) * auVar91._12_4_ |
                 (uint)!(bool)(bVar64 >> 3) * local_118._12_4_;
            auVar91 = vshufps_avx512vl(auVar93,auVar93,0xff);
            auVar124._0_4_ =
                 (uint)(bVar64 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar64 & 1) * in_ZMM27._0_4_;
            bVar10 = (bool)(bVar64 >> 1 & 1);
            auVar124._4_4_ = (uint)bVar10 * auVar91._4_4_ | (uint)!bVar10 * in_ZMM27._4_4_;
            bVar10 = (bool)(bVar64 >> 2 & 1);
            auVar124._8_4_ = (uint)bVar10 * auVar91._8_4_ | (uint)!bVar10 * in_ZMM27._8_4_;
            auVar124._12_4_ =
                 (uint)(bVar64 >> 3) * auVar91._12_4_ | (uint)!(bool)(bVar64 >> 3) * in_ZMM27._12_4_
            ;
            in_ZMM27 = ZEXT1664(auVar124);
            auVar93 = in_ZMM8._0_16_;
            auVar91 = vbroadcastss_avx512vl(auVar93);
            bVar10 = (bool)(bVar64 >> 1 & 1);
            bVar11 = (bool)(bVar64 >> 2 & 1);
            local_128._4_4_ = (uint)bVar10 * auVar91._4_4_ | (uint)!bVar10 * local_128._4_4_;
            local_128._0_4_ =
                 (uint)(bVar64 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar64 & 1) * local_128._0_4_;
            local_128._8_4_ = (uint)bVar11 * auVar91._8_4_ | (uint)!bVar11 * local_128._8_4_;
            local_128._12_4_ =
                 (uint)(bVar64 >> 3) * auVar91._12_4_ |
                 (uint)!(bool)(bVar64 >> 3) * local_128._12_4_;
            auVar91 = vshufps_avx512vl(auVar93,auVar93,0x55);
            bVar10 = (bool)(bVar64 >> 1 & 1);
            bVar11 = (bool)(bVar64 >> 2 & 1);
            local_168._4_4_ = (uint)bVar10 * auVar91._4_4_ | (uint)!bVar10 * local_168._4_4_;
            local_168._0_4_ =
                 (uint)(bVar64 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar64 & 1) * local_168._0_4_;
            local_168._8_4_ = (uint)bVar11 * auVar91._8_4_ | (uint)!bVar11 * local_168._8_4_;
            local_168._12_4_ =
                 (uint)(bVar64 >> 3) * auVar91._12_4_ |
                 (uint)!(bool)(bVar64 >> 3) * local_168._12_4_;
            auVar91 = vshufps_avx512vl(auVar93,auVar93,0xaa);
            bVar10 = (bool)(bVar64 >> 1 & 1);
            bVar11 = (bool)(bVar64 >> 2 & 1);
            local_108._4_4_ = (uint)bVar10 * auVar91._4_4_ | (uint)!bVar10 * local_108._4_4_;
            local_108._0_4_ =
                 (uint)(bVar64 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar64 & 1) * local_108._0_4_;
            local_108._8_4_ = (uint)bVar11 * auVar91._8_4_ | (uint)!bVar11 * local_108._8_4_;
            local_108._12_4_ =
                 (uint)(bVar64 >> 3) * auVar91._12_4_ |
                 (uint)!(bool)(bVar64 >> 3) * local_108._12_4_;
            auVar91 = vshufps_avx512vl(auVar93,auVar93,0xff);
            auVar125._0_4_ =
                 (uint)(bVar64 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar64 & 1) * in_ZMM25._0_4_;
            bVar10 = (bool)(bVar64 >> 1 & 1);
            auVar125._4_4_ = (uint)bVar10 * auVar91._4_4_ | (uint)!bVar10 * in_ZMM25._4_4_;
            bVar10 = (bool)(bVar64 >> 2 & 1);
            auVar125._8_4_ = (uint)bVar10 * auVar91._8_4_ | (uint)!bVar10 * in_ZMM25._8_4_;
            auVar125._12_4_ =
                 (uint)(bVar64 >> 3) * auVar91._12_4_ | (uint)!(bool)(bVar64 >> 3) * in_ZMM25._12_4_
            ;
            in_ZMM25 = ZEXT1664(auVar125);
            auVar93 = in_ZMM10._0_16_;
            auVar91 = vbroadcastss_avx512vl(auVar93);
            bVar10 = (bool)(bVar64 >> 1 & 1);
            bVar11 = (bool)(bVar64 >> 2 & 1);
            local_148._4_4_ = (uint)bVar10 * auVar91._4_4_ | (uint)!bVar10 * local_148._4_4_;
            local_148._0_4_ =
                 (uint)(bVar64 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar64 & 1) * local_148._0_4_;
            local_148._8_4_ = (uint)bVar11 * auVar91._8_4_ | (uint)!bVar11 * local_148._8_4_;
            local_148._12_4_ =
                 (uint)(bVar64 >> 3) * auVar91._12_4_ |
                 (uint)!(bool)(bVar64 >> 3) * local_148._12_4_;
            auVar91 = vshufps_avx512vl(auVar93,auVar93,0x55);
            bVar10 = (bool)(bVar64 >> 1 & 1);
            bVar11 = (bool)(bVar64 >> 2 & 1);
            local_e8._4_4_ = (uint)bVar10 * auVar91._4_4_ | (uint)!bVar10 * local_e8._4_4_;
            local_e8._0_4_ =
                 (uint)(bVar64 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar64 & 1) * local_e8._0_4_;
            local_e8._8_4_ = (uint)bVar11 * auVar91._8_4_ | (uint)!bVar11 * local_e8._8_4_;
            local_e8._12_4_ =
                 (uint)(bVar64 >> 3) * auVar91._12_4_ | (uint)!(bool)(bVar64 >> 3) * local_e8._12_4_
            ;
            auVar91 = vshufps_avx512vl(auVar93,auVar93,0xaa);
            bVar10 = (bool)(bVar64 >> 1 & 1);
            bVar11 = (bool)(bVar64 >> 2 & 1);
            local_f8._4_4_ = (uint)bVar10 * auVar91._4_4_ | (uint)!bVar10 * local_f8._4_4_;
            local_f8._0_4_ =
                 (uint)(bVar64 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar64 & 1) * local_f8._0_4_;
            local_f8._8_4_ = (uint)bVar11 * auVar91._8_4_ | (uint)!bVar11 * local_f8._8_4_;
            local_f8._12_4_ =
                 (uint)(bVar64 >> 3) * auVar91._12_4_ | (uint)!(bool)(bVar64 >> 3) * local_f8._12_4_
            ;
            auVar91 = vshufps_avx512vl(auVar93,auVar93,0xff);
            auVar126._0_4_ =
                 (uint)(bVar64 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar64 & 1) * in_ZMM22._0_4_;
            bVar10 = (bool)(bVar64 >> 1 & 1);
            auVar126._4_4_ = (uint)bVar10 * auVar91._4_4_ | (uint)!bVar10 * in_ZMM22._4_4_;
            bVar10 = (bool)(bVar64 >> 2 & 1);
            auVar126._8_4_ = (uint)bVar10 * auVar91._8_4_ | (uint)!bVar10 * in_ZMM22._8_4_;
            auVar126._12_4_ =
                 (uint)(bVar64 >> 3) * auVar91._12_4_ | (uint)!(bool)(bVar64 >> 3) * in_ZMM22._12_4_
            ;
            in_ZMM22 = ZEXT1664(auVar126);
            auVar93 = in_ZMM11._0_16_;
            auVar91 = vbroadcastss_avx512vl(auVar93);
            bVar10 = (bool)(bVar64 >> 1 & 1);
            bVar11 = (bool)(bVar64 >> 2 & 1);
            local_178._4_4_ = (uint)bVar10 * auVar91._4_4_ | (uint)!bVar10 * local_178._4_4_;
            local_178._0_4_ =
                 (uint)(bVar64 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar64 & 1) * local_178._0_4_;
            local_178._8_4_ = (uint)bVar11 * auVar91._8_4_ | (uint)!bVar11 * local_178._8_4_;
            local_178._12_4_ =
                 (uint)(bVar64 >> 3) * auVar91._12_4_ |
                 (uint)!(bool)(bVar64 >> 3) * local_178._12_4_;
            auVar91 = vshufps_avx512vl(auVar93,auVar93,0x55);
            bVar10 = (bool)(bVar64 >> 1 & 1);
            bVar11 = (bool)(bVar64 >> 2 & 1);
            local_158._4_4_ = (uint)bVar10 * auVar91._4_4_ | (uint)!bVar10 * local_158._4_4_;
            local_158._0_4_ =
                 (uint)(bVar64 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar64 & 1) * local_158._0_4_;
            local_158._8_4_ = (uint)bVar11 * auVar91._8_4_ | (uint)!bVar11 * local_158._8_4_;
            local_158._12_4_ =
                 (uint)(bVar64 >> 3) * auVar91._12_4_ |
                 (uint)!(bool)(bVar64 >> 3) * local_158._12_4_;
            auVar91 = vshufps_avx512vl(auVar93,auVar93,0xaa);
            bVar10 = (bool)(bVar64 >> 1 & 1);
            bVar11 = (bool)(bVar64 >> 2 & 1);
            local_138._4_4_ = (uint)bVar10 * auVar91._4_4_ | (uint)!bVar10 * local_138._4_4_;
            local_138._0_4_ =
                 (uint)(bVar64 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar64 & 1) * local_138._0_4_;
            local_138._8_4_ = (uint)bVar11 * auVar91._8_4_ | (uint)!bVar11 * local_138._8_4_;
            local_138._12_4_ =
                 (uint)(bVar64 >> 3) * auVar91._12_4_ |
                 (uint)!(bool)(bVar64 >> 3) * local_138._12_4_;
            auVar91 = vshufps_avx512vl(auVar93,auVar93,0xff);
            auVar127._0_4_ =
                 (uint)(bVar64 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar64 & 1) * in_ZMM24._0_4_;
            bVar10 = (bool)(bVar64 >> 1 & 1);
            auVar127._4_4_ = (uint)bVar10 * auVar91._4_4_ | (uint)!bVar10 * in_ZMM24._4_4_;
            bVar10 = (bool)(bVar64 >> 2 & 1);
            auVar127._8_4_ = (uint)bVar10 * auVar91._8_4_ | (uint)!bVar10 * in_ZMM24._8_4_;
            auVar127._12_4_ =
                 (uint)(bVar64 >> 3) * auVar91._12_4_ | (uint)!(bool)(bVar64 >> 3) * in_ZMM24._12_4_
            ;
            in_ZMM24 = ZEXT1664(auVar127);
            auVar93 = in_ZMM4._0_16_;
            auVar91 = vbroadcastss_avx512vl(auVar93);
            auVar129._0_4_ =
                 (uint)(bVar64 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar64 & 1) * in_ZMM28._0_4_;
            bVar10 = (bool)(bVar64 >> 1 & 1);
            auVar129._4_4_ = (uint)bVar10 * auVar91._4_4_ | (uint)!bVar10 * in_ZMM28._4_4_;
            bVar10 = (bool)(bVar64 >> 2 & 1);
            auVar129._8_4_ = (uint)bVar10 * auVar91._8_4_ | (uint)!bVar10 * in_ZMM28._8_4_;
            auVar129._12_4_ =
                 (uint)(bVar64 >> 3) * auVar91._12_4_ | (uint)!(bool)(bVar64 >> 3) * in_ZMM28._12_4_
            ;
            in_ZMM28 = ZEXT1664(auVar129);
            auVar91 = vshufps_avx512vl(auVar93,auVar93,0x55);
            auVar130._0_4_ =
                 (uint)(bVar64 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar64 & 1) * in_ZMM26._0_4_;
            bVar10 = (bool)(bVar64 >> 1 & 1);
            auVar130._4_4_ = (uint)bVar10 * auVar91._4_4_ | (uint)!bVar10 * in_ZMM26._4_4_;
            bVar10 = (bool)(bVar64 >> 2 & 1);
            auVar130._8_4_ = (uint)bVar10 * auVar91._8_4_ | (uint)!bVar10 * in_ZMM26._8_4_;
            auVar130._12_4_ =
                 (uint)(bVar64 >> 3) * auVar91._12_4_ | (uint)!(bool)(bVar64 >> 3) * in_ZMM26._12_4_
            ;
            in_ZMM26 = ZEXT1664(auVar130);
            auVar91 = vshufps_avx512vl(auVar93,auVar93,0xaa);
            auVar143._0_4_ =
                 (uint)(bVar64 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar64 & 1) * in_ZMM23._0_4_;
            bVar10 = (bool)(bVar64 >> 1 & 1);
            auVar143._4_4_ = (uint)bVar10 * auVar91._4_4_ | (uint)!bVar10 * in_ZMM23._4_4_;
            bVar10 = (bool)(bVar64 >> 2 & 1);
            auVar143._8_4_ = (uint)bVar10 * auVar91._8_4_ | (uint)!bVar10 * in_ZMM23._8_4_;
            auVar143._12_4_ =
                 (uint)(bVar64 >> 3) * auVar91._12_4_ | (uint)!(bool)(bVar64 >> 3) * in_ZMM23._12_4_
            ;
            in_ZMM23 = ZEXT1664(auVar143);
            auVar91 = vshufps_avx512vl(auVar93,auVar93,0xff);
            auVar144._0_4_ =
                 (uint)(bVar64 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar89._0_4_;
            bVar10 = (bool)(bVar64 >> 1 & 1);
            auVar144._4_4_ = (uint)bVar10 * auVar91._4_4_ | (uint)!bVar10 * auVar89._4_4_;
            bVar10 = (bool)(bVar64 >> 2 & 1);
            auVar144._8_4_ = (uint)bVar10 * auVar91._8_4_ | (uint)!bVar10 * auVar89._8_4_;
            auVar144._12_4_ =
                 (uint)(bVar64 >> 3) * auVar91._12_4_ | (uint)!(bool)(bVar64 >> 3) * auVar89._12_4_;
            auVar91 = in_ZMM6._0_16_;
            auVar89 = vbroadcastss_avx512vl(auVar91);
            auVar145._0_4_ =
                 (uint)(bVar64 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar64 & 1) * in_ZMM21._0_4_;
            bVar10 = (bool)(bVar64 >> 1 & 1);
            auVar145._4_4_ = (uint)bVar10 * auVar89._4_4_ | (uint)!bVar10 * in_ZMM21._4_4_;
            bVar10 = (bool)(bVar64 >> 2 & 1);
            auVar145._8_4_ = (uint)bVar10 * auVar89._8_4_ | (uint)!bVar10 * in_ZMM21._8_4_;
            auVar145._12_4_ =
                 (uint)(bVar64 >> 3) * auVar89._12_4_ | (uint)!(bool)(bVar64 >> 3) * in_ZMM21._12_4_
            ;
            in_ZMM21 = ZEXT1664(auVar145);
            auVar89 = vshufps_avx512vl(auVar91,auVar91,0x55);
            auVar146._0_4_ =
                 (uint)(bVar64 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar64 & 1) * in_ZMM20._0_4_;
            bVar10 = (bool)(bVar64 >> 1 & 1);
            auVar146._4_4_ = (uint)bVar10 * auVar89._4_4_ | (uint)!bVar10 * in_ZMM20._4_4_;
            bVar10 = (bool)(bVar64 >> 2 & 1);
            auVar146._8_4_ = (uint)bVar10 * auVar89._8_4_ | (uint)!bVar10 * in_ZMM20._8_4_;
            auVar146._12_4_ =
                 (uint)(bVar64 >> 3) * auVar89._12_4_ | (uint)!(bool)(bVar64 >> 3) * in_ZMM20._12_4_
            ;
            in_ZMM20 = ZEXT1664(auVar146);
            auVar89 = vshufps_avx512vl(auVar91,auVar91,0xaa);
            local_88 = (float)((uint)(bVar64 & 1) * auVar89._0_4_ |
                              (uint)!(bool)(bVar64 & 1) * (int)local_88);
            bVar10 = (bool)(bVar64 >> 1 & 1);
            fStack_84 = (float)((uint)bVar10 * auVar89._4_4_ | (uint)!bVar10 * (int)fStack_84);
            bVar10 = (bool)(bVar64 >> 2 & 1);
            fStack_80 = (float)((uint)bVar10 * auVar89._8_4_ | (uint)!bVar10 * (int)fStack_80);
            fStack_7c = (float)((uint)(bVar64 >> 3) * auVar89._12_4_ |
                               (uint)!(bool)(bVar64 >> 3) * (int)fStack_7c);
            auVar89 = vshufps_avx512vl(auVar91,auVar91,0xff);
            auVar147._0_4_ =
                 (uint)(bVar64 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar64 & 1) * in_ZMM31._0_4_;
            bVar10 = (bool)(bVar64 >> 1 & 1);
            auVar147._4_4_ = (uint)bVar10 * auVar89._4_4_ | (uint)!bVar10 * in_ZMM31._4_4_;
            bVar10 = (bool)(bVar64 >> 2 & 1);
            auVar147._8_4_ = (uint)bVar10 * auVar89._8_4_ | (uint)!bVar10 * in_ZMM31._8_4_;
            auVar147._12_4_ =
                 (uint)(bVar64 >> 3) * auVar89._12_4_ | (uint)!(bool)(bVar64 >> 3) * in_ZMM31._12_4_
            ;
            in_ZMM31 = ZEXT1664(auVar147);
            auVar91 = in_ZMM7._0_16_;
            auVar89 = vbroadcastss_avx512vl(auVar91);
            local_78 = (float)((uint)(bVar64 & 1) * auVar89._0_4_ |
                              (uint)!(bool)(bVar64 & 1) * (int)local_78);
            bVar10 = (bool)(bVar64 >> 1 & 1);
            fStack_74 = (float)((uint)bVar10 * auVar89._4_4_ | (uint)!bVar10 * (int)fStack_74);
            bVar10 = (bool)(bVar64 >> 2 & 1);
            fStack_70 = (float)((uint)bVar10 * auVar89._8_4_ | (uint)!bVar10 * (int)fStack_70);
            fStack_6c = (float)((uint)(bVar64 >> 3) * auVar89._12_4_ |
                               (uint)!(bool)(bVar64 >> 3) * (int)fStack_6c);
            auVar89 = vshufps_avx512vl(auVar91,auVar91,0x55);
            local_68 = (float)((uint)(bVar64 & 1) * auVar89._0_4_ |
                              (uint)!(bool)(bVar64 & 1) * (int)local_68);
            bVar10 = (bool)(bVar64 >> 1 & 1);
            fStack_64 = (float)((uint)bVar10 * auVar89._4_4_ | (uint)!bVar10 * (int)fStack_64);
            bVar10 = (bool)(bVar64 >> 2 & 1);
            fStack_60 = (float)((uint)bVar10 * auVar89._8_4_ | (uint)!bVar10 * (int)fStack_60);
            fStack_5c = (float)((uint)(bVar64 >> 3) * auVar89._12_4_ |
                               (uint)!(bool)(bVar64 >> 3) * (int)fStack_5c);
            auVar89 = vshufps_avx512vl(auVar91,auVar91,0xaa);
            local_58 = (float)((uint)(bVar64 & 1) * auVar89._0_4_ |
                              (uint)!(bool)(bVar64 & 1) * (int)local_58);
            bVar10 = (bool)(bVar64 >> 1 & 1);
            fStack_54 = (float)((uint)bVar10 * auVar89._4_4_ | (uint)!bVar10 * (int)fStack_54);
            bVar10 = (bool)(bVar64 >> 2 & 1);
            fStack_50 = (float)((uint)bVar10 * auVar89._8_4_ | (uint)!bVar10 * (int)fStack_50);
            fStack_4c = (float)((uint)(bVar64 >> 3) * auVar89._12_4_ |
                               (uint)!(bool)(bVar64 >> 3) * (int)fStack_4c);
            auVar89 = vshufps_avx512vl(auVar91,auVar91,0xff);
            auVar148._0_4_ =
                 (uint)(bVar64 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar64 & 1) * in_ZMM29._0_4_;
            bVar10 = (bool)(bVar64 >> 1 & 1);
            auVar148._4_4_ = (uint)bVar10 * auVar89._4_4_ | (uint)!bVar10 * in_ZMM29._4_4_;
            bVar10 = (bool)(bVar64 >> 2 & 1);
            auVar148._8_4_ = (uint)bVar10 * auVar89._8_4_ | (uint)!bVar10 * in_ZMM29._8_4_;
            auVar148._12_4_ =
                 (uint)(bVar64 >> 3) * auVar89._12_4_ | (uint)!(bool)(bVar64 >> 3) * in_ZMM29._12_4_
            ;
            in_ZMM29 = ZEXT1664(auVar148);
            auVar91 = in_ZMM9._0_16_;
            auVar89 = vbroadcastss_avx512vl(auVar91);
            local_48 = (float)((uint)(bVar64 & 1) * auVar89._0_4_ |
                              (uint)!(bool)(bVar64 & 1) * (int)local_48);
            bVar10 = (bool)(bVar64 >> 1 & 1);
            fStack_44 = (float)((uint)bVar10 * auVar89._4_4_ | (uint)!bVar10 * (int)fStack_44);
            bVar10 = (bool)(bVar64 >> 2 & 1);
            fStack_40 = (float)((uint)bVar10 * auVar89._8_4_ | (uint)!bVar10 * (int)fStack_40);
            fStack_3c = (float)((uint)(bVar64 >> 3) * auVar89._12_4_ |
                               (uint)!(bool)(bVar64 >> 3) * (int)fStack_3c);
            auVar89 = vshufps_avx512vl(auVar91,auVar91,0x55);
            local_c8 = (float)((uint)(bVar64 & 1) * auVar89._0_4_ |
                              (uint)!(bool)(bVar64 & 1) * (int)local_c8);
            bVar10 = (bool)(bVar64 >> 1 & 1);
            fStack_c4 = (float)((uint)bVar10 * auVar89._4_4_ | (uint)!bVar10 * (int)fStack_c4);
            bVar10 = (bool)(bVar64 >> 2 & 1);
            fStack_c0 = (float)((uint)bVar10 * auVar89._8_4_ | (uint)!bVar10 * (int)fStack_c0);
            fStack_bc = (float)((uint)(bVar64 >> 3) * auVar89._12_4_ |
                               (uint)!(bool)(bVar64 >> 3) * (int)fStack_bc);
            auVar89 = vshufps_avx512vl(auVar91,auVar91,0xaa);
            local_d8 = (float)((uint)(bVar64 & 1) * auVar89._0_4_ |
                              (uint)!(bool)(bVar64 & 1) * (int)local_d8);
            bVar10 = (bool)(bVar64 >> 1 & 1);
            fStack_d4 = (float)((uint)bVar10 * auVar89._4_4_ | (uint)!bVar10 * (int)fStack_d4);
            bVar10 = (bool)(bVar64 >> 2 & 1);
            fStack_d0 = (float)((uint)bVar10 * auVar89._8_4_ | (uint)!bVar10 * (int)fStack_d0);
            fStack_cc = (float)((uint)(bVar64 >> 3) * auVar89._12_4_ |
                               (uint)!(bool)(bVar64 >> 3) * (int)fStack_cc);
            auVar89 = vshufps_avx512vl(auVar91,auVar91,0xff);
            auVar149._0_4_ =
                 (uint)(bVar64 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar64 & 1) * in_ZMM30._0_4_;
            bVar10 = (bool)(bVar64 >> 1 & 1);
            auVar149._4_4_ = (uint)bVar10 * auVar89._4_4_ | (uint)!bVar10 * in_ZMM30._4_4_;
            bVar10 = (bool)(bVar64 >> 2 & 1);
            auVar149._8_4_ = (uint)bVar10 * auVar89._8_4_ | (uint)!bVar10 * in_ZMM30._8_4_;
            auVar149._12_4_ =
                 (uint)(bVar64 >> 3) * auVar89._12_4_ | (uint)!(bool)(bVar64 >> 3) * in_ZMM30._12_4_
            ;
            in_ZMM30 = ZEXT1664(auVar149);
            auVar89 = auVar144;
          } while (bVar59 != 0);
          auVar89 = vmulps_avx512vl(auVar149,auVar127);
          auVar91 = vmulps_avx512vl(auVar144,auVar124);
          auVar92 = vmulps_avx512vl(auVar147,auVar125);
          auVar93 = vmulps_avx512vl(auVar148,auVar126);
          auVar187._0_4_ = auVar93._0_4_ + auVar92._0_4_ + auVar91._0_4_ + auVar89._0_4_;
          auVar187._4_4_ = auVar93._4_4_ + auVar92._4_4_ + auVar91._4_4_ + auVar89._4_4_;
          auVar187._8_4_ = auVar93._8_4_ + auVar92._8_4_ + auVar91._8_4_ + auVar89._8_4_;
          auVar187._12_4_ = auVar93._12_4_ + auVar92._12_4_ + auVar91._12_4_ + auVar89._12_4_;
          auVar236._8_4_ = 0x80000000;
          auVar236._0_8_ = 0x8000000080000000;
          auVar236._12_4_ = 0x80000000;
          uVar60 = CONCAT44(auVar187._4_4_,auVar187._0_4_);
          auVar208._0_8_ = uVar60 ^ 0x8000000080000000;
          auVar208._8_4_ = -auVar187._8_4_;
          auVar208._12_4_ = -auVar187._12_4_;
          uVar60 = vcmpps_avx512vl(auVar187,auVar208,1);
          auVar91 = vmaxps_avx(auVar208,auVar187);
          auVar188._8_4_ = 0x7fffffff;
          auVar188._0_8_ = 0x7fffffff7fffffff;
          auVar188._12_4_ = 0x7fffffff;
          auVar89 = vandps_avx512vl(auVar187,auVar188);
          auVar209._8_4_ = 0x3f800000;
          auVar209._0_8_ = &DAT_3f8000003f800000;
          auVar209._12_4_ = 0x3f800000;
          uVar66 = vcmpps_avx512vl(auVar89,auVar209,6);
          auVar38._8_4_ = 0xbb8d3753;
          auVar38._0_8_ = 0xbb8d3753bb8d3753;
          auVar38._12_4_ = 0xbb8d3753;
          auVar92 = vmulps_avx512vl(auVar89,auVar38);
          auVar39._8_4_ = 0x3c9df1b8;
          auVar39._0_8_ = 0x3c9df1b83c9df1b8;
          auVar39._12_4_ = 0x3c9df1b8;
          auVar92 = vaddps_avx512vl(auVar92,auVar39);
          fVar69 = auVar89._0_4_;
          auVar246._0_4_ = fVar69 * auVar92._0_4_;
          fVar70 = auVar89._4_4_;
          auVar246._4_4_ = fVar70 * auVar92._4_4_;
          fVar71 = auVar89._8_4_;
          auVar246._8_4_ = fVar71 * auVar92._8_4_;
          fVar72 = auVar89._12_4_;
          auVar246._12_4_ = fVar72 * auVar92._12_4_;
          auVar40._8_4_ = 0xbd37e81c;
          auVar40._0_8_ = 0xbd37e81cbd37e81c;
          auVar40._12_4_ = 0xbd37e81c;
          auVar92 = vaddps_avx512vl(auVar246,auVar40);
          auVar247._0_4_ = fVar69 * auVar92._0_4_;
          auVar247._4_4_ = fVar70 * auVar92._4_4_;
          auVar247._8_4_ = fVar71 * auVar92._8_4_;
          auVar247._12_4_ = fVar72 * auVar92._12_4_;
          auVar41._8_4_ = 0x3db3edac;
          auVar41._0_8_ = 0x3db3edac3db3edac;
          auVar41._12_4_ = 0x3db3edac;
          auVar92 = vaddps_avx512vl(auVar247,auVar41);
          auVar248._0_4_ = fVar69 * auVar92._0_4_;
          auVar248._4_4_ = fVar70 * auVar92._4_4_;
          auVar248._8_4_ = fVar71 * auVar92._8_4_;
          auVar248._12_4_ = fVar72 * auVar92._12_4_;
          auVar42._8_4_ = 0xbe5ba881;
          auVar42._0_8_ = 0xbe5ba881be5ba881;
          auVar42._12_4_ = 0xbe5ba881;
          auVar92 = vaddps_avx512vl(auVar248,auVar42);
          auVar249._0_4_ = fVar69 * auVar92._0_4_;
          auVar249._4_4_ = fVar70 * auVar92._4_4_;
          auVar249._8_4_ = fVar71 * auVar92._8_4_;
          auVar249._12_4_ = fVar72 * auVar92._12_4_;
          auVar43._8_4_ = 0x3fc90fd1;
          auVar43._0_8_ = 0x3fc90fd13fc90fd1;
          auVar43._12_4_ = 0x3fc90fd1;
          auVar92 = vaddps_avx512vl(auVar249,auVar43);
          auVar89 = vsubps_avx(auVar209,auVar89);
          auVar89 = vsqrtps_avx(auVar89);
          auVar250._0_4_ = auVar89._0_4_ * auVar92._0_4_;
          auVar250._4_4_ = auVar89._4_4_ * auVar92._4_4_;
          auVar250._8_4_ = auVar89._8_4_ * auVar92._8_4_;
          auVar250._12_4_ = auVar89._12_4_ * auVar92._12_4_;
          auVar188 = ZEXT816(0) << 0x20;
          uVar67 = vcmpps_avx512vl(auVar91,auVar188,1);
          auVar255._8_4_ = 0x3fc90fdb;
          auVar255._0_8_ = 0x3fc90fdb3fc90fdb;
          auVar255._12_4_ = 0x3fc90fdb;
          auVar89 = vsubps_avx(auVar255,auVar250);
          auVar89 = vmaxps_avx(auVar188,auVar89);
          auVar92 = vxorps_avx512vl(auVar89,auVar236);
          bVar10 = (bool)((byte)uVar67 & 1);
          auVar150._0_4_ = (uint)bVar10 * auVar92._0_4_ | (uint)!bVar10 * auVar89._0_4_;
          bVar10 = (bool)((byte)(uVar67 >> 1) & 1);
          auVar150._4_4_ = (uint)bVar10 * auVar92._4_4_ | (uint)!bVar10 * auVar89._4_4_;
          bVar10 = (bool)((byte)(uVar67 >> 2) & 1);
          auVar150._8_4_ = (uint)bVar10 * auVar92._8_4_ | (uint)!bVar10 * auVar89._8_4_;
          bVar10 = (bool)((byte)(uVar67 >> 3) & 1);
          auVar150._12_4_ = (uint)bVar10 * auVar92._12_4_ | (uint)!bVar10 * auVar89._12_4_;
          auVar89 = vsubps_avx(auVar255,auVar150);
          auVar92 = vbroadcastss_avx512vl(ZEXT416(0x7fc00000));
          bVar10 = (bool)((byte)uVar66 & 1);
          bVar11 = (bool)((byte)(uVar66 >> 1) & 1);
          bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
          bVar13 = (bool)((byte)(uVar66 >> 3) & 1);
          auVar251._0_4_ =
               fVar169 * (float)((uint)bVar10 * auVar92._0_4_ | (uint)!bVar10 * auVar89._0_4_);
          auVar251._4_4_ =
               fVar179 * (float)((uint)bVar11 * auVar92._4_4_ | (uint)!bVar11 * auVar89._4_4_);
          auVar251._8_4_ =
               fVar180 * (float)((uint)bVar12 * auVar92._8_4_ | (uint)!bVar12 * auVar89._8_4_);
          auVar251._12_4_ =
               fVar181 * (float)((uint)bVar13 * auVar92._12_4_ | (uint)!bVar13 * auVar89._12_4_);
          auVar44._8_4_ = 0x3f22f983;
          auVar44._0_8_ = 0x3f22f9833f22f983;
          auVar44._12_4_ = 0x3f22f983;
          auVar89 = vmulps_avx512vl(auVar251,auVar44);
          auVar89 = vroundps_avx(auVar89,1);
          auVar256._0_4_ = auVar89._0_4_ * 1.5707964;
          auVar256._4_4_ = auVar89._4_4_ * 1.5707964;
          auVar256._8_4_ = auVar89._8_4_ * 1.5707964;
          auVar256._12_4_ = auVar89._12_4_ * 1.5707964;
          auVar92 = vsubps_avx(auVar251,auVar256);
          auVar89 = vcvtps2dq_avx(auVar89);
          auVar45._8_4_ = 3;
          auVar45._0_8_ = 0x300000003;
          auVar45._12_4_ = 3;
          auVar93 = vpandd_avx512vl(auVar89,auVar45);
          auVar267._8_4_ = 1;
          auVar267._0_8_ = 0x100000001;
          auVar267._12_4_ = 1;
          uVar67 = vptestnmd_avx512vl(auVar89,auVar267);
          uVar67 = uVar67 & 0xf;
          fVar69 = auVar92._0_4_;
          auVar257._0_4_ = fVar69 * fVar69;
          fVar70 = auVar92._4_4_;
          auVar257._4_4_ = fVar70 * fVar70;
          fVar71 = auVar92._8_4_;
          auVar257._8_4_ = fVar71 * fVar71;
          fVar72 = auVar92._12_4_;
          auVar257._12_4_ = fVar72 * fVar72;
          auVar46._8_4_ = 0xb2d70013;
          auVar46._0_8_ = 0xb2d70013b2d70013;
          auVar46._12_4_ = 0xb2d70013;
          auVar89 = vmulps_avx512vl(auVar257,auVar46);
          auVar47._8_4_ = 0x363938a8;
          auVar47._0_8_ = 0x363938a8363938a8;
          auVar47._12_4_ = 0x363938a8;
          auVar89 = vaddps_avx512vl(auVar89,auVar47);
          uVar66 = vpcmpgtd_avx512vl(auVar93,auVar267);
          uVar66 = uVar66 & 0xf;
          auVar48._8_4_ = 0xb48b634d;
          auVar48._0_8_ = 0xb48b634db48b634d;
          auVar48._12_4_ = 0xb48b634d;
          auVar92 = vmulps_avx512vl(auVar257,auVar48);
          auVar49._8_4_ = 0x37cfab9c;
          auVar49._0_8_ = 0x37cfab9c37cfab9c;
          auVar49._12_4_ = 0x37cfab9c;
          auVar92 = vaddps_avx512vl(auVar92,auVar49);
          auVar286._0_4_ = auVar89._0_4_ * auVar257._0_4_;
          auVar286._4_4_ = auVar89._4_4_ * auVar257._4_4_;
          auVar286._8_4_ = auVar89._8_4_ * auVar257._8_4_;
          auVar286._12_4_ = auVar89._12_4_ * auVar257._12_4_;
          auVar50._8_4_ = 0xb9501096;
          auVar50._0_8_ = 0xb9501096b9501096;
          auVar50._12_4_ = 0xb9501096;
          auVar89 = vaddps_avx512vl(auVar286,auVar50);
          auVar268._0_4_ = auVar92._0_4_ * auVar257._0_4_;
          auVar268._4_4_ = auVar92._4_4_ * auVar257._4_4_;
          auVar268._8_4_ = auVar92._8_4_ * auVar257._8_4_;
          auVar268._12_4_ = auVar92._12_4_ * auVar257._12_4_;
          auVar51._8_4_ = 0xbab60981;
          auVar51._0_8_ = 0xbab60981bab60981;
          auVar51._12_4_ = 0xbab60981;
          auVar92 = vaddps_avx512vl(auVar268,auVar51);
          auVar287._0_4_ = auVar89._0_4_ * auVar257._0_4_;
          auVar287._4_4_ = auVar89._4_4_ * auVar257._4_4_;
          auVar287._8_4_ = auVar89._8_4_ * auVar257._8_4_;
          auVar287._12_4_ = auVar89._12_4_ * auVar257._12_4_;
          auVar52._8_4_ = 0x3c088898;
          auVar52._0_8_ = 0x3c0888983c088898;
          auVar52._12_4_ = 0x3c088898;
          auVar89 = vaddps_avx512vl(auVar287,auVar52);
          auVar269._0_4_ = auVar92._0_4_ * auVar257._0_4_;
          auVar269._4_4_ = auVar92._4_4_ * auVar257._4_4_;
          auVar269._8_4_ = auVar92._8_4_ * auVar257._8_4_;
          auVar269._12_4_ = auVar92._12_4_ * auVar257._12_4_;
          auVar53._8_4_ = 0x3d2aaaa4;
          auVar53._0_8_ = 0x3d2aaaa43d2aaaa4;
          auVar53._12_4_ = 0x3d2aaaa4;
          auVar92 = vaddps_avx512vl(auVar269,auVar53);
          auVar288._0_4_ = auVar89._0_4_ * auVar257._0_4_;
          auVar288._4_4_ = auVar89._4_4_ * auVar257._4_4_;
          auVar288._8_4_ = auVar89._8_4_ * auVar257._8_4_;
          auVar288._12_4_ = auVar89._12_4_ * auVar257._12_4_;
          auVar54._8_4_ = 0xbe2aaaab;
          auVar54._0_8_ = 0xbe2aaaabbe2aaaab;
          auVar54._12_4_ = 0xbe2aaaab;
          auVar89 = vaddps_avx512vl(auVar288,auVar54);
          fVar293 = auVar92._0_4_ * auVar257._0_4_ + -0.5;
          fVar301 = auVar92._4_4_ * auVar257._4_4_ + -0.5;
          fVar302 = auVar92._8_4_ * auVar257._8_4_ + -0.5;
          fVar303 = auVar92._12_4_ * auVar257._12_4_ + -0.5;
          auVar289._0_4_ = (auVar89._0_4_ * auVar257._0_4_ + 1.0) * fVar69;
          auVar289._4_4_ = (auVar89._4_4_ * auVar257._4_4_ + 1.0) * fVar70;
          auVar289._8_4_ = (auVar89._8_4_ * auVar257._8_4_ + 1.0) * fVar71;
          auVar289._12_4_ = (auVar89._12_4_ * auVar257._12_4_ + 1.0) * fVar72;
          auVar252._0_4_ = fVar293 * auVar257._0_4_ + 1.0;
          auVar252._4_4_ = fVar301 * auVar257._4_4_ + 1.0;
          auVar252._8_4_ = fVar302 * auVar257._8_4_ + 1.0;
          auVar252._12_4_ = fVar303 * auVar257._12_4_ + 1.0;
          auVar89 = vblendmps_avx512vl(auVar252,auVar289);
          bVar10 = (bool)((byte)uVar67 & 1);
          auVar151._0_4_ = (uint)bVar10 * auVar89._0_4_ | (uint)!bVar10 * (int)fVar293;
          bVar10 = (bool)((byte)(uVar67 >> 1) & 1);
          auVar151._4_4_ = (uint)bVar10 * auVar89._4_4_ | (uint)!bVar10 * (int)fVar301;
          bVar10 = (bool)((byte)(uVar67 >> 2) & 1);
          auVar151._8_4_ = (uint)bVar10 * auVar89._8_4_ | (uint)!bVar10 * (int)fVar302;
          bVar10 = SUB81(uVar67 >> 3,0);
          auVar151._12_4_ = (uint)bVar10 * auVar89._12_4_ | (uint)!bVar10 * (int)fVar303;
          bVar10 = (bool)((byte)uVar67 & 1);
          auVar152._0_4_ = (uint)bVar10 * (int)auVar252._0_4_ | (uint)!bVar10 * (int)auVar289._0_4_;
          bVar10 = (bool)((byte)(uVar67 >> 1) & 1);
          auVar152._4_4_ = (uint)bVar10 * (int)auVar252._4_4_ | (uint)!bVar10 * (int)auVar289._4_4_;
          bVar10 = (bool)((byte)(uVar67 >> 2) & 1);
          auVar152._8_4_ = (uint)bVar10 * (int)auVar252._8_4_ | (uint)!bVar10 * (int)auVar289._8_4_;
          bVar10 = SUB81(uVar67 >> 3,0);
          auVar152._12_4_ =
               (uint)bVar10 * (int)auVar252._12_4_ | (uint)!bVar10 * (int)auVar289._12_4_;
          auVar89 = vpcmpeqd_avx(auVar252,auVar252);
          auVar89 = vpaddd_avx(auVar93,auVar89);
          auVar55._8_4_ = 2;
          auVar55._0_8_ = 0x200000002;
          auVar55._12_4_ = 2;
          uVar67 = vpcmpud_avx512vl(auVar89,auVar55,1);
          uVar67 = uVar67 & 0xf;
          auVar89 = vxorps_avx512vl(auVar149,auVar236);
          bVar59 = (byte)uVar60;
          auVar153._0_4_ = (uint)(bVar59 & 1) * auVar89._0_4_ | !(bool)(bVar59 & 1) * auVar149._0_4_
          ;
          bVar10 = (bool)((byte)(uVar60 >> 1) & 1);
          auVar153._4_4_ = (uint)bVar10 * auVar89._4_4_ | !bVar10 * auVar149._4_4_;
          bVar10 = (bool)((byte)(uVar60 >> 2) & 1);
          auVar153._8_4_ = (uint)bVar10 * auVar89._8_4_ | !bVar10 * auVar149._8_4_;
          bVar10 = (bool)((byte)(uVar60 >> 3) & 1);
          auVar153._12_4_ = (uint)bVar10 * auVar89._12_4_ | !bVar10 * auVar149._12_4_;
          auVar89 = vxorps_avx512vl(auVar144,auVar236);
          auVar154._0_4_ = (uint)(bVar59 & 1) * auVar89._0_4_ | !(bool)(bVar59 & 1) * auVar144._0_4_
          ;
          bVar10 = (bool)((byte)(uVar60 >> 1) & 1);
          auVar154._4_4_ = (uint)bVar10 * auVar89._4_4_ | !bVar10 * auVar144._4_4_;
          bVar10 = (bool)((byte)(uVar60 >> 2) & 1);
          auVar154._8_4_ = (uint)bVar10 * auVar89._8_4_ | !bVar10 * auVar144._8_4_;
          bVar10 = (bool)((byte)(uVar60 >> 3) & 1);
          auVar154._12_4_ = (uint)bVar10 * auVar89._12_4_ | !bVar10 * auVar144._12_4_;
          auVar89 = vxorps_avx512vl(auVar147,auVar236);
          auVar155._0_4_ = (uint)(bVar59 & 1) * auVar89._0_4_ | !(bool)(bVar59 & 1) * auVar147._0_4_
          ;
          bVar10 = (bool)((byte)(uVar60 >> 1) & 1);
          auVar155._4_4_ = (uint)bVar10 * auVar89._4_4_ | !bVar10 * auVar147._4_4_;
          bVar10 = (bool)((byte)(uVar60 >> 2) & 1);
          auVar155._8_4_ = (uint)bVar10 * auVar89._8_4_ | !bVar10 * auVar147._8_4_;
          bVar10 = (bool)((byte)(uVar60 >> 3) & 1);
          auVar155._12_4_ = (uint)bVar10 * auVar89._12_4_ | !bVar10 * auVar147._12_4_;
          auVar89 = vxorps_avx512vl(auVar148,auVar236);
          auVar156._0_4_ = (uint)(bVar59 & 1) * auVar89._0_4_ | !(bool)(bVar59 & 1) * auVar148._0_4_
          ;
          bVar10 = (bool)((byte)(uVar60 >> 1) & 1);
          auVar156._4_4_ = (uint)bVar10 * auVar89._4_4_ | !bVar10 * auVar148._4_4_;
          bVar10 = (bool)((byte)(uVar60 >> 2) & 1);
          auVar156._8_4_ = (uint)bVar10 * auVar89._8_4_ | !bVar10 * auVar148._8_4_;
          bVar10 = (bool)((byte)(uVar60 >> 3) & 1);
          auVar156._12_4_ = (uint)bVar10 * auVar89._12_4_ | !bVar10 * auVar148._12_4_;
          auVar89 = vxorps_avx512vl(auVar151,auVar236);
          bVar10 = (bool)((byte)uVar66 & 1);
          fVar68 = (float)((uint)bVar10 * auVar89._0_4_ | !bVar10 * auVar151._0_4_);
          bVar10 = (bool)((byte)(uVar66 >> 1) & 1);
          fVar158 = (float)((uint)bVar10 * auVar89._4_4_ | !bVar10 * auVar151._4_4_);
          bVar10 = (bool)((byte)(uVar66 >> 2) & 1);
          fVar159 = (float)((uint)bVar10 * auVar89._8_4_ | !bVar10 * auVar151._8_4_);
          bVar10 = SUB81(uVar66 >> 3,0);
          fVar164 = (float)((uint)bVar10 * auVar89._12_4_ | !bVar10 * auVar151._12_4_);
          auVar89 = vxorps_avx512vl(auVar152,auVar236);
          bVar10 = (bool)((byte)uVar67 & 1);
          auVar157._0_4_ = (uint)bVar10 * auVar89._0_4_ | !bVar10 * auVar152._0_4_;
          bVar10 = (bool)((byte)(uVar67 >> 1) & 1);
          auVar157._4_4_ = (uint)bVar10 * auVar89._4_4_ | !bVar10 * auVar152._4_4_;
          bVar10 = (bool)((byte)(uVar67 >> 2) & 1);
          auVar157._8_4_ = (uint)bVar10 * auVar89._8_4_ | !bVar10 * auVar152._8_4_;
          bVar10 = SUB81(uVar67 >> 3,0);
          auVar157._12_4_ = (uint)bVar10 * auVar89._12_4_ | !bVar10 * auVar152._12_4_;
          auVar92 = vfmsub213ps_avx512vl(auVar127,auVar91,auVar153);
          auVar89 = vfmsub213ps_fma(auVar124,auVar91,auVar154);
          fVar69 = auVar92._0_4_;
          fVar301 = auVar92._4_4_;
          fVar162 = auVar92._8_4_;
          fVar168 = auVar92._12_4_;
          fVar70 = auVar89._0_4_;
          fVar302 = auVar89._4_4_;
          fVar163 = auVar89._8_4_;
          fVar14 = auVar89._12_4_;
          auVar89 = vfmsub213ps_avx512vl(auVar125,auVar91,auVar155);
          fVar71 = auVar89._0_4_;
          fVar303 = auVar89._4_4_;
          fVar165 = auVar89._8_4_;
          fVar15 = auVar89._12_4_;
          auVar89 = vfmsub213ps_avx512vl(auVar126,auVar91,auVar156);
          fVar72 = auVar89._0_4_;
          fVar160 = auVar89._4_4_;
          fVar166 = auVar89._8_4_;
          fVar16 = auVar89._12_4_;
          auVar258._0_4_ = fVar72 * fVar72 + fVar71 * fVar71 + fVar70 * fVar70 + fVar69 * fVar69;
          auVar258._4_4_ =
               fVar160 * fVar160 + fVar303 * fVar303 + fVar302 * fVar302 + fVar301 * fVar301;
          auVar258._8_4_ =
               fVar166 * fVar166 + fVar165 * fVar165 + fVar163 * fVar163 + fVar162 * fVar162;
          auVar258._12_4_ = fVar16 * fVar16 + fVar15 * fVar15 + fVar14 * fVar14 + fVar168 * fVar168;
          auVar89 = vrsqrt14ps_avx512vl(auVar258);
          fVar293 = auVar89._0_4_;
          fVar161 = auVar89._4_4_;
          fVar167 = auVar89._8_4_;
          fVar313 = auVar89._12_4_;
          auVar259._0_4_ = fVar293 * fVar293 * fVar293 * auVar258._0_4_ * -0.5;
          auVar259._4_4_ = fVar161 * fVar161 * fVar161 * auVar258._4_4_ * -0.5;
          auVar259._8_4_ = fVar167 * fVar167 * fVar167 * auVar258._8_4_ * -0.5;
          auVar259._12_4_ = fVar313 * fVar313 * fVar313 * auVar258._12_4_ * -0.5;
          auVar318._8_4_ = 0x3fc00000;
          auVar318._0_8_ = 0x3fc000003fc00000;
          auVar318._12_4_ = 0x3fc00000;
          auVar89 = vfmadd231ps_fma(auVar259,auVar318,auVar89);
          fVar293 = auVar89._0_4_;
          fVar161 = auVar89._4_4_;
          fVar167 = auVar89._8_4_;
          fVar313 = auVar89._12_4_;
          auVar237._0_4_ = fVar68 * fVar69 * fVar293;
          auVar237._4_4_ = fVar158 * fVar301 * fVar161;
          auVar237._8_4_ = fVar159 * fVar162 * fVar167;
          auVar237._12_4_ = fVar164 * fVar168 * fVar313;
          auVar253._0_4_ = fVar68 * fVar70 * fVar293;
          auVar253._4_4_ = fVar158 * fVar302 * fVar161;
          auVar253._8_4_ = fVar159 * fVar163 * fVar167;
          auVar253._12_4_ = fVar164 * fVar14 * fVar313;
          auVar260._0_4_ = fVar71 * fVar293 * fVar68;
          auVar260._4_4_ = fVar303 * fVar161 * fVar158;
          auVar260._8_4_ = fVar165 * fVar167 * fVar159;
          auVar260._12_4_ = fVar15 * fVar313 * fVar164;
          auVar263._0_4_ = fVar72 * fVar293 * fVar68;
          auVar263._4_4_ = fVar160 * fVar161 * fVar158;
          auVar263._8_4_ = fVar166 * fVar167 * fVar159;
          auVar263._12_4_ = fVar16 * fVar313 * fVar164;
          auVar92 = vfmsub231ps_avx512vl(auVar237,auVar157,auVar127);
          auVar93 = vfmsub231ps_avx512vl(auVar253,auVar157,auVar124);
          auVar73 = vfmsub231ps_avx512vl(auVar260,auVar157,auVar125);
          auVar102 = vfmsub231ps_avx512vl(auVar263,auVar126,auVar157);
          auVar89 = vsubps_avx512vl(auVar153,auVar127);
          auVar74 = vfmadd213ps_avx512vl(auVar89,auVar90,auVar127);
          auVar89 = vsubps_avx512vl(auVar154,auVar124);
          auVar75 = vfmadd213ps_avx512vl(auVar89,auVar90,auVar124);
          auVar89 = vsubps_avx512vl(auVar155,auVar125);
          auVar94 = vfmadd213ps_avx512vl(auVar89,auVar90,auVar125);
          auVar89 = vsubps_avx512vl(auVar156,auVar126);
          auVar95 = vfmadd213ps_avx512vl(auVar89,auVar90,auVar126);
          auVar311._0_4_ =
               auVar95._0_4_ * auVar95._0_4_ +
               auVar94._0_4_ * auVar94._0_4_ +
               auVar74._0_4_ * auVar74._0_4_ + auVar75._0_4_ * auVar75._0_4_;
          auVar311._4_4_ =
               auVar95._4_4_ * auVar95._4_4_ +
               auVar94._4_4_ * auVar94._4_4_ +
               auVar74._4_4_ * auVar74._4_4_ + auVar75._4_4_ * auVar75._4_4_;
          auVar311._8_4_ =
               auVar95._8_4_ * auVar95._8_4_ +
               auVar94._8_4_ * auVar94._8_4_ +
               auVar74._8_4_ * auVar74._8_4_ + auVar75._8_4_ * auVar75._8_4_;
          auVar311._12_4_ =
               auVar95._12_4_ * auVar95._12_4_ +
               auVar94._12_4_ * auVar94._12_4_ +
               auVar74._12_4_ * auVar74._12_4_ + auVar75._12_4_ * auVar75._12_4_;
          auVar89 = vrsqrt14ps_avx512vl(auVar311);
          fVar69 = auVar89._0_4_;
          fVar70 = auVar89._4_4_;
          fVar71 = auVar89._8_4_;
          fVar72 = auVar89._12_4_;
          auVar270._0_4_ = auVar311._0_4_ * -0.5 * fVar69 * fVar69 * fVar69;
          auVar270._4_4_ = auVar311._4_4_ * -0.5 * fVar70 * fVar70 * fVar70;
          auVar270._8_4_ = auVar311._8_4_ * -0.5 * fVar71 * fVar71 * fVar71;
          auVar270._12_4_ = auVar311._12_4_ * -0.5 * fVar72 * fVar72 * fVar72;
          auVar89 = vfmadd231ps_fma(auVar270,auVar89,auVar318);
          auVar56._8_4_ = 0x3f7fdf3b;
          auVar56._0_8_ = 0x3f7fdf3b3f7fdf3b;
          auVar56._12_4_ = 0x3f7fdf3b;
          uVar60 = vcmpps_avx512vl(auVar91,auVar56,6);
          auVar91 = vmulps_avx512vl(auVar74,auVar89);
          bVar59 = (byte)uVar60;
          fVar69 = (float)((uint)(bVar59 & 1) * auVar91._0_4_ |
                          (uint)!(bool)(bVar59 & 1) * auVar92._0_4_);
          bVar10 = (bool)((byte)(uVar60 >> 1) & 1);
          fVar293 = (float)((uint)bVar10 * auVar91._4_4_ | (uint)!bVar10 * auVar92._4_4_);
          bVar10 = (bool)((byte)(uVar60 >> 2) & 1);
          fVar160 = (float)((uint)bVar10 * auVar91._8_4_ | (uint)!bVar10 * auVar92._8_4_);
          bVar10 = (bool)((byte)(uVar60 >> 3) & 1);
          fVar165 = (float)((uint)bVar10 * auVar91._12_4_ | (uint)!bVar10 * auVar92._12_4_);
          auVar91 = vmulps_avx512vl(auVar75,auVar89);
          fVar70 = (float)((uint)(bVar59 & 1) * auVar91._0_4_ |
                          (uint)!(bool)(bVar59 & 1) * auVar93._0_4_);
          bVar10 = (bool)((byte)(uVar60 >> 1) & 1);
          fVar301 = (float)((uint)bVar10 * auVar91._4_4_ | (uint)!bVar10 * auVar93._4_4_);
          bVar10 = (bool)((byte)(uVar60 >> 2) & 1);
          fVar161 = (float)((uint)bVar10 * auVar91._8_4_ | (uint)!bVar10 * auVar93._8_4_);
          bVar10 = (bool)((byte)(uVar60 >> 3) & 1);
          fVar166 = (float)((uint)bVar10 * auVar91._12_4_ | (uint)!bVar10 * auVar93._12_4_);
          auVar91 = vmulps_avx512vl(auVar94,auVar89);
          fVar71 = (float)((uint)(bVar59 & 1) * auVar91._0_4_ |
                          (uint)!(bool)(bVar59 & 1) * auVar73._0_4_);
          bVar10 = (bool)((byte)(uVar60 >> 1) & 1);
          fVar302 = (float)((uint)bVar10 * auVar91._4_4_ | (uint)!bVar10 * auVar73._4_4_);
          bVar10 = (bool)((byte)(uVar60 >> 2) & 1);
          fVar162 = (float)((uint)bVar10 * auVar91._8_4_ | (uint)!bVar10 * auVar73._8_4_);
          bVar10 = (bool)((byte)(uVar60 >> 3) & 1);
          fVar167 = (float)((uint)bVar10 * auVar91._12_4_ | (uint)!bVar10 * auVar73._12_4_);
          auVar89 = vmulps_avx512vl(auVar95,auVar89);
          fVar72 = (float)((uint)(bVar59 & 1) * auVar89._0_4_ |
                          (uint)!(bool)(bVar59 & 1) * auVar102._0_4_);
          bVar10 = (bool)((byte)(uVar60 >> 1) & 1);
          fVar303 = (float)((uint)bVar10 * auVar89._4_4_ | (uint)!bVar10 * auVar102._4_4_);
          bVar10 = (bool)((byte)(uVar60 >> 2) & 1);
          fVar163 = (float)((uint)bVar10 * auVar89._8_4_ | (uint)!bVar10 * auVar102._8_4_);
          bVar10 = (bool)((byte)(uVar60 >> 3) & 1);
          fVar168 = (float)((uint)bVar10 * auVar89._12_4_ | (uint)!bVar10 * auVar102._12_4_);
          auVar89 = vsubps_avx(auVar209,auVar90);
          auVar91 = vmulps_avx512vl(auVar90,auVar129);
          auVar74 = vfmadd213ps_avx512vl(auVar121,auVar89,auVar91);
          auVar91 = vmulps_avx512vl(auVar90,auVar130);
          auVar75 = vfmadd213ps_avx512vl(auVar123,auVar89,auVar91);
          auVar91 = vmulps_avx512vl(auVar90,auVar143);
          auVar94 = vfmadd213ps_avx512vl(local_118,auVar89,auVar91);
          auVar91 = vmulps_avx512vl(auVar90,auVar145);
          auVar90 = vmulps_avx512vl(auVar90,auVar146);
          auVar271._0_4_ = fVar169 * local_88;
          auVar271._4_4_ = fVar179 * fStack_84;
          auVar271._8_4_ = fVar180 * fStack_80;
          auVar271._12_4_ = fVar181 * fStack_7c;
          auVar95 = vfmadd213ps_avx512vl(local_128,auVar89,auVar91);
          auVar96 = vfmadd213ps_avx512vl(local_168,auVar89,auVar90);
          auVar97 = vfmadd213ps_avx512vl(local_108,auVar89,auVar271);
          auVar210._0_4_ = fVar169 * local_78;
          auVar210._4_4_ = fVar179 * fStack_74;
          auVar210._8_4_ = fVar180 * fStack_70;
          auVar210._12_4_ = fVar181 * fStack_6c;
          auVar223._0_4_ = fVar169 * local_68;
          auVar223._4_4_ = fVar179 * fStack_64;
          auVar223._8_4_ = fVar180 * fStack_60;
          auVar223._12_4_ = fVar181 * fStack_5c;
          auVar272._0_4_ = fVar169 * local_58;
          auVar272._4_4_ = fVar179 * fStack_54;
          auVar272._8_4_ = fVar180 * fStack_50;
          auVar272._12_4_ = fVar181 * fStack_4c;
          auVar98 = vfmadd213ps_avx512vl(local_148,auVar89,auVar210);
          auVar99 = vfmadd213ps_avx512vl(local_e8,auVar89,auVar223);
          auVar100 = vfmadd213ps_avx512vl(local_f8,auVar89,auVar272);
          auVar211._0_4_ = fVar169 * local_48;
          auVar211._4_4_ = fVar179 * fStack_44;
          auVar211._8_4_ = fVar180 * fStack_40;
          auVar211._12_4_ = fVar181 * fStack_3c;
          auVar224._0_4_ = fVar169 * local_c8;
          auVar224._4_4_ = fVar179 * fStack_c4;
          auVar224._8_4_ = fVar180 * fStack_c0;
          auVar224._12_4_ = fVar181 * fStack_bc;
          auVar176._0_4_ = fVar169 * local_d8;
          auVar176._4_4_ = fVar179 * fStack_d4;
          auVar176._8_4_ = fVar180 * fStack_d0;
          auVar176._12_4_ = fVar181 * fStack_cc;
          auVar101 = vfmadd213ps_avx512vl(local_178,auVar89,auVar211);
          auVar122 = vfmadd213ps_avx512vl(local_158,auVar89,auVar224);
          auVar118 = vfmadd213ps_avx512vl(local_138,auVar89,auVar176);
          auVar212._0_4_ = fVar69 * fVar69;
          auVar212._4_4_ = fVar293 * fVar293;
          auVar212._8_4_ = fVar160 * fVar160;
          auVar212._12_4_ = fVar165 * fVar165;
          auVar225._0_4_ = fVar70 * fVar70;
          auVar225._4_4_ = fVar301 * fVar301;
          auVar225._8_4_ = fVar161 * fVar161;
          auVar225._12_4_ = fVar166 * fVar166;
          auVar177._0_4_ = auVar212._0_4_ + auVar225._0_4_;
          auVar177._4_4_ = auVar212._4_4_ + auVar225._4_4_;
          auVar177._8_4_ = auVar212._8_4_ + auVar225._8_4_;
          auVar177._12_4_ = auVar212._12_4_ + auVar225._12_4_;
          auVar299._0_4_ = fVar71 * fVar71;
          auVar299._4_4_ = fVar302 * fVar302;
          auVar299._8_4_ = fVar162 * fVar162;
          auVar299._12_4_ = fVar167 * fVar167;
          auVar89 = vsubps_avx(auVar177,auVar299);
          auVar308._0_4_ = fVar72 * fVar72;
          auVar308._4_4_ = fVar303 * fVar303;
          auVar308._8_4_ = fVar163 * fVar163;
          auVar308._12_4_ = fVar168 * fVar168;
          auVar89 = vsubps_avx(auVar89,auVar308);
          auVar273._0_4_ = fVar70 * fVar71;
          auVar273._4_4_ = fVar301 * fVar302;
          auVar273._8_4_ = fVar161 * fVar162;
          auVar273._12_4_ = fVar166 * fVar167;
          auVar290._0_4_ = fVar72 * fVar69;
          auVar290._4_4_ = fVar303 * fVar293;
          auVar290._8_4_ = fVar163 * fVar160;
          auVar290._12_4_ = fVar168 * fVar165;
          auVar178._0_4_ = auVar273._0_4_ + auVar290._0_4_ + auVar273._0_4_ + auVar290._0_4_;
          auVar178._4_4_ = auVar273._4_4_ + auVar290._4_4_ + auVar273._4_4_ + auVar290._4_4_;
          auVar178._8_4_ = auVar273._8_4_ + auVar290._8_4_ + auVar273._8_4_ + auVar290._8_4_;
          auVar178._12_4_ = auVar273._12_4_ + auVar290._12_4_ + auVar273._12_4_ + auVar290._12_4_;
          auVar312._0_4_ = fVar72 * fVar70;
          auVar312._4_4_ = fVar303 * fVar301;
          auVar312._8_4_ = fVar163 * fVar161;
          auVar312._12_4_ = fVar168 * fVar166;
          auVar319._0_4_ = fVar69 * fVar71;
          auVar319._4_4_ = fVar293 * fVar302;
          auVar319._8_4_ = fVar160 * fVar162;
          auVar319._12_4_ = fVar165 * fVar167;
          auVar90 = vsubps_avx(auVar312,auVar319);
          auVar324._0_4_ = auVar90._0_4_ + auVar90._0_4_;
          auVar324._4_4_ = auVar90._4_4_ + auVar90._4_4_;
          auVar324._8_4_ = auVar90._8_4_ + auVar90._8_4_;
          auVar324._12_4_ = auVar90._12_4_ + auVar90._12_4_;
          auVar90 = vsubps_avx(auVar273,auVar290);
          auVar102 = vaddps_avx512vl(auVar90,auVar90);
          auVar90 = vsubps_avx(auVar212,auVar225);
          auVar226._0_4_ = auVar299._0_4_ + auVar90._0_4_;
          auVar226._4_4_ = auVar299._4_4_ + auVar90._4_4_;
          auVar226._8_4_ = auVar299._8_4_ + auVar90._8_4_;
          auVar226._12_4_ = auVar299._12_4_ + auVar90._12_4_;
          auVar91 = vsubps_avx(auVar226,auVar308);
          auVar227._0_4_ = fVar72 * fVar71;
          auVar227._4_4_ = fVar303 * fVar302;
          auVar227._8_4_ = fVar163 * fVar162;
          auVar227._12_4_ = fVar168 * fVar167;
          auVar238._0_4_ = fVar69 * fVar70;
          auVar238._4_4_ = fVar293 * fVar301;
          auVar238._8_4_ = fVar160 * fVar161;
          auVar238._12_4_ = fVar165 * fVar166;
          auVar254._0_4_ = auVar227._0_4_ + auVar238._0_4_ + auVar227._0_4_ + auVar238._0_4_;
          auVar254._4_4_ = auVar227._4_4_ + auVar238._4_4_ + auVar227._4_4_ + auVar238._4_4_;
          auVar254._8_4_ = auVar227._8_4_ + auVar238._8_4_ + auVar227._8_4_ + auVar238._8_4_;
          auVar254._12_4_ = auVar227._12_4_ + auVar238._12_4_ + auVar227._12_4_ + auVar238._12_4_;
          auVar261._0_4_ = auVar312._0_4_ + auVar319._0_4_ + auVar312._0_4_ + auVar319._0_4_;
          auVar261._4_4_ = auVar312._4_4_ + auVar319._4_4_ + auVar312._4_4_ + auVar319._4_4_;
          auVar261._8_4_ = auVar312._8_4_ + auVar319._8_4_ + auVar312._8_4_ + auVar319._8_4_;
          auVar261._12_4_ = auVar312._12_4_ + auVar319._12_4_ + auVar312._12_4_ + auVar319._12_4_;
          auVar92 = vsubps_avx(auVar227,auVar238);
          auVar291._0_4_ = auVar92._0_4_ + auVar92._0_4_;
          auVar291._4_4_ = auVar92._4_4_ + auVar92._4_4_;
          auVar291._8_4_ = auVar92._8_4_ + auVar92._8_4_;
          auVar291._12_4_ = auVar92._12_4_ + auVar92._12_4_;
          auVar90 = vsubps_avx(auVar90,auVar299);
          auVar213._0_4_ = auVar308._0_4_ + auVar90._0_4_;
          auVar213._4_4_ = auVar308._4_4_ + auVar90._4_4_;
          auVar213._8_4_ = auVar308._8_4_ + auVar90._8_4_;
          auVar213._12_4_ = auVar308._12_4_ + auVar90._12_4_;
          auVar228._0_4_ = auVar324._0_4_ * 0.0;
          auVar228._4_4_ = auVar324._4_4_ * 0.0;
          auVar228._8_4_ = auVar324._8_4_ * 0.0;
          auVar228._12_4_ = auVar324._12_4_ * 0.0;
          auVar90 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar178,auVar228);
          auVar229._0_4_ = auVar178._0_4_ + auVar228._0_4_;
          auVar229._4_4_ = auVar178._4_4_ + auVar228._4_4_;
          auVar229._8_4_ = auVar178._8_4_ + auVar228._8_4_;
          auVar229._12_4_ = auVar178._12_4_ + auVar228._12_4_;
          auVar92 = vfmadd213ps_fma(auVar178,auVar188,auVar324);
          auVar93 = vfmadd231ps_fma(auVar229,auVar89,auVar188);
          auVar73 = vfmadd231ps_fma(auVar92,auVar188,auVar89);
          auVar239._0_4_ = auVar254._0_4_ * 0.0;
          auVar239._4_4_ = auVar254._4_4_ * 0.0;
          auVar239._8_4_ = auVar254._8_4_ * 0.0;
          auVar239._12_4_ = auVar254._12_4_ * 0.0;
          auVar92 = vfmadd213ps_fma(ZEXT416(0) << 0x20,auVar91,auVar239);
          auVar300._0_4_ = auVar91._0_4_ + auVar239._0_4_;
          auVar300._4_4_ = auVar91._4_4_ + auVar239._4_4_;
          auVar300._8_4_ = auVar91._8_4_ + auVar239._8_4_;
          auVar300._12_4_ = auVar91._12_4_ + auVar239._12_4_;
          auVar91 = vfmadd213ps_fma(auVar91,auVar188,auVar254);
          auVar119 = vaddps_avx512vl(auVar102,auVar92);
          auVar120 = vfmadd231ps_avx512vl(auVar300,auVar102,auVar188);
          auVar121 = vfmadd231ps_avx512vl(auVar91,auVar188,auVar102);
          auVar240._0_4_ = auVar213._0_4_ * 0.0;
          auVar240._4_4_ = auVar213._4_4_ * 0.0;
          auVar240._8_4_ = auVar213._8_4_ * 0.0;
          auVar240._12_4_ = auVar213._12_4_ * 0.0;
          auVar91 = vfmadd213ps_fma(ZEXT416(0) << 0x20,auVar291,auVar240);
          auVar102 = vaddps_avx512vl(auVar291,auVar240);
          auVar92 = vfmadd213ps_fma(auVar291,auVar188,auVar213);
          auVar123 = vaddps_avx512vl(auVar261,auVar91);
          auVar124 = vfmadd231ps_avx512vl(auVar102,auVar261,auVar188);
          auVar102 = vfmadd231ps_fma(auVar92,auVar188,auVar261);
          auVar75 = vaddps_avx512vl(auVar75,auVar188);
          auVar94 = vaddps_avx512vl(auVar94,auVar188);
          auVar97 = vaddps_avx512vl(auVar97,auVar188);
          auVar125 = vmulps_avx512vl(auVar123,auVar188);
          auVar126 = vmulps_avx512vl(auVar124,auVar188);
          auVar127 = vmulps_avx512vl(auVar102,auVar188);
          auVar91 = vfmadd213ps_fma(ZEXT416(0) << 0x20,auVar119,auVar125);
          auVar92 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar120,auVar126);
          auVar129 = vfmadd213ps_avx512vl(auVar188,auVar121,auVar127);
          auVar125 = vfmadd231ps_avx512vl(auVar125,auVar96,auVar119);
          auVar126 = vfmadd231ps_avx512vl(auVar126,auVar96,auVar120);
          auVar96 = vfmadd213ps_avx512vl(auVar96,auVar121,auVar127);
          auVar127 = vmulps_avx512vl(auVar100,auVar123);
          auVar130 = vmulps_avx512vl(auVar100,auVar124);
          auVar100 = vmulps_avx512vl(auVar100,auVar102);
          auVar127 = vfmadd231ps_avx512vl(auVar127,auVar99,auVar119);
          auVar130 = vfmadd231ps_avx512vl(auVar130,auVar99,auVar120);
          auVar99 = vfmadd231ps_avx512vl(auVar100,auVar121,auVar99);
          auVar100 = vmulps_avx512vl(auVar118,auVar123);
          auVar123 = vmulps_avx512vl(auVar118,auVar124);
          auVar102 = vmulps_avx512vl(auVar118,auVar102);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar122,auVar119);
          auVar118 = vfmadd231ps_avx512vl(auVar123,auVar122,auVar120);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar122,auVar121);
          auVar194._0_4_ = auVar90._0_4_ + auVar89._0_4_;
          auVar194._4_4_ = auVar90._4_4_ + auVar89._4_4_;
          auVar194._8_4_ = auVar90._8_4_ + auVar89._8_4_;
          auVar194._12_4_ = auVar90._12_4_ + auVar89._12_4_;
          auVar89 = vfmadd231ps_avx512vl(auVar91,auVar74,auVar194);
          auVar90 = vfmadd231ps_avx512vl(auVar92,auVar74,auVar93);
          auVar91 = vfmadd231ps_avx512vl(auVar129,auVar73,auVar74);
          auVar92 = vfmadd231ps_avx512vl(auVar125,auVar95,auVar194);
          auVar74 = vfmadd231ps_avx512vl(auVar126,auVar95,auVar93);
          auVar95 = vfmadd231ps_avx512vl(auVar96,auVar73,auVar95);
          auVar96 = vfmadd231ps_avx512vl(auVar127,auVar98,auVar194);
          auVar122 = vfmadd231ps_avx512vl(auVar130,auVar98,auVar93);
          auVar98 = vfmadd231ps_avx512vl(auVar99,auVar73,auVar98);
          auVar99 = vfmadd231ps_avx512vl(auVar100,auVar101,auVar194);
          auVar99 = vaddps_avx512vl(auVar75,auVar99);
          auVar93 = vfmadd231ps_avx512vl(auVar118,auVar101,auVar93);
          auVar100 = vaddps_avx512vl(auVar94,auVar93);
          auVar93 = vfmadd231ps_avx512vl(auVar102,auVar101,auVar73);
          fVar169 = auVar97._0_4_ + auVar93._0_4_;
          fVar179 = auVar97._4_4_ + auVar93._4_4_;
          fVar180 = auVar97._8_4_ + auVar93._8_4_;
          fVar181 = auVar97._12_4_ + auVar93._12_4_;
          auVar93 = vmulps_avx512vl(auVar122,auVar95);
          auVar93 = vfmsub231ps_avx512vl(auVar93,auVar74,auVar98);
          auVar73 = vmulps_avx512vl(auVar98,auVar92);
          auVar102 = vfmsub231ps_avx512vl(auVar73,auVar95,auVar96);
          auVar73 = vmulps_avx512vl(auVar96,auVar74);
          auVar75 = vfmsub231ps_avx512vl(auVar73,auVar92,auVar122);
          auVar73 = vmulps_avx512vl(auVar91,auVar96);
          auVar94 = vfmsub231ps_avx512vl(auVar73,auVar89,auVar98);
          auVar73 = vmulps_avx512vl(auVar90,auVar98);
          auVar97 = vfmsub231ps_avx512vl(auVar73,auVar122,auVar91);
          auVar73 = vmulps_avx512vl(auVar89,auVar122);
          auVar96 = vfmsub231ps_avx512vl(auVar73,auVar90,auVar96);
          auVar320._0_4_ = auVar74._0_4_ * auVar91._0_4_;
          auVar320._4_4_ = auVar74._4_4_ * auVar91._4_4_;
          auVar320._8_4_ = auVar74._8_4_ * auVar91._8_4_;
          auVar320._12_4_ = auVar74._12_4_ * auVar91._12_4_;
          auVar98 = vfmsub231ps_avx512vl(auVar320,auVar90,auVar95);
          auVar73 = vmulps_avx512vl(auVar95,auVar89);
          auVar73 = vfmsub231ps_fma(auVar73,auVar91,auVar92);
          auVar92 = vmulps_avx512vl(auVar92,auVar90);
          auVar95 = vfmsub231ps_avx512vl(auVar92,auVar89,auVar74);
          auVar91 = vmulps_avx512vl(auVar91,auVar75);
          auVar90 = vfmadd231ps_avx512vl(auVar91,auVar102,auVar90);
          auVar101 = vfmadd231ps_avx512vl(auVar90,auVar93,auVar89);
          auVar89 = vdivps_avx512vl(auVar93,auVar101);
          auVar90 = vdivps_avx512vl(auVar97,auVar101);
          auVar91 = vdivps_avx512vl(auVar98,auVar101);
          auVar92 = vdivps_avx512vl(auVar102,auVar101);
          auVar93 = vdivps_avx512vl(auVar94,auVar101);
          auVar73 = vdivps_avx512vl(auVar73,auVar101);
          auVar102 = vdivps_avx512vl(auVar75,auVar101);
          auVar74 = vdivps_avx512vl(auVar96,auVar101);
          auVar75 = vdivps_avx512vl(auVar95,auVar101);
          auVar274._0_4_ = fVar169 * auVar102._0_4_;
          auVar274._4_4_ = fVar179 * auVar102._4_4_;
          auVar274._8_4_ = fVar180 * auVar102._8_4_;
          auVar274._12_4_ = fVar181 * auVar102._12_4_;
          auVar292._0_4_ = fVar169 * auVar74._0_4_;
          auVar292._4_4_ = fVar179 * auVar74._4_4_;
          auVar292._8_4_ = fVar180 * auVar74._8_4_;
          auVar292._12_4_ = fVar181 * auVar74._12_4_;
          auVar309._0_4_ = fVar169 * auVar75._0_4_;
          auVar309._4_4_ = fVar179 * auVar75._4_4_;
          auVar309._8_4_ = fVar180 * auVar75._8_4_;
          auVar309._12_4_ = fVar181 * auVar75._12_4_;
          auVar94 = vfmadd231ps_fma(auVar274,auVar100,auVar92);
          auVar95 = vfmadd231ps_fma(auVar292,auVar100,auVar93);
          auVar96 = vfmadd231ps_fma(auVar309,auVar73,auVar100);
          auVar94 = vfmadd231ps_fma(auVar94,auVar99,auVar89);
          auVar95 = vfmadd231ps_fma(auVar95,auVar99,auVar90);
          auVar96 = vfmadd231ps_fma(auVar96,auVar91,auVar99);
        }
      }
      else {
        fVar169 = (pGVar7->time_range).lower;
        auVar170._4_4_ = fVar169;
        auVar170._0_4_ = fVar169;
        auVar170._8_4_ = fVar169;
        auVar170._12_4_ = fVar169;
        fVar179 = pGVar7->fnumTimeSegments;
        auVar93 = vsubps_avx(*(undefined1 (*) [16])(ray + 0x70),auVar170);
        fVar169 = (pGVar7->time_range).upper - fVar169;
        auVar171._4_4_ = fVar169;
        auVar171._0_4_ = fVar169;
        auVar171._8_4_ = fVar169;
        auVar171._12_4_ = fVar169;
        auVar73 = vdivps_avx(auVar93,auVar171);
        auVar172._0_4_ = fVar179 * auVar73._0_4_;
        auVar172._4_4_ = fVar179 * auVar73._4_4_;
        auVar172._8_4_ = fVar179 * auVar73._8_4_;
        auVar172._12_4_ = fVar179 * auVar73._12_4_;
        auVar73 = vroundps_avx(auVar172,1);
        fVar179 = fVar179 + -1.0;
        auVar76._4_4_ = fVar179;
        auVar76._0_4_ = fVar179;
        auVar76._8_4_ = fVar179;
        auVar76._12_4_ = fVar179;
        auVar102 = vminps_avx(auVar73,auVar76);
        auVar73 = vxorps_avx512vl(in_ZMM25._0_16_,in_ZMM25._0_16_);
        auVar74 = vmaxps_avx512vl(auVar102,auVar73);
        auVar102 = vsubps_avx(auVar172,auVar74);
        auVar74 = vcvtps2dq_avx512vl(auVar74);
        local_b8 = vmovdqa64_avx512vl(auVar74);
        uVar5 = 0;
        for (uVar61 = (uint)bVar59; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x80000000) {
          uVar5 = uVar5 + 1;
        }
        auVar75 = vpbroadcastd_avx512vl();
        uVar17 = vpcmpeqd_avx512vl(auVar74,auVar75);
        if ((byte)(bVar59 ^ 0xf | (byte)uVar17 & 0xf) == 0xf) {
          lVar9 = *(long *)&pGVar7[1].fnumTimeSegments;
          lVar62 = (long)*(int *)(local_b8 + (ulong)uVar5 * 4) * 0x38;
          plVar1 = (long *)(lVar9 + lVar62);
          iVar6 = *(int *)(lVar9 + 0x20 + lVar62);
          if (iVar6 == 0x9134) {
            lVar63 = *plVar1;
            lVar65 = plVar1[2] * uVar60;
            auVar89 = vinsertps_avx(ZEXT416(*(uint *)(lVar63 + lVar65)),
                                    ZEXT416(*(uint *)(lVar63 + 0x10 + lVar65)),0x1c);
            auVar75 = vinsertps_avx(auVar89,ZEXT416(*(uint *)(lVar63 + 0x20 + lVar65)),0x28);
            auVar89 = vinsertps_avx(ZEXT416(*(uint *)(lVar63 + 4 + lVar65)),
                                    ZEXT416(*(uint *)(lVar63 + 0x14 + lVar65)),0x1c);
            auVar76 = vinsertps_avx(auVar89,ZEXT416(*(uint *)(lVar63 + 0x24 + lVar65)),0x28);
            auVar89 = vinsertps_avx(ZEXT416(*(uint *)(lVar63 + 8 + lVar65)),
                                    ZEXT416(*(uint *)(lVar63 + 0x18 + lVar65)),0x1c);
            auVar93 = vinsertps_avx(auVar89,ZEXT416(*(uint *)(lVar63 + 0x28 + lVar65)),0x28);
            auVar89 = vinsertps_avx(ZEXT416(*(uint *)(lVar63 + 0xc + lVar65)),
                                    ZEXT416(*(uint *)(lVar63 + 0x1c + lVar65)),0x1c);
            auVar89 = vinsertps_avx(auVar89,ZEXT416(*(uint *)(lVar63 + 0x2c + lVar65)),0x28);
          }
          else if (iVar6 == 0x9234) {
            lVar63 = *plVar1;
            lVar65 = plVar1[2] * uVar60;
            auVar195._8_8_ = 0;
            auVar195._0_8_ = *(ulong *)(lVar63 + 4 + lVar65);
            auVar230._8_8_ = 0;
            auVar230._0_8_ = *(ulong *)(lVar63 + 0x10 + lVar65);
            auVar75 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar63 + lVar65)),_DAT_02060e80,auVar195)
            ;
            auVar76 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar63 + 0xc + lVar65)),_DAT_02060e80,
                                         auVar230);
            auVar231._8_8_ = 0;
            auVar231._0_8_ = *(ulong *)(lVar63 + 0x1c + lVar65);
            auVar93 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar63 + 0x18 + lVar65)),_DAT_02060e80,
                                         auVar231);
            auVar232._8_8_ = 0;
            auVar232._0_8_ = *(ulong *)(lVar63 + 0x28 + lVar65);
            auVar89 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar63 + 0x24 + lVar65)),_DAT_02060e80,
                                         auVar232);
          }
          else if (iVar6 == 0xb001) {
            lVar63 = *plVar1;
            lVar65 = plVar1[2] * uVar60;
            auVar183._8_8_ = 0;
            auVar183._0_8_ = *(ulong *)(lVar63 + 0x10 + lVar65);
            auVar93 = vinsertps_avx(auVar183,ZEXT416(*(uint *)(lVar63 + 8 + lVar65)),0x20);
            auVar184._8_8_ = 0;
            auVar184._0_8_ = *(ulong *)(lVar63 + 0x34 + lVar65);
            auVar74 = vpermt2ps_avx512vl(auVar184,_DAT_02060e90,ZEXT416(*(uint *)(lVar63 + lVar65)))
            ;
            auVar241._8_8_ = 0;
            auVar241._0_8_ = *(ulong *)(lVar63 + 0x1c + lVar65);
            fVar169 = *(float *)(lVar63 + 0x24 + lVar65);
            fVar179 = *(float *)(lVar63 + 0x28 + lVar65);
            fVar180 = *(float *)(lVar63 + 0x2c + lVar65);
            auVar75 = vpermt2ps_avx512vl(auVar241,_DAT_02060e90,
                                         ZEXT416(*(uint *)(lVar63 + 0x18 + lVar65)));
            fVar181 = *(float *)(lVar63 + 0x30 + lVar65);
            auVar89 = vfmadd231ss_fma(ZEXT416((uint)(fVar179 * fVar179)),ZEXT416((uint)fVar169),
                                      ZEXT416((uint)fVar169));
            auVar89 = vfmadd231ss_fma(auVar89,ZEXT416((uint)fVar180),ZEXT416((uint)fVar180));
            auVar89 = vfmadd231ss_fma(auVar89,ZEXT416((uint)fVar181),ZEXT416((uint)fVar181));
            auVar94 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar89._0_4_));
            fVar69 = auVar94._0_4_;
            fVar69 = fVar69 * 1.5 + fVar69 * fVar69 * fVar69 * auVar89._0_4_ * -0.5;
            auVar89 = vinsertps_avx(auVar75,ZEXT416((uint)(fVar169 * fVar69)),0x30);
            auVar75 = vinsertps_avx(auVar74,ZEXT416((uint)(fVar179 * fVar69)),0x30);
            auVar93 = vinsertps_avx(auVar93,ZEXT416((uint)(fVar181 * fVar69)),0x30);
            auVar74 = vinsertps_avx(ZEXT416(*(uint *)(lVar63 + 0xc + lVar65)),
                                    ZEXT416(*(uint *)(lVar63 + 4 + lVar65)),0x10);
            auVar74 = vinsertps_avx(auVar74,ZEXT416(*(uint *)(lVar63 + 0x3c + lVar65)),0x20);
            auVar76 = vinsertps_avx(auVar74,ZEXT416((uint)(fVar180 * fVar69)),0x30);
          }
          else if (iVar6 == 0x9244) {
            lVar63 = *plVar1;
            lVar65 = plVar1[2] * uVar60;
            auVar75 = *(undefined1 (*) [16])(lVar63 + lVar65);
            auVar76 = *(undefined1 (*) [16])(lVar63 + 0x10 + lVar65);
            auVar93 = *(undefined1 (*) [16])(lVar63 + 0x20 + lVar65);
            auVar89 = *(undefined1 (*) [16])(lVar63 + 0x30 + lVar65);
          }
          iVar6 = *(int *)(lVar9 + 0x58 + lVar62);
          if (iVar6 == 0x9134) {
            lVar9 = plVar1[7];
            lVar62 = uVar60 * plVar1[9];
            auVar90 = vinsertps_avx(ZEXT416(*(uint *)(lVar9 + lVar62)),
                                    ZEXT416(*(uint *)(lVar9 + 0x10 + lVar62)),0x1c);
            auVar90 = vinsertps_avx(auVar90,ZEXT416(*(uint *)(lVar9 + 0x20 + lVar62)),0x28);
            auVar91 = vinsertps_avx(ZEXT416(*(uint *)(lVar9 + 4 + lVar62)),
                                    ZEXT416(*(uint *)(lVar9 + 0x14 + lVar62)),0x1c);
            auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(lVar9 + 0x24 + lVar62)),0x28);
            auVar92 = vinsertps_avx(ZEXT416(*(uint *)(lVar9 + 8 + lVar62)),
                                    ZEXT416(*(uint *)(lVar9 + 0x18 + lVar62)),0x1c);
            auVar92 = vinsertps_avx512f(auVar92,ZEXT416(*(uint *)(lVar9 + 0x28 + lVar62)),0x28);
            auVar73 = vinsertps_avx(ZEXT416(*(uint *)(lVar9 + 0xc + lVar62)),
                                    ZEXT416(*(uint *)(lVar9 + 0x1c + lVar62)),0x1c);
            auVar73 = vinsertps_avx512f(auVar73,ZEXT416(*(uint *)(lVar9 + 0x2c + lVar62)),0x28);
          }
          else if (iVar6 == 0x9234) {
            lVar9 = plVar1[7];
            lVar62 = uVar60 * plVar1[9];
            auVar215._8_8_ = 0;
            auVar215._0_8_ = *(ulong *)(lVar9 + 4 + lVar62);
            auVar242._8_8_ = 0;
            auVar242._0_8_ = *(ulong *)(lVar9 + 0x10 + lVar62);
            auVar90 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar9 + lVar62)),_DAT_02060e80,auVar215);
            auVar91 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar9 + 0xc + lVar62)),_DAT_02060e80,
                                         auVar242);
            auVar216._8_8_ = 0;
            auVar216._0_8_ = *(ulong *)(lVar9 + 0x1c + lVar62);
            auVar92 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar9 + 0x18 + lVar62)),_DAT_02060e80,
                                         auVar216);
            auVar217._8_8_ = 0;
            auVar217._0_8_ = *(ulong *)(lVar9 + 0x28 + lVar62);
            auVar73 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar9 + 0x24 + lVar62)),_DAT_02060e80,
                                         auVar217);
          }
          else if (iVar6 == 0xb001) {
            lVar9 = plVar1[7];
            lVar62 = uVar60 * plVar1[9];
            auVar218._8_8_ = 0;
            auVar218._0_8_ = *(ulong *)(lVar9 + 0x10 + lVar62);
            auVar91 = vinsertps_avx(auVar218,ZEXT416(*(uint *)(lVar9 + 8 + lVar62)),0x20);
            auVar233._8_8_ = 0;
            auVar233._0_8_ = *(ulong *)(lVar9 + 0x34 + lVar62);
            auVar92 = vpermt2ps_avx512vl(auVar233,_DAT_02060e90,ZEXT416(*(uint *)(lVar9 + lVar62)));
            auVar264._8_8_ = 0;
            auVar264._0_8_ = *(ulong *)(lVar9 + 0x1c + lVar62);
            fVar169 = *(float *)(lVar9 + 0x24 + lVar62);
            fVar179 = *(float *)(lVar9 + 0x28 + lVar62);
            fVar180 = *(float *)(lVar9 + 0x2c + lVar62);
            auVar73 = vpermt2ps_avx512vl(auVar264,_DAT_02060e90,
                                         ZEXT416(*(uint *)(lVar9 + 0x18 + lVar62)));
            fVar181 = *(float *)(lVar9 + 0x30 + lVar62);
            auVar90 = vfmadd231ss_fma(ZEXT416((uint)(fVar179 * fVar179)),ZEXT416((uint)fVar169),
                                      ZEXT416((uint)fVar169));
            auVar90 = vfmadd231ss_fma(auVar90,ZEXT416((uint)fVar180),ZEXT416((uint)fVar180));
            auVar90 = vfmadd231ss_fma(auVar90,ZEXT416((uint)fVar181),ZEXT416((uint)fVar181));
            auVar321._4_12_ = ZEXT812(0) << 0x20;
            auVar321._0_4_ = auVar90._0_4_;
            auVar74 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar321);
            fVar69 = auVar74._0_4_;
            fVar69 = fVar69 * 1.5 + fVar69 * fVar69 * fVar69 * auVar90._0_4_ * -0.5;
            auVar73 = vinsertps_avx512f(auVar73,ZEXT416((uint)(fVar169 * fVar69)),0x30);
            auVar90 = vinsertps_avx(auVar92,ZEXT416((uint)(fVar179 * fVar69)),0x30);
            auVar92 = vinsertps_avx512f(auVar91,ZEXT416((uint)(fVar181 * fVar69)),0x30);
            auVar91 = vinsertps_avx(ZEXT416(*(uint *)(lVar9 + 0xc + lVar62)),
                                    ZEXT416(*(uint *)(lVar9 + 4 + lVar62)),0x10);
            auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(lVar9 + 0x3c + lVar62)),0x20);
            auVar91 = vinsertps_avx(auVar91,ZEXT416((uint)(fVar180 * fVar69)),0x30);
          }
          else if (iVar6 == 0x9244) {
            lVar9 = plVar1[7];
            lVar62 = uVar60 * plVar1[9];
            auVar90 = *(undefined1 (*) [16])(lVar9 + lVar62);
            auVar91 = *(undefined1 (*) [16])(lVar9 + 0x10 + lVar62);
            auVar92 = *(undefined1 (*) [16])(lVar9 + 0x20 + lVar62);
            auVar73 = *(undefined1 (*) [16])(lVar9 + 0x30 + lVar62);
          }
          uVar182 = auVar75._0_4_;
          auVar105._4_4_ = uVar182;
          auVar105._0_4_ = uVar182;
          auVar105._8_4_ = uVar182;
          auVar105._12_4_ = uVar182;
          auVar106 = vshufps_avx(auVar75,auVar75,0x55);
          auVar107 = vshufps_avx(auVar75,auVar75,0xaa);
          uVar182 = auVar76._0_4_;
          auVar108._4_4_ = uVar182;
          auVar108._0_4_ = uVar182;
          auVar108._8_4_ = uVar182;
          auVar108._12_4_ = uVar182;
          auVar109 = vshufps_avx(auVar76,auVar76,0x55);
          auVar110 = vshufps_avx(auVar76,auVar76,0xaa);
          uVar182 = auVar93._0_4_;
          auVar111._4_4_ = uVar182;
          auVar111._0_4_ = uVar182;
          auVar111._8_4_ = uVar182;
          auVar111._12_4_ = uVar182;
          auVar112 = vshufps_avx(auVar93,auVar93,0x55);
          auVar113 = vshufps_avx(auVar93,auVar93,0xaa);
          uVar182 = auVar89._0_4_;
          auVar114._4_4_ = uVar182;
          auVar114._0_4_ = uVar182;
          auVar114._8_4_ = uVar182;
          auVar114._12_4_ = uVar182;
          auVar115 = vshufps_avx(auVar89,auVar89,0x55);
          auVar116 = vshufps_avx(auVar89,auVar89,0xaa);
          auVar77 = vbroadcastss_avx512vl(auVar90);
          auVar78 = vshufps_avx512vl(auVar90,auVar90,0x55);
          auVar79 = vshufps_avx512vl(auVar90,auVar90,0xaa);
          auVar80 = vbroadcastss_avx512vl(auVar91);
          auVar81 = vshufps_avx512vl(auVar91,auVar91,0x55);
          auVar82 = vshufps_avx512vl(auVar91,auVar91,0xaa);
          auVar83 = vbroadcastss_avx512vl(auVar92);
          auVar84 = vshufps_avx512vl(auVar92,auVar92,0x55);
          auVar85 = vshufps_avx512vl(auVar92,auVar92,0xaa);
          auVar86 = vbroadcastss_avx512vl(auVar73);
          auVar87 = vshufps_avx512vl(auVar73,auVar73,0x55);
          auVar88 = vshufps_avx512vl(auVar73,auVar73,0xaa);
        }
        else {
          lVar9 = *(long *)&pGVar7[1].fnumTimeSegments;
          uVar66 = uVar57;
          do {
            uVar5 = 0;
            for (uVar61 = (uint)uVar66; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x80000000) {
              uVar5 = uVar5 + 1;
            }
            lVar62 = (long)*(int *)(local_b8 + (ulong)uVar5 * 4) * 0x38;
            plVar1 = (long *)(lVar9 + lVar62);
            iVar6 = *(int *)(lVar9 + 0x20 + lVar62);
            auVar103._4_12_ = auVar73._4_12_;
            if (iVar6 == 0x9134) {
              lVar63 = *plVar1;
              lVar65 = plVar1[2] * uVar60;
              auVar89 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar63 + lVar65)),
                                          ZEXT416(*(uint *)(lVar63 + 0x10 + lVar65)),0x1c);
              local_168 = vinsertps_avx512f(auVar89,ZEXT416(*(uint *)(lVar63 + 0x20 + lVar65)),0x28)
              ;
              auVar89 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar63 + 4 + lVar65)),
                                          ZEXT416(*(uint *)(lVar63 + 0x14 + lVar65)),0x1c);
              local_148 = vinsertps_avx512f(auVar89,ZEXT416(*(uint *)(lVar63 + 0x24 + lVar65)),0x28)
              ;
              auVar89 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar63 + 8 + lVar65)),
                                          ZEXT416(*(uint *)(lVar63 + 0x18 + lVar65)),0x1c);
              local_158 = vinsertps_avx512f(auVar89,ZEXT416(*(uint *)(lVar63 + 0x28 + lVar65)),0x28)
              ;
              auVar89 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar63 + 0xc + lVar65)),
                                          ZEXT416(*(uint *)(lVar63 + 0x1c + lVar65)),0x1c);
              local_138 = vinsertps_avx512f(auVar89,ZEXT416(*(uint *)(lVar63 + 0x2c + lVar65)),0x28)
              ;
            }
            else if (iVar6 == 0x9234) {
              lVar63 = *plVar1;
              lVar65 = plVar1[2] * uVar60;
              auVar327._8_8_ = 0;
              auVar327._0_8_ = *(ulong *)(lVar63 + 4 + lVar65);
              local_168 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar63 + lVar65)),_DAT_02060e80,
                                             auVar327);
              auVar334._8_8_ = 0;
              auVar334._0_8_ = *(ulong *)(lVar63 + 0x10 + lVar65);
              local_148 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar63 + 0xc + lVar65)),_DAT_02060e80
                                             ,auVar334);
              auVar328._8_8_ = 0;
              auVar328._0_8_ = *(ulong *)(lVar63 + 0x1c + lVar65);
              local_158 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar63 + 0x18 + lVar65)),
                                             _DAT_02060e80,auVar328);
              auVar329._8_8_ = 0;
              auVar329._0_8_ = *(ulong *)(lVar63 + 0x28 + lVar65);
              local_138 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar63 + 0x24 + lVar65)),
                                             _DAT_02060e80,auVar329);
            }
            else if (iVar6 == 0xb001) {
              lVar63 = *plVar1;
              lVar65 = plVar1[2] * uVar60;
              auVar335._8_8_ = 0;
              auVar335._0_8_ = *(ulong *)(lVar63 + 0x10 + lVar65);
              auVar89 = vinsertps_avx512f(auVar335,ZEXT416(*(uint *)(lVar63 + 8 + lVar65)),0x20);
              auVar336._8_8_ = 0;
              auVar336._0_8_ = *(ulong *)(lVar63 + 0x34 + lVar65);
              auVar90 = vpermt2ps_avx512vl(auVar336,_DAT_02060e90,
                                           ZEXT416(*(uint *)(lVar63 + lVar65)));
              auVar339._8_8_ = 0;
              auVar339._0_8_ = *(ulong *)(lVar63 + 0x1c + lVar65);
              auVar91 = vpermt2ps_avx512vl(auVar339,_DAT_02060e90,
                                           ZEXT416(*(uint *)(lVar63 + 0x18 + lVar65)));
              uVar5 = *(uint *)(lVar63 + 0x24 + lVar65);
              uVar61 = *(uint *)(lVar63 + 0x28 + lVar65);
              uVar2 = *(uint *)(lVar63 + 0x2c + lVar65);
              uVar3 = *(uint *)(lVar63 + 0x30 + lVar65);
              auVar92 = vmulss_avx512f(ZEXT416(uVar61),ZEXT416(uVar61));
              auVar92 = vfmadd231ss_avx512f(auVar92,ZEXT416(uVar5),ZEXT416(uVar5));
              auVar92 = vfmadd231ss_avx512f(auVar92,ZEXT416(uVar2),ZEXT416(uVar2));
              auVar92 = vfmadd231ss_avx512f(auVar92,ZEXT416(uVar3),ZEXT416(uVar3));
              auVar103._0_4_ = auVar92._0_4_;
              auVar94 = vrsqrt14ss_avx512f(auVar73,auVar103);
              auVar95 = vmulss_avx512f(auVar94,ZEXT416(0x3fc00000));
              auVar92 = vmulss_avx512f(auVar92,ZEXT416(0xbf000000));
              auVar92 = vmulss_avx512f(auVar94,auVar92);
              auVar94 = vmulss_avx512f(auVar94,auVar94);
              auVar92 = vmulss_avx512f(auVar94,auVar92);
              auVar92 = vaddss_avx512f(auVar95,auVar92);
              auVar94 = vmulss_avx512f(ZEXT416(uVar5),auVar92);
              local_138 = vinsertps_avx512f(auVar91,auVar94,0x30);
              auVar91 = vmulss_avx512f(auVar92,ZEXT416(uVar61));
              local_168 = vinsertps_avx512f(auVar90,auVar91,0x30);
              auVar90 = vmulss_avx512f(auVar92,ZEXT416(uVar2));
              auVar91 = vmulss_avx512f(auVar92,ZEXT416(uVar3));
              local_158 = vinsertps_avx512f(auVar89,auVar91,0x30);
              auVar89 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar63 + 0xc + lVar65)),
                                          ZEXT416(*(uint *)(lVar63 + 4 + lVar65)),0x10);
              auVar89 = vinsertps_avx512f(auVar89,ZEXT416(*(uint *)(lVar63 + 0x3c + lVar65)),0x20);
              local_148 = vinsertps_avx512f(auVar89,auVar90,0x30);
            }
            else if (iVar6 == 0x9244) {
              lVar63 = *plVar1;
              lVar65 = plVar1[2] * uVar60;
              local_168 = *(undefined1 (*) [16])(lVar63 + lVar65);
              local_148 = *(undefined1 (*) [16])(lVar63 + 0x10 + lVar65);
              local_158 = *(undefined1 (*) [16])(lVar63 + 0x20 + lVar65);
              local_138 = *(undefined1 (*) [16])(lVar63 + 0x30 + lVar65);
            }
            auVar89 = vpbroadcastd_avx512vl();
            uVar17 = vpcmpeqd_avx512vl(auVar89,auVar74);
            iVar6 = *(int *)(lVar9 + 0x58 + lVar62);
            if (iVar6 == 0x9134) {
              lVar62 = plVar1[7];
              lVar63 = plVar1[9] * uVar60;
              auVar89 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar62 + lVar63)),
                                          ZEXT416(*(uint *)(lVar62 + 0x10 + lVar63)),0x1c);
              local_178 = vinsertps_avx512f(auVar89,ZEXT416(*(uint *)(lVar62 + 0x20 + lVar63)),0x28)
              ;
              auVar89 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar62 + 4 + lVar63)),
                                          ZEXT416(*(uint *)(lVar62 + 0x14 + lVar63)),0x1c);
              auVar89 = vinsertps_avx512f(auVar89,ZEXT416(*(uint *)(lVar62 + 0x24 + lVar63)),0x28);
              in_ZMM28 = ZEXT1664(auVar89);
              auVar89 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar62 + 8 + lVar63)),
                                          ZEXT416(*(uint *)(lVar62 + 0x18 + lVar63)),0x1c);
              auVar89 = vinsertps_avx512f(auVar89,ZEXT416(*(uint *)(lVar62 + 0x28 + lVar63)),0x28);
              in_ZMM30 = ZEXT1664(auVar89);
              auVar89 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar62 + 0xc + lVar63)),
                                          ZEXT416(*(uint *)(lVar62 + 0x1c + lVar63)),0x1c);
              auVar89 = vinsertps_avx512f(auVar89,ZEXT416(*(uint *)(lVar62 + 0x2c + lVar63)),0x28);
              in_ZMM29 = ZEXT1664(auVar89);
            }
            else if (iVar6 == 0x9234) {
              lVar62 = plVar1[7];
              lVar63 = plVar1[9] * uVar60;
              local_178._8_8_ = 0;
              local_178._0_8_ = *(ulong *)(lVar62 + 4 + lVar63);
              local_178 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar62 + lVar63)),_DAT_02060e80,
                                             local_178);
              auVar330._8_8_ = 0;
              auVar330._0_8_ = *(ulong *)(lVar62 + 0x10 + lVar63);
              auVar89 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar62 + 0xc + lVar63)),_DAT_02060e80,
                                           auVar330);
              in_ZMM28 = ZEXT1664(auVar89);
              auVar331._8_8_ = 0;
              auVar331._0_8_ = *(ulong *)(lVar62 + 0x1c + lVar63);
              auVar89 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar62 + 0x18 + lVar63)),_DAT_02060e80,
                                           auVar331);
              in_ZMM30 = ZEXT1664(auVar89);
              auVar332._8_8_ = 0;
              auVar332._0_8_ = *(ulong *)(lVar62 + 0x28 + lVar63);
              auVar89 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar62 + 0x24 + lVar63)),_DAT_02060e80,
                                           auVar332);
              in_ZMM29 = ZEXT1664(auVar89);
            }
            else if (iVar6 == 0xb001) {
              lVar62 = plVar1[7];
              lVar63 = plVar1[9] * uVar60;
              auVar333._8_8_ = 0;
              auVar333._0_8_ = *(ulong *)(lVar62 + 0x10 + lVar63);
              auVar89 = vinsertps_avx512f(auVar333,ZEXT416(*(uint *)(lVar62 + 8 + lVar63)),0x20);
              auVar337._8_8_ = 0;
              auVar337._0_8_ = *(ulong *)(lVar62 + 0x34 + lVar63);
              auVar91 = vpermt2ps_avx512vl(auVar337,_DAT_02060e90,
                                           ZEXT416(*(uint *)(lVar62 + lVar63)));
              auVar338._8_8_ = 0;
              auVar338._0_8_ = *(ulong *)(lVar62 + 0x1c + lVar63);
              auVar90 = vpermt2ps_avx512vl(auVar338,_DAT_02060e90,
                                           ZEXT416(*(uint *)(lVar62 + 0x18 + lVar63)));
              uVar5 = *(uint *)(lVar62 + 0x24 + lVar63);
              uVar61 = *(uint *)(lVar62 + 0x28 + lVar63);
              uVar2 = *(uint *)(lVar62 + 0x2c + lVar63);
              uVar3 = *(uint *)(lVar62 + 0x30 + lVar63);
              auVar92 = vmulss_avx512f(ZEXT416(uVar61),ZEXT416(uVar61));
              auVar92 = vfmadd231ss_avx512f(auVar92,ZEXT416(uVar5),ZEXT416(uVar5));
              auVar92 = vfmadd231ss_avx512f(auVar92,ZEXT416(uVar2),ZEXT416(uVar2));
              auVar92 = vfmadd231ss_avx512f(auVar92,ZEXT416(uVar3),ZEXT416(uVar3));
              auVar104._4_12_ = auVar103._4_12_;
              auVar104._0_4_ = auVar92._0_4_;
              auVar94 = vrsqrt14ss_avx512f(auVar73,auVar104);
              auVar95 = vmulss_avx512f(auVar94,ZEXT416(0x3fc00000));
              auVar92 = vmulss_avx512f(auVar92,ZEXT416(0xbf000000));
              auVar92 = vmulss_avx512f(auVar94,auVar92);
              auVar94 = vmulss_avx512f(auVar94,auVar94);
              auVar92 = vmulss_avx512f(auVar94,auVar92);
              auVar92 = vaddss_avx512f(auVar95,auVar92);
              auVar94 = vmulss_avx512f(ZEXT416(uVar5),auVar92);
              auVar90 = vinsertps_avx512f(auVar90,auVar94,0x30);
              auVar94 = vmulss_avx512f(auVar92,ZEXT416(uVar61));
              local_178 = vinsertps_avx512f(auVar91,auVar94,0x30);
              in_ZMM29 = ZEXT1664(auVar90);
              auVar90 = vmulss_avx512f(auVar92,ZEXT416(uVar2));
              auVar91 = vmulss_avx512f(auVar92,ZEXT416(uVar3));
              auVar89 = vinsertps_avx512f(auVar89,auVar91,0x30);
              in_ZMM30 = ZEXT1664(auVar89);
              auVar89 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar62 + 0xc + lVar63)),
                                          ZEXT416(*(uint *)(lVar62 + 4 + lVar63)),0x10);
              auVar89 = vinsertps_avx512f(auVar89,ZEXT416(*(uint *)(lVar62 + 0x3c + lVar63)),0x20);
              auVar89 = vinsertps_avx512f(auVar89,auVar90,0x30);
              in_ZMM28 = ZEXT1664(auVar89);
            }
            else {
              in_ZMM28 = ZEXT1664(in_ZMM28._0_16_);
              in_ZMM30 = ZEXT1664(in_ZMM30._0_16_);
              in_ZMM29 = ZEXT1664(in_ZMM29._0_16_);
              if (iVar6 == 0x9244) {
                lVar62 = plVar1[7];
                lVar63 = plVar1[9] * uVar60;
                auVar89 = vmovdqa64_avx512vl(*(undefined1 (*) [16])(lVar62 + lVar63));
                local_178 = vmovdqa64_avx512vl(auVar89);
                in_ZMM28 = ZEXT1664(*(undefined1 (*) [16])(lVar62 + 0x10 + lVar63));
                in_ZMM30 = ZEXT1664(*(undefined1 (*) [16])(lVar62 + 0x20 + lVar63));
                in_ZMM29 = ZEXT1664(*(undefined1 (*) [16])(lVar62 + 0x30 + lVar63));
              }
            }
            bVar64 = (byte)uVar66 & (byte)uVar17 & 0xf;
            bVar59 = ~bVar64 & (byte)uVar66;
            uVar66 = (ulong)bVar59;
            auVar89 = vbroadcastss_avx512vl(local_168);
            auVar105._0_4_ =
                 (uint)(bVar64 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar64 & 1) * in_ZMM13._0_4_;
            bVar10 = (bool)(bVar64 >> 1 & 1);
            auVar105._4_4_ = (uint)bVar10 * auVar89._4_4_ | (uint)!bVar10 * in_ZMM13._4_4_;
            bVar10 = (bool)(bVar64 >> 2 & 1);
            auVar105._8_4_ = (uint)bVar10 * auVar89._8_4_ | (uint)!bVar10 * in_ZMM13._8_4_;
            auVar105._12_4_ =
                 (uint)(bVar64 >> 3) * auVar89._12_4_ | (uint)!(bool)(bVar64 >> 3) * in_ZMM13._12_4_
            ;
            in_ZMM13 = ZEXT1664(auVar105);
            auVar89 = vshufps_avx512vl(local_168,local_168,0x55);
            auVar106._0_4_ =
                 (uint)(bVar64 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar64 & 1) * in_ZMM11._0_4_;
            bVar10 = (bool)(bVar64 >> 1 & 1);
            auVar106._4_4_ = (uint)bVar10 * auVar89._4_4_ | (uint)!bVar10 * in_ZMM11._4_4_;
            bVar10 = (bool)(bVar64 >> 2 & 1);
            auVar106._8_4_ = (uint)bVar10 * auVar89._8_4_ | (uint)!bVar10 * in_ZMM11._8_4_;
            auVar106._12_4_ =
                 (uint)(bVar64 >> 3) * auVar89._12_4_ | (uint)!(bool)(bVar64 >> 3) * in_ZMM11._12_4_
            ;
            in_ZMM11 = ZEXT1664(auVar106);
            auVar89 = vshufps_avx512vl(local_168,local_168,0xaa);
            auVar107._0_4_ =
                 (uint)(bVar64 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar64 & 1) * in_ZMM10._0_4_;
            bVar10 = (bool)(bVar64 >> 1 & 1);
            auVar107._4_4_ = (uint)bVar10 * auVar89._4_4_ | (uint)!bVar10 * in_ZMM10._4_4_;
            bVar10 = (bool)(bVar64 >> 2 & 1);
            auVar107._8_4_ = (uint)bVar10 * auVar89._8_4_ | (uint)!bVar10 * in_ZMM10._8_4_;
            auVar107._12_4_ =
                 (uint)(bVar64 >> 3) * auVar89._12_4_ | (uint)!(bool)(bVar64 >> 3) * in_ZMM10._12_4_
            ;
            in_ZMM10 = ZEXT1664(auVar107);
            auVar89 = vbroadcastss_avx512vl(local_148);
            auVar108._0_4_ =
                 (uint)(bVar64 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar64 & 1) * in_ZMM9._0_4_;
            bVar10 = (bool)(bVar64 >> 1 & 1);
            auVar108._4_4_ = (uint)bVar10 * auVar89._4_4_ | (uint)!bVar10 * in_ZMM9._4_4_;
            bVar10 = (bool)(bVar64 >> 2 & 1);
            auVar108._8_4_ = (uint)bVar10 * auVar89._8_4_ | (uint)!bVar10 * in_ZMM9._8_4_;
            auVar108._12_4_ =
                 (uint)(bVar64 >> 3) * auVar89._12_4_ | (uint)!(bool)(bVar64 >> 3) * in_ZMM9._12_4_;
            in_ZMM9 = ZEXT1664(auVar108);
            auVar89 = vshufps_avx512vl(local_148,local_148,0x55);
            auVar109._0_4_ =
                 (uint)(bVar64 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar64 & 1) * in_ZMM8._0_4_;
            bVar10 = (bool)(bVar64 >> 1 & 1);
            auVar109._4_4_ = (uint)bVar10 * auVar89._4_4_ | (uint)!bVar10 * in_ZMM8._4_4_;
            bVar10 = (bool)(bVar64 >> 2 & 1);
            auVar109._8_4_ = (uint)bVar10 * auVar89._8_4_ | (uint)!bVar10 * in_ZMM8._8_4_;
            auVar109._12_4_ =
                 (uint)(bVar64 >> 3) * auVar89._12_4_ | (uint)!(bool)(bVar64 >> 3) * in_ZMM8._12_4_;
            in_ZMM8 = ZEXT1664(auVar109);
            auVar89 = vshufps_avx512vl(local_148,local_148,0xaa);
            auVar110._0_4_ =
                 (uint)(bVar64 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar64 & 1) * in_ZMM7._0_4_;
            bVar10 = (bool)(bVar64 >> 1 & 1);
            auVar110._4_4_ = (uint)bVar10 * auVar89._4_4_ | (uint)!bVar10 * in_ZMM7._4_4_;
            bVar10 = (bool)(bVar64 >> 2 & 1);
            auVar110._8_4_ = (uint)bVar10 * auVar89._8_4_ | (uint)!bVar10 * in_ZMM7._8_4_;
            auVar110._12_4_ =
                 (uint)(bVar64 >> 3) * auVar89._12_4_ | (uint)!(bool)(bVar64 >> 3) * in_ZMM7._12_4_;
            in_ZMM7 = ZEXT1664(auVar110);
            auVar89 = vbroadcastss_avx512vl(local_158);
            auVar111._0_4_ =
                 (uint)(bVar64 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar64 & 1) * in_ZMM6._0_4_;
            bVar10 = (bool)(bVar64 >> 1 & 1);
            auVar111._4_4_ = (uint)bVar10 * auVar89._4_4_ | (uint)!bVar10 * in_ZMM6._4_4_;
            bVar10 = (bool)(bVar64 >> 2 & 1);
            auVar111._8_4_ = (uint)bVar10 * auVar89._8_4_ | (uint)!bVar10 * in_ZMM6._8_4_;
            auVar111._12_4_ =
                 (uint)(bVar64 >> 3) * auVar89._12_4_ | (uint)!(bool)(bVar64 >> 3) * in_ZMM6._12_4_;
            in_ZMM6 = ZEXT1664(auVar111);
            auVar89 = vshufps_avx512vl(local_158,local_158,0x55);
            auVar112._0_4_ =
                 (uint)(bVar64 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar64 & 1) * in_ZMM5._0_4_;
            bVar10 = (bool)(bVar64 >> 1 & 1);
            auVar112._4_4_ = (uint)bVar10 * auVar89._4_4_ | (uint)!bVar10 * in_ZMM5._4_4_;
            bVar10 = (bool)(bVar64 >> 2 & 1);
            auVar112._8_4_ = (uint)bVar10 * auVar89._8_4_ | (uint)!bVar10 * in_ZMM5._8_4_;
            auVar112._12_4_ =
                 (uint)(bVar64 >> 3) * auVar89._12_4_ | (uint)!(bool)(bVar64 >> 3) * in_ZMM5._12_4_;
            in_ZMM5 = ZEXT1664(auVar112);
            auVar89 = vshufps_avx512vl(local_158,local_158,0xaa);
            auVar113._0_4_ =
                 (uint)(bVar64 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar64 & 1) * in_ZMM4._0_4_;
            bVar10 = (bool)(bVar64 >> 1 & 1);
            auVar113._4_4_ = (uint)bVar10 * auVar89._4_4_ | (uint)!bVar10 * in_ZMM4._4_4_;
            bVar10 = (bool)(bVar64 >> 2 & 1);
            auVar113._8_4_ = (uint)bVar10 * auVar89._8_4_ | (uint)!bVar10 * in_ZMM4._8_4_;
            auVar113._12_4_ =
                 (uint)(bVar64 >> 3) * auVar89._12_4_ | (uint)!(bool)(bVar64 >> 3) * in_ZMM4._12_4_;
            in_ZMM4 = ZEXT1664(auVar113);
            auVar89 = vbroadcastss_avx512vl(local_138);
            auVar114._0_4_ =
                 (uint)(bVar64 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar93._0_4_;
            bVar10 = (bool)(bVar64 >> 1 & 1);
            auVar114._4_4_ = (uint)bVar10 * auVar89._4_4_ | (uint)!bVar10 * auVar93._4_4_;
            bVar10 = (bool)(bVar64 >> 2 & 1);
            auVar114._8_4_ = (uint)bVar10 * auVar89._8_4_ | (uint)!bVar10 * auVar93._8_4_;
            auVar114._12_4_ =
                 (uint)(bVar64 >> 3) * auVar89._12_4_ | (uint)!(bool)(bVar64 >> 3) * auVar93._12_4_;
            auVar89 = vshufps_avx512vl(local_138,local_138,0x55);
            auVar115._0_4_ =
                 (uint)(bVar64 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar76._0_4_;
            bVar10 = (bool)(bVar64 >> 1 & 1);
            auVar115._4_4_ = (uint)bVar10 * auVar89._4_4_ | (uint)!bVar10 * auVar76._4_4_;
            bVar10 = (bool)(bVar64 >> 2 & 1);
            auVar115._8_4_ = (uint)bVar10 * auVar89._8_4_ | (uint)!bVar10 * auVar76._8_4_;
            auVar115._12_4_ =
                 (uint)(bVar64 >> 3) * auVar89._12_4_ | (uint)!(bool)(bVar64 >> 3) * auVar76._12_4_;
            auVar89 = vshufps_avx512vl(local_138,local_138,0xaa);
            auVar116._0_4_ =
                 (uint)(bVar64 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar75._0_4_;
            bVar10 = (bool)(bVar64 >> 1 & 1);
            auVar116._4_4_ = (uint)bVar10 * auVar89._4_4_ | (uint)!bVar10 * auVar75._4_4_;
            bVar10 = (bool)(bVar64 >> 2 & 1);
            auVar116._8_4_ = (uint)bVar10 * auVar89._8_4_ | (uint)!bVar10 * auVar75._8_4_;
            auVar116._12_4_ =
                 (uint)(bVar64 >> 3) * auVar89._12_4_ | (uint)!(bool)(bVar64 >> 3) * auVar75._12_4_;
            auVar89 = vbroadcastss_avx512vl(local_178);
            auVar77._0_4_ =
                 (uint)(bVar64 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar64 & 1) * in_ZMM24._0_4_;
            bVar10 = (bool)(bVar64 >> 1 & 1);
            auVar77._4_4_ = (uint)bVar10 * auVar89._4_4_ | (uint)!bVar10 * in_ZMM24._4_4_;
            bVar10 = (bool)(bVar64 >> 2 & 1);
            auVar77._8_4_ = (uint)bVar10 * auVar89._8_4_ | (uint)!bVar10 * in_ZMM24._8_4_;
            auVar77._12_4_ =
                 (uint)(bVar64 >> 3) * auVar89._12_4_ | (uint)!(bool)(bVar64 >> 3) * in_ZMM24._12_4_
            ;
            in_ZMM24 = ZEXT1664(auVar77);
            auVar89 = vshufps_avx512vl(local_178,local_178,0x55);
            auVar78._0_4_ =
                 (uint)(bVar64 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar64 & 1) * in_ZMM23._0_4_;
            bVar10 = (bool)(bVar64 >> 1 & 1);
            auVar78._4_4_ = (uint)bVar10 * auVar89._4_4_ | (uint)!bVar10 * in_ZMM23._4_4_;
            bVar10 = (bool)(bVar64 >> 2 & 1);
            auVar78._8_4_ = (uint)bVar10 * auVar89._8_4_ | (uint)!bVar10 * in_ZMM23._8_4_;
            auVar78._12_4_ =
                 (uint)(bVar64 >> 3) * auVar89._12_4_ | (uint)!(bool)(bVar64 >> 3) * in_ZMM23._12_4_
            ;
            in_ZMM23 = ZEXT1664(auVar78);
            auVar89 = vshufps_avx512vl(local_178,local_178,0xaa);
            auVar79._0_4_ =
                 (uint)(bVar64 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar64 & 1) * in_ZMM22._0_4_;
            bVar10 = (bool)(bVar64 >> 1 & 1);
            auVar79._4_4_ = (uint)bVar10 * auVar89._4_4_ | (uint)!bVar10 * in_ZMM22._4_4_;
            bVar10 = (bool)(bVar64 >> 2 & 1);
            auVar79._8_4_ = (uint)bVar10 * auVar89._8_4_ | (uint)!bVar10 * in_ZMM22._8_4_;
            auVar79._12_4_ =
                 (uint)(bVar64 >> 3) * auVar89._12_4_ | (uint)!(bool)(bVar64 >> 3) * in_ZMM22._12_4_
            ;
            in_ZMM22 = ZEXT1664(auVar79);
            auVar90 = in_ZMM28._0_16_;
            auVar89 = vbroadcastss_avx512vl(auVar90);
            auVar80._0_4_ =
                 (uint)(bVar64 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar64 & 1) * in_ZMM21._0_4_;
            bVar10 = (bool)(bVar64 >> 1 & 1);
            auVar80._4_4_ = (uint)bVar10 * auVar89._4_4_ | (uint)!bVar10 * in_ZMM21._4_4_;
            bVar10 = (bool)(bVar64 >> 2 & 1);
            auVar80._8_4_ = (uint)bVar10 * auVar89._8_4_ | (uint)!bVar10 * in_ZMM21._8_4_;
            auVar80._12_4_ =
                 (uint)(bVar64 >> 3) * auVar89._12_4_ | (uint)!(bool)(bVar64 >> 3) * in_ZMM21._12_4_
            ;
            in_ZMM21 = ZEXT1664(auVar80);
            auVar89 = vshufps_avx512vl(auVar90,auVar90,0x55);
            auVar81._0_4_ =
                 (uint)(bVar64 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar64 & 1) * in_ZMM20._0_4_;
            bVar10 = (bool)(bVar64 >> 1 & 1);
            auVar81._4_4_ = (uint)bVar10 * auVar89._4_4_ | (uint)!bVar10 * in_ZMM20._4_4_;
            bVar10 = (bool)(bVar64 >> 2 & 1);
            auVar81._8_4_ = (uint)bVar10 * auVar89._8_4_ | (uint)!bVar10 * in_ZMM20._8_4_;
            auVar81._12_4_ =
                 (uint)(bVar64 >> 3) * auVar89._12_4_ | (uint)!(bool)(bVar64 >> 3) * in_ZMM20._12_4_
            ;
            in_ZMM20 = ZEXT1664(auVar81);
            auVar89 = vshufps_avx512vl(auVar90,auVar90,0xaa);
            auVar82._0_4_ =
                 (uint)(bVar64 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar64 & 1) * in_ZMM19._0_4_;
            bVar10 = (bool)(bVar64 >> 1 & 1);
            auVar82._4_4_ = (uint)bVar10 * auVar89._4_4_ | (uint)!bVar10 * in_ZMM19._4_4_;
            bVar10 = (bool)(bVar64 >> 2 & 1);
            auVar82._8_4_ = (uint)bVar10 * auVar89._8_4_ | (uint)!bVar10 * in_ZMM19._8_4_;
            auVar82._12_4_ =
                 (uint)(bVar64 >> 3) * auVar89._12_4_ | (uint)!(bool)(bVar64 >> 3) * in_ZMM19._12_4_
            ;
            in_ZMM19 = ZEXT1664(auVar82);
            auVar90 = in_ZMM30._0_16_;
            auVar89 = vbroadcastss_avx512vl(auVar90);
            auVar83._0_4_ =
                 (uint)(bVar64 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar64 & 1) * in_ZMM18._0_4_;
            bVar10 = (bool)(bVar64 >> 1 & 1);
            auVar83._4_4_ = (uint)bVar10 * auVar89._4_4_ | (uint)!bVar10 * in_ZMM18._4_4_;
            bVar10 = (bool)(bVar64 >> 2 & 1);
            auVar83._8_4_ = (uint)bVar10 * auVar89._8_4_ | (uint)!bVar10 * in_ZMM18._8_4_;
            auVar83._12_4_ =
                 (uint)(bVar64 >> 3) * auVar89._12_4_ | (uint)!(bool)(bVar64 >> 3) * in_ZMM18._12_4_
            ;
            in_ZMM18 = ZEXT1664(auVar83);
            auVar89 = vshufps_avx512vl(auVar90,auVar90,0x55);
            auVar84._0_4_ =
                 (uint)(bVar64 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar64 & 1) * in_ZMM17._0_4_;
            bVar10 = (bool)(bVar64 >> 1 & 1);
            auVar84._4_4_ = (uint)bVar10 * auVar89._4_4_ | (uint)!bVar10 * in_ZMM17._4_4_;
            bVar10 = (bool)(bVar64 >> 2 & 1);
            auVar84._8_4_ = (uint)bVar10 * auVar89._8_4_ | (uint)!bVar10 * in_ZMM17._8_4_;
            auVar84._12_4_ =
                 (uint)(bVar64 >> 3) * auVar89._12_4_ | (uint)!(bool)(bVar64 >> 3) * in_ZMM17._12_4_
            ;
            in_ZMM17 = ZEXT1664(auVar84);
            auVar89 = vshufps_avx512vl(auVar90,auVar90,0xaa);
            auVar85._0_4_ =
                 (uint)(bVar64 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar64 & 1) * in_ZMM16._0_4_;
            bVar10 = (bool)(bVar64 >> 1 & 1);
            auVar85._4_4_ = (uint)bVar10 * auVar89._4_4_ | (uint)!bVar10 * in_ZMM16._4_4_;
            bVar10 = (bool)(bVar64 >> 2 & 1);
            auVar85._8_4_ = (uint)bVar10 * auVar89._8_4_ | (uint)!bVar10 * in_ZMM16._8_4_;
            auVar85._12_4_ =
                 (uint)(bVar64 >> 3) * auVar89._12_4_ | (uint)!(bool)(bVar64 >> 3) * in_ZMM16._12_4_
            ;
            in_ZMM16 = ZEXT1664(auVar85);
            auVar90 = in_ZMM29._0_16_;
            auVar89 = vbroadcastss_avx512vl(auVar90);
            auVar86._0_4_ =
                 (uint)(bVar64 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar64 & 1) * in_ZMM15._0_4_;
            bVar10 = (bool)(bVar64 >> 1 & 1);
            auVar86._4_4_ = (uint)bVar10 * auVar89._4_4_ | (uint)!bVar10 * in_ZMM15._4_4_;
            bVar10 = (bool)(bVar64 >> 2 & 1);
            auVar86._8_4_ = (uint)bVar10 * auVar89._8_4_ | (uint)!bVar10 * in_ZMM15._8_4_;
            auVar86._12_4_ =
                 (uint)(bVar64 >> 3) * auVar89._12_4_ | (uint)!(bool)(bVar64 >> 3) * in_ZMM15._12_4_
            ;
            in_ZMM15 = ZEXT1664(auVar86);
            auVar89 = vshufps_avx512vl(auVar90,auVar90,0x55);
            auVar87._0_4_ =
                 (uint)(bVar64 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar64 & 1) * in_ZMM14._0_4_;
            bVar10 = (bool)(bVar64 >> 1 & 1);
            auVar87._4_4_ = (uint)bVar10 * auVar89._4_4_ | (uint)!bVar10 * in_ZMM14._4_4_;
            bVar10 = (bool)(bVar64 >> 2 & 1);
            auVar87._8_4_ = (uint)bVar10 * auVar89._8_4_ | (uint)!bVar10 * in_ZMM14._8_4_;
            auVar87._12_4_ =
                 (uint)(bVar64 >> 3) * auVar89._12_4_ | (uint)!(bool)(bVar64 >> 3) * in_ZMM14._12_4_
            ;
            in_ZMM14 = ZEXT1664(auVar87);
            auVar89 = vshufps_avx512vl(auVar90,auVar90,0xaa);
            auVar88._0_4_ =
                 (uint)(bVar64 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar64 & 1) * in_ZMM12._0_4_;
            bVar10 = (bool)(bVar64 >> 1 & 1);
            auVar88._4_4_ = (uint)bVar10 * auVar89._4_4_ | (uint)!bVar10 * in_ZMM12._4_4_;
            bVar10 = (bool)(bVar64 >> 2 & 1);
            auVar88._8_4_ = (uint)bVar10 * auVar89._8_4_ | (uint)!bVar10 * in_ZMM12._8_4_;
            auVar88._12_4_ =
                 (uint)(bVar64 >> 3) * auVar89._12_4_ | (uint)!(bool)(bVar64 >> 3) * in_ZMM12._12_4_
            ;
            in_ZMM12 = ZEXT1664(auVar88);
            auVar75 = auVar116;
            auVar76 = auVar115;
            auVar93 = auVar114;
          } while (bVar59 != 0);
        }
        auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar89 = vsubps_avx512vl(auVar89,auVar102);
        auVar90 = vmulps_avx512vl(auVar102,auVar77);
        auVar91 = vmulps_avx512vl(auVar102,auVar78);
        auVar92 = vmulps_avx512vl(auVar102,auVar79);
        auVar90 = vfmadd231ps_avx512vl(auVar90,auVar89,auVar105);
        auVar91 = vfmadd231ps_avx512vl(auVar91,auVar89,auVar106);
        auVar93 = vfmadd231ps_avx512vl(auVar92,auVar89,auVar107);
        auVar92 = vmulps_avx512vl(auVar102,auVar80);
        auVar73 = vmulps_avx512vl(auVar102,auVar81);
        auVar74 = vmulps_avx512vl(auVar102,auVar82);
        auVar75 = vfmadd231ps_avx512vl(auVar92,auVar89,auVar108);
        auVar73 = vfmadd231ps_avx512vl(auVar73,auVar89,auVar109);
        auVar74 = vfmadd231ps_avx512vl(auVar74,auVar89,auVar110);
        auVar92 = vmulps_avx512vl(auVar102,auVar83);
        auVar94 = vmulps_avx512vl(auVar102,auVar84);
        auVar95 = vmulps_avx512vl(auVar102,auVar85);
        auVar96 = vfmadd231ps_avx512vl(auVar92,auVar89,auVar111);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar89,auVar112);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar89,auVar113);
        fVar169 = auVar102._0_4_;
        auVar322._0_4_ = auVar86._0_4_ * fVar169;
        fVar179 = auVar102._4_4_;
        auVar322._4_4_ = auVar86._4_4_ * fVar179;
        fVar180 = auVar102._8_4_;
        auVar322._8_4_ = auVar86._8_4_ * fVar180;
        fVar181 = auVar102._12_4_;
        auVar322._12_4_ = auVar86._12_4_ * fVar181;
        auVar314._0_4_ = auVar87._0_4_ * fVar169;
        auVar314._4_4_ = auVar87._4_4_ * fVar179;
        auVar314._8_4_ = auVar87._8_4_ * fVar180;
        auVar314._12_4_ = auVar87._12_4_ * fVar181;
        auVar304._0_4_ = auVar88._0_4_ * fVar169;
        auVar304._4_4_ = auVar88._4_4_ * fVar179;
        auVar304._8_4_ = auVar88._8_4_ * fVar180;
        auVar304._12_4_ = auVar88._12_4_ * fVar181;
        auVar97 = vfmadd231ps_avx512vl(auVar322,auVar89,auVar114);
        auVar98 = vfmadd231ps_avx512vl(auVar314,auVar89,auVar115);
        auVar99 = vfmadd231ps_avx512vl(auVar304,auVar89,auVar116);
        auVar173._0_4_ = auVar94._0_4_ * auVar74._0_4_;
        auVar173._4_4_ = auVar94._4_4_ * auVar74._4_4_;
        auVar173._8_4_ = auVar94._8_4_ * auVar74._8_4_;
        auVar173._12_4_ = auVar94._12_4_ * auVar74._12_4_;
        auVar89 = vfmsub231ps_fma(auVar173,auVar73,auVar95);
        auVar196._0_4_ = auVar95._0_4_ * auVar75._0_4_;
        auVar196._4_4_ = auVar95._4_4_ * auVar75._4_4_;
        auVar196._8_4_ = auVar95._8_4_ * auVar75._8_4_;
        auVar196._12_4_ = auVar95._12_4_ * auVar75._12_4_;
        auVar92 = vfmsub231ps_fma(auVar196,auVar74,auVar96);
        auVar243._0_4_ = auVar73._0_4_ * auVar96._0_4_;
        auVar243._4_4_ = auVar73._4_4_ * auVar96._4_4_;
        auVar243._8_4_ = auVar73._8_4_ * auVar96._8_4_;
        auVar243._12_4_ = auVar73._12_4_ * auVar96._12_4_;
        auVar102 = vfmsub231ps_fma(auVar243,auVar75,auVar94);
        auVar100 = vmulps_avx512vl(auVar91,auVar95);
        auVar100 = vfmsub231ps_avx512vl(auVar100,auVar94,auVar93);
        auVar101 = vmulps_avx512vl(auVar93,auVar96);
        auVar95 = vfmsub231ps_avx512vl(auVar101,auVar90,auVar95);
        auVar94 = vmulps_avx512vl(auVar90,auVar94);
        auVar94 = vfmsub231ps_avx512vl(auVar94,auVar91,auVar96);
        auVar96 = vmulps_avx512vl(auVar73,auVar93);
        auVar96 = vfmsub231ps_avx512vl(auVar96,auVar91,auVar74);
        auVar74 = vmulps_avx512vl(auVar74,auVar90);
        auVar74 = vfmsub231ps_avx512vl(auVar74,auVar93,auVar75);
        auVar75 = vmulps_avx512vl(auVar75,auVar91);
        auVar75 = vfmsub231ps_avx512vl(auVar75,auVar90,auVar73);
        auVar93 = vmulps_avx512vl(auVar93,auVar102);
        auVar91 = vfmadd231ps_avx512vl(auVar93,auVar92,auVar91);
        auVar101 = vfmadd231ps_avx512vl(auVar91,auVar89,auVar90);
        auVar89 = vdivps_avx(auVar89,auVar101);
        auVar90 = vdivps_avx(auVar100,auVar101);
        auVar91 = vdivps_avx(auVar96,auVar101);
        auVar92 = vdivps_avx(auVar92,auVar101);
        auVar93 = vdivps_avx(auVar95,auVar101);
        auVar73 = vdivps_avx(auVar74,auVar101);
        auVar102 = vdivps_avx(auVar102,auVar101);
        auVar74 = vdivps_avx(auVar94,auVar101);
        auVar75 = vdivps_avx(auVar75,auVar101);
        fVar169 = auVar99._0_4_;
        auVar265._0_4_ = fVar169 * auVar102._0_4_;
        fVar179 = auVar99._4_4_;
        auVar265._4_4_ = fVar179 * auVar102._4_4_;
        fVar180 = auVar99._8_4_;
        auVar265._8_4_ = fVar180 * auVar102._8_4_;
        fVar181 = auVar99._12_4_;
        auVar265._12_4_ = fVar181 * auVar102._12_4_;
        auVar275._0_4_ = fVar169 * auVar74._0_4_;
        auVar275._4_4_ = fVar179 * auVar74._4_4_;
        auVar275._8_4_ = fVar180 * auVar74._8_4_;
        auVar275._12_4_ = fVar181 * auVar74._12_4_;
        auVar305._0_4_ = fVar169 * auVar75._0_4_;
        auVar305._4_4_ = fVar179 * auVar75._4_4_;
        auVar305._8_4_ = fVar180 * auVar75._8_4_;
        auVar305._12_4_ = fVar181 * auVar75._12_4_;
        auVar94 = vfmadd231ps_fma(auVar265,auVar98,auVar92);
        auVar95 = vfmadd231ps_fma(auVar275,auVar98,auVar93);
        auVar96 = vfmadd231ps_fma(auVar305,auVar73,auVar98);
        auVar94 = vfmadd231ps_fma(auVar94,auVar97,auVar89);
        auVar95 = vfmadd231ps_fma(auVar95,auVar97,auVar90);
        auVar96 = vfmadd231ps_fma(auVar96,auVar91,auVar97);
      }
      auVar294._0_8_ = auVar94._0_8_ ^ 0x8000000080000000;
      auVar294._8_4_ = auVar94._8_4_ ^ 0x80000000;
      auVar294._12_4_ = auVar94._12_4_ ^ 0x80000000;
      auVar266._0_8_ = auVar95._0_8_ ^ 0x8000000080000000;
      auVar266._8_4_ = auVar95._8_4_ ^ 0x80000000;
      auVar266._12_4_ = auVar95._12_4_ ^ 0x80000000;
      auVar276._0_8_ = auVar96._0_8_ ^ 0x8000000080000000;
      auVar276._8_4_ = auVar96._8_4_ ^ 0x80000000;
      auVar276._12_4_ = auVar96._12_4_ ^ 0x80000000;
      auVar94 = *(undefined1 (*) [16])ray;
      auVar95 = *(undefined1 (*) [16])(ray + 0x10);
      auVar96 = *(undefined1 (*) [16])(ray + 0x20);
      auVar97 = *(undefined1 (*) [16])(ray + 0x40);
      auVar98 = *(undefined1 (*) [16])(ray + 0x50);
      auVar99 = *(undefined1 (*) [16])(ray + 0x60);
      auVar100 = vfmadd231ps_fma(auVar294,auVar96,auVar102);
      auVar101 = vfmadd231ps_fma(auVar266,auVar96,auVar74);
      auVar122 = vfmadd231ps_fma(auVar276,auVar96,auVar75);
      auVar100 = vfmadd231ps_fma(auVar100,auVar95,auVar92);
      auVar101 = vfmadd231ps_fma(auVar101,auVar95,auVar93);
      auVar122 = vfmadd231ps_fma(auVar122,auVar95,auVar73);
      auVar100 = vfmadd231ps_fma(auVar100,auVar94,auVar89);
      auVar101 = vfmadd231ps_fma(auVar101,auVar94,auVar90);
      *(undefined1 (*) [16])ray = auVar100;
      auVar100 = vfmadd231ps_fma(auVar122,auVar94,auVar91);
      *(undefined1 (*) [16])(ray + 0x10) = auVar101;
      *(undefined1 (*) [16])(ray + 0x20) = auVar100;
      auVar102 = vmulps_avx512vl(auVar102,auVar99);
      auVar74 = vmulps_avx512vl(auVar74,auVar99);
      auVar75 = vmulps_avx512vl(auVar75,auVar99);
      auVar92 = vfmadd231ps_avx512vl(auVar102,auVar98,auVar92);
      auVar93 = vfmadd231ps_avx512vl(auVar74,auVar98,auVar93);
      auVar73 = vfmadd231ps_avx512vl(auVar75,auVar98,auVar73);
      auVar89 = vfmadd231ps_fma(auVar92,auVar97,auVar89);
      auVar90 = vfmadd231ps_fma(auVar93,auVar97,auVar90);
      auVar91 = vfmadd231ps_fma(auVar73,auVar97,auVar91);
      *(undefined1 (*) [16])(ray + 0x40) = auVar89;
      *(undefined1 (*) [16])(ray + 0x50) = auVar90;
      *(undefined1 (*) [16])(ray + 0x60) = auVar91;
      local_a8 = context->args;
      local_b8._8_8_ = pRVar8;
      local_b8._0_8_ = p_Var58;
      local_38 = vpmovm2d_avx512vl(uVar57);
      (**(code **)(p_Var58 + 0x98))(local_38,p_Var58 + 0x58,ray);
      local_148._0_8_ = auVar94._0_8_;
      local_148._8_8_ = auVar94._8_8_;
      *(undefined8 *)ray = local_148._0_8_;
      *(undefined8 *)(ray + 8) = local_148._8_8_;
      local_178._0_8_ = auVar95._0_8_;
      local_178._8_8_ = auVar95._8_8_;
      *(undefined8 *)(ray + 0x10) = local_178._0_8_;
      *(undefined8 *)(ray + 0x18) = local_178._8_8_;
      local_168._0_8_ = auVar96._0_8_;
      local_168._8_8_ = auVar96._8_8_;
      *(undefined8 *)(ray + 0x20) = local_168._0_8_;
      *(undefined8 *)(ray + 0x28) = local_168._8_8_;
      local_128._0_8_ = auVar97._0_8_;
      local_128._8_8_ = auVar97._8_8_;
      *(undefined8 *)(ray + 0x40) = local_128._0_8_;
      *(undefined8 *)(ray + 0x48) = local_128._8_8_;
      local_138._0_8_ = auVar98._0_8_;
      local_138._8_8_ = auVar98._8_8_;
      *(undefined8 *)(ray + 0x50) = local_138._0_8_;
      *(undefined8 *)(ray + 0x58) = local_138._8_8_;
      local_158._0_8_ = auVar99._0_8_;
      local_158._8_8_ = auVar99._8_8_;
      *(undefined8 *)(ray + 0x60) = local_158._0_8_;
      *(undefined8 *)(ray + 0x68) = local_158._8_8_;
      pRVar8->instID[0] = 0xffffffff;
      pRVar8->instPrimID[0] = 0xffffffff;
    }
  }
  return;
}

Assistant:

void InstanceArrayIntersectorKMB<K>::intersect(const vbool<K>& valid_i, const Precalculations& pre, RayHitK<K>& ray, RayQueryContext* context, const Primitive& prim)
    {
      vbool<K> valid = valid_i;
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      valid &= (ray.mask & instance->mask) != 0;
      if (none(valid)) return;
#endif
        
      RTCRayQueryContext* user_context = context->user;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        AffineSpace3vf<K> world2local = instance->getWorld2Local<K>(prim.primID_, valid, ray.time());
        const Vec3vf<K> ray_org = ray.org;
        const Vec3vf<K> ray_dir = ray.dir;
        ray.org = xfmPoint(world2local, ray_org);
        ray.dir = xfmVector(world2local, ray_dir);
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.intersect(valid, ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        instance_id_stack::pop(user_context);
      }
    }